

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_fma.cpp
# Opt level: O1

int __thiscall
ncnn::Convolution_x86_fma::forward_int8_x86
          (Convolution_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  Option *pOVar1;
  Mat *AT;
  ulong *puVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int iVar8;
  undefined4 uVar9;
  Layer *pLVar10;
  undefined1 auVar11 [12];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [12];
  undefined4 uVar16;
  undefined1 uVar17;
  undefined1 uVar19;
  undefined1 uVar21;
  undefined1 uVar23;
  undefined4 uVar24;
  undefined1 uVar25;
  undefined1 uVar27;
  undefined1 uVar29;
  undefined1 uVar31;
  undefined4 uVar32;
  undefined1 uVar33;
  undefined1 uVar35;
  undefined1 uVar37;
  undefined1 uVar39;
  undefined1 uVar40;
  undefined1 uVar41;
  undefined1 uVar43;
  undefined1 uVar45;
  undefined1 auVar46 [16];
  int iVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  int iVar51;
  uint uVar52;
  uint uVar53;
  int iVar54;
  long lVar55;
  long lVar56;
  void *pvVar57;
  undefined1 (*pauVar58) [16];
  undefined1 (*pauVar59) [32];
  long lVar60;
  long lVar61;
  ulong uVar62;
  undefined4 uVar63;
  int iVar64;
  uint uVar65;
  int iVar66;
  long lVar67;
  long lVar68;
  ulong *puVar69;
  int *piVar70;
  int iVar71;
  char *r0;
  int iVar72;
  int iVar73;
  int *piVar74;
  long lVar75;
  long lVar76;
  ulong uVar77;
  int iVar78;
  int iVar79;
  ulong uVar80;
  int *piVar81;
  uint uVar82;
  uint uVar83;
  int iVar84;
  char *r0_4;
  long lVar85;
  undefined1 (*pauVar86) [32];
  int m_3;
  int iVar87;
  undefined1 (*pauVar88) [32];
  int iVar89;
  uint uVar90;
  char *r1_8;
  undefined8 *puVar91;
  undefined1 *puVar92;
  long lVar93;
  ulong uVar94;
  uint uVar95;
  long lVar96;
  int k;
  uint uVar97;
  ulong *puVar98;
  int m_2;
  int iVar99;
  int iVar100;
  undefined1 (*pauVar101) [32];
  undefined1 (*pauVar102) [32];
  long lVar103;
  ulong *puVar104;
  uint uVar105;
  uint uVar106;
  int iVar107;
  uint uVar108;
  int iVar109;
  char *r1;
  long lVar110;
  undefined1 (*pauVar111) [16];
  int m_4;
  long lVar112;
  void *pvVar113;
  ulong uVar114;
  bool *pbVar115;
  bool bVar116;
  bool bVar117;
  int sum0 [4];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  int sum1 [4];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [32];
  undefined1 auVar133 [64];
  int sum0_1 [4];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [64];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [64];
  undefined1 auVar142 [16];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [64];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [64];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [64];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [64];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [64];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  int in_stack_fffffffffffffb48;
  ulong local_4a8;
  int cstep;
  int local_498;
  void *local_490;
  ulong local_480;
  undefined1 (*local_458) [16];
  long local_438;
  undefined1 (*local_410) [16];
  int TILE_N;
  void *local_3f8;
  ulong local_3f0;
  void *local_3e8;
  ulong local_3e0;
  undefined1 local_3d8 [16];
  ulong local_3c8;
  uint local_3c0;
  uint local_3bc;
  Mat local_3b8;
  ulong local_370;
  int local_364;
  int TILE_K;
  int TILE_M;
  Option *local_358;
  void *local_350;
  undefined1 local_348 [16];
  ulong local_338;
  void *local_330;
  Mat local_328;
  undefined8 local_2e0;
  Option opt_q;
  size_t local_298 [8];
  undefined1 auStack_258 [8];
  long local_250;
  Mat local_248;
  Mat m;
  Mat m_1;
  Mat local_128;
  ulong local_e0;
  long local_d8;
  ulong local_d0;
  Mat *local_c8;
  int local_bc;
  undefined1 local_b8 [56];
  int local_80;
  size_t local_78;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  undefined4 uVar18;
  undefined3 uVar20;
  undefined2 uVar22;
  undefined4 uVar26;
  undefined3 uVar28;
  undefined2 uVar30;
  undefined4 uVar34;
  undefined3 uVar36;
  undefined2 uVar38;
  undefined3 uVar42;
  undefined2 uVar44;
  
  local_b8._24_4_ = bottom_blob->elempack;
  if (local_b8._24_4_ == 0) {
    bVar116 = false;
  }
  else {
    bVar116 = ((int)bottom_blob->elemsize << 3) / (int)local_b8._24_4_ == 8;
  }
  piVar81 = bottom_blob->refcount;
  local_b8._0_8_ = bottom_blob->data;
  local_b8._8_4_ = SUB84(bottom_blob->refcount,0);
  local_b8._12_4_ = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
  local_b8._16_8_ = bottom_blob->elemsize;
  local_b8._32_8_ = bottom_blob->allocator;
  local_b8._40_4_ = bottom_blob->dims;
  local_b8._44_4_ = bottom_blob->w;
  local_b8._48_4_ = bottom_blob->h;
  local_b8._52_4_ = bottom_blob->d;
  local_80 = bottom_blob->c;
  local_78 = bottom_blob->cstep;
  if (piVar81 != (int *)0x0) {
    LOCK();
    *piVar81 = *piVar81 + 1;
    UNLOCK();
  }
  if (!bVar116) {
    opt_q.lightmode = opt->lightmode;
    opt_q.use_shader_pack8 = opt->use_shader_pack8;
    opt_q.use_subgroup_ops = opt->use_subgroup_ops;
    opt_q.use_reserved_0 = opt->use_reserved_0;
    opt_q.num_threads = opt->num_threads;
    opt_q.workspace_allocator = opt->workspace_allocator;
    uVar16 = opt->openmp_blocktime;
    uVar17 = opt->use_winograd_convolution;
    uVar19 = opt->use_sgemm_convolution;
    uVar21 = opt->use_int8_inference;
    uVar23 = opt->use_vulkan_compute;
    uVar22 = CONCAT11(uVar23,uVar21);
    uVar20 = CONCAT21(uVar22,uVar19);
    uVar18 = CONCAT31(uVar20,uVar17);
    opt_q.use_bf16_storage = opt->use_bf16_storage;
    opt_q.use_fp16_packed = opt->use_fp16_packed;
    opt_q.use_fp16_storage = opt->use_fp16_storage;
    opt_q.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    opt_q.use_int8_packed = opt->use_int8_packed;
    opt_q.use_int8_storage = opt->use_int8_storage;
    opt_q.use_int8_arithmetic = opt->use_int8_arithmetic;
    opt_q.use_packing_layout = opt->use_packing_layout;
    uVar24 = opt->vulkan_device_index;
    uVar25 = opt->use_reserved_1;
    uVar27 = opt->use_image_storage;
    uVar29 = opt->use_tensor_storage;
    uVar31 = opt->use_reserved_2;
    uVar30 = CONCAT11(uVar31,uVar29);
    uVar28 = CONCAT21(uVar30,uVar27);
    uVar26 = CONCAT31(uVar28,uVar25);
    uVar32 = opt->flush_denormals;
    uVar33 = opt->use_local_pool_allocator;
    uVar35 = opt->use_shader_local_memory;
    uVar37 = opt->use_cooperative_matrix;
    uVar39 = opt->use_winograd23_convolution;
    uVar38 = CONCAT11(uVar39,uVar37);
    uVar36 = CONCAT21(uVar38,uVar35);
    uVar34 = CONCAT31(uVar36,uVar33);
    uVar3._0_1_ = opt->use_winograd43_convolution;
    uVar3._1_1_ = opt->use_winograd63_convolution;
    uVar3._2_1_ = opt->use_a53_a55_optimized_kernel;
    uVar3._3_1_ = opt->use_fp16_uniform;
    uVar40 = opt->use_int8_uniform;
    uVar41 = opt->use_reserved_9;
    uVar43 = opt->use_reserved_10;
    uVar45 = opt->use_reserved_11;
    uVar44 = CONCAT11(uVar45,uVar43);
    uVar42 = CONCAT21(uVar44,uVar41);
    uVar3._4_4_ = CONCAT31(uVar42,uVar40);
    opt_q._56_4_ = SUB84(uVar3,0);
    opt_q.blob_allocator._0_4_ = SUB84(opt->workspace_allocator,0);
    opt_q.blob_allocator._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    opt_q.openmp_blocktime = uVar16;
    opt_q._28_4_ = uVar18;
    opt_q.vulkan_device_index = uVar24;
    opt_q._44_4_ = uVar26;
    opt_q.flush_denormals = uVar32;
    opt_q._52_4_ = uVar34;
    opt_q._60_4_ = uVar3._4_4_;
    quantize_to_int8(bottom_blob,(Mat *)local_b8,&(this->super_Convolution).bottom_blob_int8_scales,
                     &opt_q);
    if (((void *)local_b8._0_8_ == (void *)0x0) || ((long)local_80 * local_78 == 0)) {
      local_498 = -100;
      goto LAB_001dd332;
    }
  }
  local_3b8.cstep = 0;
  local_3b8.data = (void *)0x0;
  local_3b8.refcount._0_4_ = 0;
  local_3b8.refcount._4_4_ = 0;
  local_3b8.elemsize = 0;
  local_3b8.elempack = 0;
  local_3b8.allocator = (Allocator *)0x0;
  local_3b8.dims = 0;
  local_3b8.w = 0;
  local_3b8.h = 0;
  local_3b8.d = 0;
  local_3b8.c = 0;
  local_358 = opt;
  Convolution::make_padding(&this->super_Convolution,(Mat *)local_b8,&local_3b8,opt);
  iVar54 = local_3b8.c;
  iVar51 = local_3b8.elempack;
  local_498 = -100;
  if ((local_3b8.data != (void *)0x0) && ((long)local_3b8.c * local_3b8.cstep != 0)) {
    iVar71 = (~(((this->super_Convolution).kernel_w + -1) * (this->super_Convolution).dilation_w) +
             local_3b8.w) / (this->super_Convolution).stride_w + 1;
    iVar72 = (~(((this->super_Convolution).kernel_h + -1) * (this->super_Convolution).dilation_h) +
             local_3b8.h) / (this->super_Convolution).stride_h + 1;
    iVar8 = (this->super_Convolution).int8_scale_term;
    uVar97 = 1;
    if (local_358->use_packing_layout == true) {
      uVar108 = (this->super_Convolution).num_output;
      if (iVar8 < 0x65) {
        uVar97 = 8;
        if ((uVar108 & 7) != 0) {
          uVar97 = (uint)((uVar108 & 3) == 0) * 3 + 1;
        }
      }
      else {
        uVar97 = 1;
        if ((uVar108 & 7) == 0) {
          uVar97 = 8;
        }
      }
    }
    uVar108 = uVar97 * 4;
    if (100 < iVar8) {
      uVar108 = uVar97;
    }
    local_c8 = top_blob;
    Mat::create(top_blob,iVar71,iVar72,(this->super_Convolution).num_output / (int)uVar97,
                (ulong)uVar108,uVar97,local_358->blob_allocator);
    if (top_blob->data == (void *)0x0) {
      local_498 = -100;
    }
    else {
      local_498 = -100;
      if ((long)top_blob->c * top_blob->cstep != 0) {
        iVar87 = 1;
        if (local_358->use_packing_layout == true) {
          uVar97 = (this->super_Convolution).num_output;
          if (iVar8 < 0x65) {
            iVar87 = 8;
            if ((uVar97 & 7) != 0) {
              iVar87 = (uint)((uVar97 & 3) == 0) * 3 + 1;
            }
          }
          else {
            iVar87 = 1;
            if ((uVar97 & 7) == 0) {
              iVar87 = 8;
            }
          }
        }
        if ((local_358->use_winograd23_convolution == false) &&
           (local_358->use_winograd43_convolution != true)) {
          bVar116 = false;
        }
        else {
          bVar116 = true;
          if (iVar51 * iVar54 < 9) {
            bVar116 = 8 < (this->super_Convolution).num_output;
          }
        }
        if ((local_358->use_packing_layout != false) &&
           ((auVar122._0_4_ = (this->super_Convolution).kernel_w,
            auVar122._4_4_ = (this->super_Convolution).kernel_h,
            auVar122._8_4_ = (this->super_Convolution).dilation_w,
            auVar122._12_4_ = (this->super_Convolution).dilation_h,
            ((this->super_Convolution).stride_w == 1 & local_358->use_winograd_convolution &
             (this->super_Convolution).stride_h == 1 & auVar122 == _DAT_005efe40 & bVar116) != 0 ||
            (local_358->use_sgemm_convolution == false)))) {
          iVar87 = (uint)(((this->super_Convolution).num_output & 3) == 0) * 3 + 1;
        }
        local_328.cstep = 0;
        local_328.data = (void *)0x0;
        local_328.refcount._0_4_ = 0;
        local_328.refcount._4_4_ = 0;
        local_328.elemsize = 0;
        local_328.elempack = 0;
        local_328.allocator = (Allocator *)0x0;
        local_328.dims = 0;
        local_328.w = 0;
        local_328.h = 0;
        local_328.d = 0;
        local_328.c = 0;
        Mat::create(&local_328,iVar71,iVar72,(this->super_Convolution).num_output / iVar87,
                    (ulong)(uint)(iVar87 * 4),iVar87,local_358->workspace_allocator);
        pOVar1 = local_358;
        local_498 = -100;
        if ((local_328.data != (void *)0x0) && ((long)local_328.c * local_328.cstep != 0)) {
          iVar51 = this->nT;
          iVar54 = iVar51;
          if (iVar51 == 0) {
            iVar54 = local_358->num_threads;
          }
          if (local_358->num_threads != iVar51 && iVar51 != 0) {
            forward_int8_x86();
          }
          auVar128._0_4_ = (this->super_Convolution).kernel_w;
          auVar128._4_4_ = (this->super_Convolution).kernel_h;
          auVar128._8_4_ = (this->super_Convolution).dilation_w;
          auVar128._12_4_ = (this->super_Convolution).dilation_h;
          uVar97 = (this->super_Convolution).stride_w;
          iVar51 = (this->super_Convolution).stride_h;
          if ((uVar97 == 1 & pOVar1->use_winograd_convolution & iVar51 == 1 & bVar116 &
              auVar128 == _DAT_005efe40) == 1) {
            if (((pOVar1->use_winograd43_convolution == true) &&
                ((this->weight_winograd43_data).data != (void *)0x0)) &&
               ((long)(this->weight_winograd43_data).c * (this->weight_winograd43_data).cstep != 0))
            {
              local_498 = conv3x3s1_winograd43_int8
                                    (&local_3b8,&local_328,&this->weight_winograd43_data,iVar54,
                                     pOVar1);
            }
            else {
              iVar51 = cpu_support_x86_avx_vnni();
              AT = &this->weight_winograd23_data;
              if (iVar51 == 0) {
                iVar51 = cpu_support_x86_avx2();
                if (iVar51 == 0) {
                  iVar51 = cpu_support_x86_xop();
                  if (iVar51 == 0) {
                    auVar121._4_4_ = local_328.h;
                    auVar121._0_4_ = local_328.w;
                    auVar122 = vpcmpeqd_avx(auVar128,auVar128);
                    auVar121._8_8_ = 0;
                    auVar122 = vpsubd_avx(auVar121,auVar122);
                    auVar128 = vpsrld_avx(auVar122,0x1f);
                    auVar122 = vpaddd_avx(auVar122,auVar128);
                    auVar122 = vpsrad_avx(auVar122,1);
                    uVar97 = local_328.elempack * local_328.c;
                    uVar114 = (ulong)uVar97;
                    uVar108 = auVar122._4_4_ * auVar122._0_4_;
                    pvVar57 = (void *)(ulong)uVar108;
                    iVar71 = local_3b8.elempack * local_3b8.c;
                    get_optimal_tile_mnk_int8(uVar97,uVar108,iVar71,&TILE_M,&TILE_N,&TILE_K,iVar54);
                    local_2e0 = CONCAT44(local_2e0._4_4_,(int)(uVar97 + TILE_M + -1) / TILE_M);
                    iVar72 = (int)(uVar108 + TILE_N + -1) / TILE_N;
                    iVar87 = (TILE_K + iVar71 + -1) / TILE_K;
                    iVar51 = TILE_K * TILE_N;
                    local_248.cstep = 0;
                    local_248.data = (void *)0x0;
                    local_248.refcount._0_4_ = 0;
                    local_248.refcount._4_4_ = 0;
                    local_248.elemsize = 0;
                    local_248.elempack = 0;
                    local_248.allocator = (Allocator *)0x0;
                    local_248.dims = 0;
                    local_248.w = 0;
                    local_248.h = 0;
                    local_248.d = 0;
                    local_248.c = 0;
                    Mat::create(&local_248,iVar51,0x10,iVar87,iVar72,2,
                                local_358->workspace_allocator);
                    local_498 = -100;
                    local_3f0 = uVar114;
                    local_3e8 = pvVar57;
                    if ((local_248.data != (void *)0x0) &&
                       ((long)local_248.c * local_248.cstep != 0)) {
                      iVar72 = iVar72 * iVar87;
                      iVar51 = iVar51 * 0x10;
                      if ((iVar54 < 2) || (iVar54 <= iVar72)) {
                        local_298[0] = 0;
                        opt_q.lightmode = false;
                        opt_q.use_shader_pack8 = false;
                        opt_q.use_subgroup_ops = false;
                        opt_q.use_reserved_0 = false;
                        opt_q.num_threads = 0;
                        opt_q.blob_allocator._0_4_ = 0;
                        opt_q.blob_allocator._4_4_ = 0;
                        opt_q.workspace_allocator = (Allocator *)0x0;
                        opt_q.openmp_blocktime = 0;
                        opt_q.use_bf16_storage = false;
                        opt_q.use_fp16_packed = false;
                        opt_q.use_fp16_storage = false;
                        opt_q.use_fp16_arithmetic = false;
                        opt_q.use_int8_packed = false;
                        opt_q.use_int8_storage = false;
                        opt_q.use_int8_arithmetic = false;
                        opt_q.use_packing_layout = false;
                        opt_q.vulkan_device_index = 0;
                        opt_q.use_reserved_1 = false;
                        opt_q.use_image_storage = false;
                        opt_q.use_tensor_storage = false;
                        opt_q.use_reserved_2 = false;
                        opt_q.flush_denormals = 0;
                        opt_q.use_local_pool_allocator = false;
                        opt_q.use_shader_local_memory = false;
                        opt_q.use_cooperative_matrix = false;
                        opt_q.use_winograd23_convolution = false;
                        opt_q.use_winograd43_convolution = false;
                        opt_q.use_winograd63_convolution = false;
                        opt_q.use_a53_a55_optimized_kernel = false;
                        opt_q.use_fp16_uniform = false;
                        Mat::create((Mat *)&opt_q,iVar51,1,iVar54,2,local_358->workspace_allocator);
                        bVar117 = (long)(int)opt_q._56_4_ * local_298[0] == 0;
                        bVar116 = opt_q._0_8_ == 0 || bVar117;
                        if (opt_q._0_8_ != 0 && !bVar117) {
                          if (0 < iVar72) {
                            iVar51 = 0;
                            do {
                              iVar73 = TILE_N * (iVar51 / iVar87);
                              local_3d8._0_4_ = iVar51 % iVar87;
                              iVar66 = TILE_K * (iVar51 % iVar87);
                              iVar100 = (int)local_3e8 - iVar73;
                              if (TILE_N < iVar100) {
                                iVar100 = TILE_N;
                              }
                              iVar84 = iVar71 - iVar66;
                              if (TILE_K < iVar84) {
                                iVar84 = TILE_K;
                              }
                              iVar109 = get_omp_thread_num();
                              m.data = (void *)((long)iVar109 * local_298[0] *
                                                (long)opt_q.workspace_allocator + opt_q._0_8_);
                              m.refcount._0_4_ = 0;
                              m.refcount._4_4_ = 0;
                              m.elemsize = (size_t)opt_q.workspace_allocator;
                              m.elempack = opt_q.openmp_blocktime;
                              m.allocator = (Allocator *)opt_q._32_8_;
                              m.w._0_1_ = opt_q.use_reserved_1;
                              m.w._1_1_ = opt_q.use_image_storage;
                              m.w._2_1_ = opt_q.use_tensor_storage;
                              m.w._3_1_ = opt_q.use_reserved_2;
                              m.h = opt_q.flush_denormals;
                              m.d = 1;
                              m.c._0_1_ = opt_q.use_local_pool_allocator;
                              m.c._1_1_ = opt_q.use_shader_local_memory;
                              m.c._2_1_ = opt_q.use_cooperative_matrix;
                              m.c._3_1_ = opt_q.use_winograd23_convolution;
                              m.dims = opt_q.vulkan_device_index + -1;
                              m.cstep = ((long)opt_q.workspace_allocator *
                                         (long)opt_q.flush_denormals * (long)(int)opt_q._44_4_ +
                                         0xfU & 0xfffffffffffffff0) /
                                        (ulong)opt_q.workspace_allocator;
                              if (opt_q.vulkan_device_index == 4) {
                                m.cstep = (long)opt_q.flush_denormals * (long)(int)opt_q._44_4_;
                              }
                              conv3x3s1_winograd23_transform_input_tile_int8
                                        (&local_3b8,&m,iVar73,iVar100,iVar66,iVar84,
                                         in_stack_fffffffffffffb48);
                              m_1.cstep = (long)local_248.h * (long)local_248.w;
                              m_1.data = (void *)((long)local_248.data +
                                                 (uint)local_3d8._0_4_ * local_248.elemsize *
                                                 m_1.cstep +
                                                 (long)(iVar51 / iVar87) * local_248.cstep *
                                                 local_248.elemsize);
                              m_1.refcount._0_4_ = 0;
                              m_1.refcount._4_4_ = 0;
                              m_1.elemsize = local_248.elemsize;
                              m_1.elempack = local_248.elempack;
                              m_1.allocator = local_248.allocator;
                              m_1.dims = 2;
                              m_1.w = local_248.w;
                              m_1.h = local_248.h;
                              m_1.d = 1;
                              m_1.c = 1;
                              transpose_pack_B_tile_int8(&m,&m_1,0x10,iVar100,iVar84,(int)m_1.cstep)
                              ;
                              m_1.cstep = 0;
                              m_1.data = (void *)0x0;
                              m_1.refcount._0_4_ = 0;
                              m_1.refcount._4_4_ = 0;
                              m_1.elemsize = 0;
                              m_1.elempack = 0;
                              m_1.dims = 0;
                              m_1.w = 0;
                              m_1.h = 0;
                              m_1.d = 0;
                              m_1.c = 0;
                              piVar81 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
                              if (piVar81 != (int *)0x0) {
                                LOCK();
                                *piVar81 = *piVar81 + -1;
                                UNLOCK();
                                if (*piVar81 == 0) {
                                  if (m.allocator == (Allocator *)0x0) {
                                    if (m.data != (void *)0x0) {
                                      free(m.data);
                                    }
                                  }
                                  else {
                                    (*(m.allocator)->_vptr_Allocator[3])();
                                  }
                                }
                              }
                              m.cstep = 0;
                              m.data = (void *)0x0;
                              m.refcount._0_4_ = 0;
                              m.refcount._4_4_ = 0;
                              m.elemsize = 0;
                              m.elempack = 0;
                              m.dims = 0;
                              m.w = 0;
                              m.h = 0;
                              m.d = 0;
                              m.c = 0;
                              iVar51 = iVar51 + 1;
                            } while (iVar72 != iVar51);
                          }
                          piVar81 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,
                                                    opt_q.blob_allocator._0_4_);
                          if (piVar81 != (int *)0x0) {
                            LOCK();
                            *piVar81 = *piVar81 + -1;
                            UNLOCK();
                            if (*piVar81 == 0) {
                              if (opt_q._32_8_ == 0) {
                                if (opt_q._0_8_ != 0) {
                                  free((void *)opt_q._0_8_);
                                }
                              }
                              else {
                                (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
                              }
                            }
                          }
                          goto LAB_001dda4c;
                        }
                        piVar81 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,
                                                  opt_q.blob_allocator._0_4_);
                        if (piVar81 != (int *)0x0) {
                          LOCK();
                          *piVar81 = *piVar81 + -1;
                          UNLOCK();
                          if (*piVar81 == 0) {
                            if (opt_q._32_8_ == 0) goto joined_r0x001dd96e;
                            (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
                          }
                        }
                      }
                      else {
                        local_298[0] = 0;
                        opt_q.lightmode = false;
                        opt_q.use_shader_pack8 = false;
                        opt_q.use_subgroup_ops = false;
                        opt_q.use_reserved_0 = false;
                        opt_q.num_threads = 0;
                        opt_q.blob_allocator._0_4_ = 0;
                        opt_q.blob_allocator._4_4_ = 0;
                        opt_q.workspace_allocator = (Allocator *)0x0;
                        opt_q.openmp_blocktime = 0;
                        opt_q.use_bf16_storage = false;
                        opt_q.use_fp16_packed = false;
                        opt_q.use_fp16_storage = false;
                        opt_q.use_fp16_arithmetic = false;
                        opt_q.use_int8_packed = false;
                        opt_q.use_int8_storage = false;
                        opt_q.use_int8_arithmetic = false;
                        opt_q.use_packing_layout = false;
                        opt_q.vulkan_device_index = 0;
                        opt_q.use_reserved_1 = false;
                        opt_q.use_image_storage = false;
                        opt_q.use_tensor_storage = false;
                        opt_q.use_reserved_2 = false;
                        opt_q.flush_denormals = 0;
                        opt_q.use_local_pool_allocator = false;
                        opt_q.use_shader_local_memory = false;
                        opt_q.use_cooperative_matrix = false;
                        opt_q.use_winograd23_convolution = false;
                        opt_q.use_winograd43_convolution = false;
                        opt_q.use_winograd63_convolution = false;
                        opt_q.use_a53_a55_optimized_kernel = false;
                        opt_q.use_fp16_uniform = false;
                        Mat::create((Mat *)&opt_q,iVar51,2,local_358->workspace_allocator);
                        iVar51 = TILE_K;
                        bVar117 = (long)(int)opt_q._56_4_ * local_298[0] == 0;
                        bVar116 = opt_q._0_8_ == 0 || bVar117;
                        if (opt_q._0_8_ != 0 && !bVar117) {
                          if (0 < iVar72) {
                            local_3d8._0_4_ = TILE_N;
                            iVar100 = 0;
                            do {
                              iVar66 = local_3d8._0_4_ * (iVar100 / iVar87);
                              iVar84 = iVar51 * (int)((long)iVar100 % (long)iVar87);
                              iVar73 = (int)local_3e8 - iVar66;
                              if ((int)local_3d8._0_4_ < iVar73) {
                                iVar73 = local_3d8._0_4_;
                              }
                              iVar109 = iVar71 - iVar84;
                              if (iVar51 < iVar109) {
                                iVar109 = iVar51;
                              }
                              conv3x3s1_winograd23_transform_input_tile_int8
                                        (&local_3b8,(Mat *)&opt_q,iVar66,iVar73,iVar84,iVar109,
                                         in_stack_fffffffffffffb48);
                              m.cstep = (long)local_248.h * (long)local_248.w;
                              m.data = (void *)((long)local_248.data +
                                               ((long)iVar100 % (long)iVar87 & 0xffffffffU) *
                                               local_248.elemsize * m.cstep +
                                               (long)(iVar100 / iVar87) * local_248.cstep *
                                               local_248.elemsize);
                              m.refcount._0_4_ = 0;
                              m.refcount._4_4_ = 0;
                              m.elemsize = local_248.elemsize;
                              m.elempack = local_248.elempack;
                              m.allocator = local_248.allocator;
                              m.dims = 2;
                              m.w = local_248.w;
                              m.h = local_248.h;
                              m.d = 1;
                              m.c = 1;
                              transpose_pack_B_tile_int8
                                        ((Mat *)&opt_q,&m,0x10,iVar73,iVar109,(int)m.cstep);
                              m.cstep = 0;
                              m.data = (void *)0x0;
                              m.refcount._0_4_ = 0;
                              m.refcount._4_4_ = 0;
                              m.elemsize = 0;
                              m.elempack = 0;
                              m.dims = 0;
                              m.w = 0;
                              m.h = 0;
                              m.d = 0;
                              m.c = 0;
                              iVar100 = iVar100 + 1;
                            } while (iVar72 != iVar100);
                          }
                          piVar81 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,
                                                    opt_q.blob_allocator._0_4_);
                          if (piVar81 != (int *)0x0) {
                            LOCK();
                            *piVar81 = *piVar81 + -1;
                            UNLOCK();
                            if (*piVar81 == 0) {
                              if (opt_q._32_8_ == 0) {
                                if (opt_q._0_8_ != 0) {
                                  free((void *)opt_q._0_8_);
                                }
                              }
                              else {
                                (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
                              }
                            }
                          }
LAB_001dda4c:
                          local_298[0] = 0;
                          opt_q.use_winograd43_convolution = false;
                          opt_q.use_winograd63_convolution = false;
                          opt_q.use_a53_a55_optimized_kernel = false;
                          opt_q.use_fp16_uniform = false;
                          opt_q.use_local_pool_allocator = false;
                          opt_q.use_shader_local_memory = false;
                          opt_q.use_cooperative_matrix = false;
                          opt_q.use_winograd23_convolution = false;
                          opt_q.flush_denormals = 0;
                          opt_q.use_reserved_1 = false;
                          opt_q.use_image_storage = false;
                          opt_q.use_tensor_storage = false;
                          opt_q.use_reserved_2 = false;
                          opt_q.vulkan_device_index = 0;
                          opt_q.openmp_blocktime = 0;
                          opt_q.workspace_allocator = (Allocator *)0x0;
                          opt_q.blob_allocator._4_4_ = 0;
                          opt_q.blob_allocator._0_4_ = 0;
                          opt_q.lightmode = false;
                          opt_q.use_shader_pack8 = false;
                          opt_q.use_subgroup_ops = false;
                          opt_q.use_reserved_0 = false;
                          opt_q.num_threads = 0;
                          if (!bVar116) {
                            m.cstep = 0;
                            m.data = (void *)0x0;
                            m.refcount._0_4_ = 0;
                            m.refcount._4_4_ = 0;
                            m.elemsize = 0;
                            m.elempack = 0;
                            m.allocator = (Allocator *)0x0;
                            m.dims = 0;
                            m.w = 0;
                            m.h = 0;
                            m.d = 0;
                            m.c = 0;
                            Mat::create(&m,TILE_N * TILE_M * 0x10,1,iVar54,4,
                                        local_358->workspace_allocator);
                            local_498 = -100;
                            if ((m.data != (void *)0x0) && ((long)m.c * m.cstep != 0)) {
                              if (0 < (int)local_2e0) {
                                iVar51 = 0;
                                pvVar57 = local_3e8;
                                do {
                                  iVar54 = TILE_M;
                                  iVar72 = get_omp_thread_num();
                                  m_1.data = (void *)((long)iVar72 * m.cstep * m.elemsize +
                                                     (long)m.data);
                                  m_1.refcount._0_4_ = 0;
                                  m_1.refcount._4_4_ = 0;
                                  m_1.elemsize = m.elemsize;
                                  m_1.elempack = m.elempack;
                                  m_1.allocator = m.allocator;
                                  m_1.w = m.w;
                                  m_1.h = m.h;
                                  m_1.d = 1;
                                  m_1.c = m.d;
                                  m_1.cstep = (m.elemsize * (long)m.h * (long)m.w + 0xf &
                                              0xfffffffffffffff0) / m.elemsize;
                                  m_1.dims = m.dims + -1;
                                  if (m.dims == 4) {
                                    m_1.cstep = (long)m.h * (long)m.w;
                                  }
                                  local_3f8 = (void *)CONCAT44(local_3f8._4_4_,iVar51);
                                  iVar51 = iVar54 * iVar51;
                                  uVar97 = (int)local_3f0 - iVar51;
                                  if (iVar54 < (int)uVar97) {
                                    uVar97 = iVar54;
                                  }
                                  if (0 < (int)pvVar57) {
                                    iVar54 = 0;
                                    do {
                                      uVar108 = (int)pvVar57 - iVar54;
                                      if (TILE_N < (int)uVar108) {
                                        uVar108 = TILE_N;
                                      }
                                      uVar114 = CONCAT44(0,uVar108);
                                      if (0 < iVar71) {
                                        iVar72 = 0;
                                        do {
                                          iVar87 = iVar71 - iVar72;
                                          if (TILE_K < iVar71 - iVar72) {
                                            iVar87 = TILE_K;
                                          }
                                          opt_q._44_4_ = (this->weight_winograd23_data).w;
                                          opt_q.workspace_allocator =
                                               (Allocator *)(this->weight_winograd23_data).elemsize;
                                          opt_q.flush_denormals = (this->weight_winograd23_data).h;
                                          opt_q.openmp_blocktime =
                                               (this->weight_winograd23_data).elempack;
                                          opt_q._32_8_ = (this->weight_winograd23_data).allocator;
                                          local_298[0] = (long)opt_q.flush_denormals *
                                                         (long)(int)opt_q._44_4_;
                                          opt_q._0_8_ = (long)(this->weight_winograd23_data).data +
                                                        (long)opt_q.workspace_allocator *
                                                        local_298[0] * (long)(iVar72 / TILE_K) +
                                                        (long)(iVar51 / TILE_M) *
                                                        (this->weight_winograd23_data).cstep *
                                                        (long)opt_q.workspace_allocator;
                                          opt_q.blob_allocator._0_4_ = 0;
                                          opt_q.blob_allocator._4_4_ = 0;
                                          opt_q.vulkan_device_index = 2;
                                          opt_q.use_local_pool_allocator = true;
                                          opt_q.use_shader_local_memory = false;
                                          opt_q.use_cooperative_matrix = false;
                                          opt_q.use_winograd23_convolution = false;
                                          opt_q.use_winograd43_convolution = true;
                                          opt_q.use_winograd63_convolution = false;
                                          opt_q.use_a53_a55_optimized_kernel = false;
                                          opt_q.use_fp16_uniform = false;
                                          local_128.cstep = (long)local_248.h * (long)local_248.w;
                                          local_128.data =
                                               (void *)((long)local_248.data +
                                                       local_128.cstep * local_248.elemsize *
                                                       (long)(iVar72 / TILE_K) +
                                                       (long)(iVar54 / TILE_N) * local_248.cstep *
                                                       local_248.elemsize);
                                          local_128.refcount._0_4_ = 0;
                                          local_128.refcount._4_4_ = 0;
                                          local_128.elemsize = local_248.elemsize;
                                          local_128.elempack = local_248.elempack;
                                          local_128.allocator = local_248.allocator;
                                          local_128.dims = 2;
                                          local_128.w = local_248.w;
                                          local_128.h = local_248.h;
                                          local_128.d = 1;
                                          local_128.c = 1;
                                          gemm_transB_packed_tile_int8
                                                    ((Mat *)&opt_q,&local_128,&m_1,0x10,uVar97,
                                                     uVar108,iVar72,iVar87,iVar71 <= TILE_K + iVar72
                                                    );
                                          local_128.cstep = 0;
                                          local_128.data = (void *)0x0;
                                          local_128.refcount._0_4_ = 0;
                                          local_128.refcount._4_4_ = 0;
                                          local_128.elemsize = 0;
                                          local_128.elempack = 0;
                                          local_128.dims = 0;
                                          local_128.w = 0;
                                          local_128.h = 0;
                                          local_128.d = 0;
                                          local_128.c = 0;
                                          piVar81 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,
                                                                    opt_q.blob_allocator._0_4_);
                                          if (piVar81 != (int *)0x0) {
                                            LOCK();
                                            *piVar81 = *piVar81 + -1;
                                            UNLOCK();
                                            if (*piVar81 == 0) {
                                              if (opt_q._32_8_ == 0) {
                                                if (opt_q._0_8_ != 0) {
                                                  free((void *)opt_q._0_8_);
                                                }
                                              }
                                              else {
                                                (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
                                              }
                                            }
                                          }
                                          local_298[0] = 0;
                                          opt_q.lightmode = false;
                                          opt_q.use_shader_pack8 = false;
                                          opt_q.use_subgroup_ops = false;
                                          opt_q.use_reserved_0 = false;
                                          opt_q.num_threads = 0;
                                          opt_q.blob_allocator._0_4_ = 0;
                                          opt_q.blob_allocator._4_4_ = 0;
                                          opt_q.workspace_allocator = (Allocator *)0x0;
                                          opt_q.openmp_blocktime = 0;
                                          opt_q.vulkan_device_index = 0;
                                          opt_q.use_reserved_1 = false;
                                          opt_q.use_image_storage = false;
                                          opt_q.use_tensor_storage = false;
                                          opt_q.use_reserved_2 = false;
                                          opt_q.flush_denormals = 0;
                                          opt_q.use_local_pool_allocator = false;
                                          opt_q.use_shader_local_memory = false;
                                          opt_q.use_cooperative_matrix = false;
                                          opt_q.use_winograd23_convolution = false;
                                          opt_q.use_winograd43_convolution = false;
                                          opt_q.use_winograd63_convolution = false;
                                          opt_q.use_a53_a55_optimized_kernel = false;
                                          opt_q.use_fp16_uniform = false;
                                          iVar72 = iVar72 + TILE_K;
                                        } while (iVar72 < iVar71);
                                      }
                                      iVar100 = (int)local_328.cstep * local_328.elempack;
                                      iVar72 = (local_328.w - (local_328.w + 1 >> 0x1f)) + 1 >> 1;
                                      iVar87 = uVar108 * 0x10;
                                      local_3c8 = CONCAT44(local_3c8._4_4_,iVar87);
                                      uVar77 = 0;
                                      if (3 < (int)uVar97) {
                                        local_350 = (void *)CONCAT44(local_350._4_4_,iVar100);
                                        lVar76 = (long)iVar100;
                                        local_3d8._0_8_ = lVar76;
                                        iVar73 = 0;
                                        auVar46._8_8_ = 0;
                                        auVar46._0_8_ = local_348._8_8_;
                                        local_348 = auVar46 << 0x40;
                                        do {
                                          if (0 < (int)uVar108) {
                                            lVar55 = (long)iVar73;
                                            lVar61 = 0;
                                            uVar77 = 0;
                                            do {
                                              lVar56 = (long)m_1.data + lVar61;
                                              lVar68 = -0x40;
                                              do {
                                                auVar122 = *(undefined1 (*) [16])
                                                            (lVar56 + (long)(int)(uVar108 * 4) * 4 +
                                                                      lVar55 * 4);
                                                auVar128 = *(undefined1 (*) [16])
                                                            (lVar56 + (long)(int)(uVar108 * 8) * 4 +
                                                                      lVar55 * 4);
                                                auVar129 = vpaddd_avx(auVar122,*(undefined1 (*) [16]
                                                                                )(lVar56 + lVar55 * 
                                                  4));
                                                auVar129 = vpaddd_avx(auVar129,auVar128);
                                                auVar122 = vpsubd_avx(auVar122,auVar128);
                                                auVar122 = vpaddd_avx(auVar122,*(undefined1 (*) [16]
                                                                                )(lVar56 + (long)(
                                                  int)(uVar108 * 0xc) * 4 + lVar55 * 4));
                                                *(undefined1 (*) [16])((long)local_298 + lVar68) =
                                                     auVar129;
                                                *(undefined1 (*) [16])(auStack_258 + lVar68) =
                                                     auVar122;
                                                lVar56 = lVar56 + (long)iVar87 * 4;
                                                lVar68 = lVar68 + 0x10;
                                              } while (lVar68 != 0);
                                              iVar84 = iVar54 + (int)uVar77;
                                              iVar66 = iVar84 % iVar72;
                                              uVar105 = (iVar84 / iVar72) * 2;
                                              pauVar111 = (undefined1 (*) [16])
                                                          ((long)local_328.data +
                                                          (long)(iVar66 * 2 * local_328.elempack) *
                                                          4 + (long)local_328.w * local_328.elemsize
                                                              * (long)(int)uVar105 +
                                                              local_328.cstep *
                                                              (long)((iVar51 + local_348._0_4_) /
                                                                    local_328.elempack) *
                                                              local_328.elemsize);
                                              iVar66 = iVar66 * 2 + 1;
                                              piVar81 = &opt_q.flush_denormals;
                                              lVar56 = 0;
                                              do {
                                                if ((int)(uVar105 | (uint)lVar56) < local_328.h) {
                                                  pOVar1 = (Option *)(piVar81 + -0xc);
                                                  auVar4[0] = pOVar1->lightmode;
                                                  auVar4[1] = pOVar1->use_shader_pack8;
                                                  auVar4[2] = pOVar1->use_subgroup_ops;
                                                  auVar4[3] = pOVar1->use_reserved_0;
                                                  auVar4._4_4_ = pOVar1->num_threads;
                                                  auVar4._8_8_ = pOVar1->blob_allocator;
                                                  auVar122 = vpaddd_avx(*(undefined1 (*) [16])
                                                                         (piVar81 + -8),auVar4);
                                                  auVar128 = vpsubd_avx(*(undefined1 (*) [16])
                                                                         (piVar81 + -8),
                                                                        *(undefined1 (*) [16])
                                                                         (piVar81 + -4));
                                                  auVar128 = vpaddd_avx(auVar128,*(undefined1
                                                                                   (*) [16])piVar81)
                                                  ;
                                                  auVar122 = vpaddd_avx(auVar122,*(undefined1
                                                                                   (*) [16])
                                                                                  (piVar81 + -4));
                                                  auVar129 = vpsrad_avx(auVar122,2);
                                                  auVar122 = vpsrad_avx(auVar128,2);
                                                  if (local_328.elempack == 1) {
                                                    *(int *)*pauVar111 = auVar129._0_4_;
                                                    *(int *)(*pauVar111 + lVar76 * 4) =
                                                         auVar129._4_4_;
                                                    *(int *)(*pauVar111 + (long)(iVar100 * 2) * 4) =
                                                         auVar129._8_4_;
                                                    *(int *)(*pauVar111 + (long)(iVar100 * 3) * 4) =
                                                         auVar129._12_4_;
                                                    if (iVar66 < local_328.w) {
                                                      *(int *)(*pauVar111 + 4) = auVar122._0_4_;
                                                      *(int *)(*pauVar111 + lVar76 * 4 + 4) =
                                                           auVar122._4_4_;
                                                      *(int *)(*pauVar111 +
                                                              (long)(iVar100 * 2) * 4 + 4) =
                                                           auVar122._8_4_;
                                                      *(int *)(*pauVar111 +
                                                              (long)(iVar100 * 3) * 4 + 4) =
                                                           auVar122._12_4_;
                                                    }
                                                  }
                                                  else if ((local_328.elempack == 4) &&
                                                          (*pauVar111 = auVar129,
                                                          iVar66 < local_328.w)) {
                                                    pauVar111[1] = auVar122;
                                                  }
                                                  pauVar111 = (undefined1 (*) [16])
                                                              (*pauVar111 +
                                                              (long)(local_328.elempack *
                                                                    local_328.w) * 4);
                                                }
                                                lVar56 = lVar56 + 1;
                                                piVar81 = piVar81 + 0x10;
                                              } while (lVar56 == 1);
                                              uVar77 = uVar77 + 1;
                                              lVar61 = lVar61 + 0x10;
                                            } while (uVar77 != uVar114);
                                          }
                                          uVar77 = local_348._0_8_ + 4;
                                          uVar62 = local_348._0_8_ + 7;
                                          iVar73 = iVar73 + uVar108 * 0x40;
                                          local_348._0_8_ = uVar77;
                                        } while (uVar62 < uVar97);
                                      }
                                      if ((int)((uint)uVar77 | 1) < (int)uVar97) {
                                        local_350 = local_328.data;
                                        local_3e0 = local_328.cstep * local_328.elemsize;
                                        lVar76 = (long)iVar100;
                                        local_3d8._0_8_ = lVar76;
                                        local_348._0_8_ = uVar114;
                                        iVar100 = (uint)uVar77 * uVar108 * 0x10;
                                        local_480 = uVar77 & 0xffffffff;
                                        do {
                                          if (0 < (int)uVar108) {
                                            puVar98 = (ulong *)((long)m_1.data + (long)iVar100 * 4);
                                            uVar77 = 0;
                                            do {
                                              lVar55 = -0x20;
                                              puVar69 = puVar98;
                                              do {
                                                auVar123._8_8_ = 0;
                                                auVar123._0_8_ = *puVar69;
                                                auVar130._8_8_ = 0;
                                                auVar130._0_8_ =
                                                     *(ulong *)((long)puVar69 +
                                                               (long)(int)(uVar108 * 2) * 4);
                                                auVar122 = vpaddd_avx(auVar130,auVar123);
                                                auVar135._8_8_ = 0;
                                                auVar135._0_8_ =
                                                     *(ulong *)((long)puVar69 +
                                                               (long)(int)(uVar108 * 4) * 4);
                                                auVar122 = vpaddd_avx(auVar122,auVar135);
                                                *(long *)((long)local_298 + lVar55 + -0x20) =
                                                     auVar122._0_8_;
                                                auVar122 = vpsubd_avx(auVar130,auVar135);
                                                auVar131._8_8_ = 0;
                                                auVar131._0_8_ =
                                                     *(ulong *)((long)puVar69 +
                                                               (long)(int)(uVar108 * 6) * 4);
                                                auVar122 = vpaddd_avx(auVar122,auVar131);
                                                *(long *)((long)local_298 + lVar55) = auVar122._0_8_
                                                ;
                                                puVar69 = (ulong *)((long)puVar69 +
                                                                   (long)(int)(uVar108 * 8) * 4);
                                                lVar55 = lVar55 + 8;
                                              } while (lVar55 != 0);
                                              iVar66 = iVar54 + (int)uVar77;
                                              iVar73 = iVar66 % iVar72;
                                              uVar105 = (iVar66 / iVar72) * 2;
                                              piVar81 = (int *)((long)local_328.data +
                                                               (long)(iVar73 * 2) * 4 +
                                                               (long)local_328.w *
                                                               local_328.elemsize *
                                                               (long)(int)uVar105 +
                                                               ((long)iVar51 + local_480) *
                                                               local_3e0);
                                              pbVar115 = &opt_q.use_winograd_convolution;
                                              lVar55 = 0;
                                              do {
                                                if ((int)(uVar105 | (uint)lVar55) < local_328.h) {
                                                  iVar66 = *(int *)(pbVar115 + -0x14);
                                                  iVar84 = *(int *)(pbVar115 + -0x10);
                                                  iVar109 = *(int *)(pbVar115 + -0xc);
                                                  iVar78 = *(int *)(pbVar115 + -0x18);
                                                  iVar89 = *(int *)(pbVar115 + -8);
                                                  iVar47 = *(int *)(pbVar115 + -4);
                                                  iVar50 = *(int *)pbVar115;
                                                  *piVar81 = *(int *)(pbVar115 + -0x1c) + iVar66 +
                                                             iVar109 >> 2;
                                                  piVar81[lVar76] = iVar78 + iVar84 + iVar89 >> 2;
                                                  if (iVar73 * 2 + 1 < local_328.w) {
                                                    piVar81[1] = (iVar66 - iVar109) + iVar47 >> 2;
                                                    piVar81[lVar76 + 1] =
                                                         (iVar84 - iVar89) + iVar50 >> 2;
                                                  }
                                                  piVar81 = piVar81 + local_328.w;
                                                }
                                                lVar55 = lVar55 + 1;
                                                pbVar115 = pbVar115 + 0x20;
                                              } while (lVar55 == 1);
                                              uVar77 = uVar77 + 1;
                                              puVar98 = puVar98 + 1;
                                            } while (uVar77 != uVar114);
                                          }
                                          uVar77 = local_480 + 2;
                                          lVar55 = local_480 + 3;
                                          iVar100 = iVar100 + uVar108 * 0x20;
                                          local_480 = uVar77;
                                        } while (lVar55 < (int)uVar97);
                                        uVar77 = uVar77 & 0xffffffff;
                                      }
                                      if ((int)uVar77 < (int)uVar97) {
                                        local_4a8 = uVar77 & 0xffffffff;
                                        iVar100 = (int)uVar77 * uVar108 * 0x10;
                                        do {
                                          if (0 < (int)uVar108) {
                                            piVar81 = (int *)((long)m_1.data + (long)iVar100 * 4);
                                            pvVar57 = (void *)(((long)iVar51 + local_4a8) *
                                                               local_328.cstep * local_328.elemsize
                                                              + (long)local_328.data);
                                            local_3d8._0_8_ = pvVar57;
                                            uVar77 = 0;
                                            do {
                                              lVar76 = -0x10;
                                              piVar70 = piVar81;
                                              do {
                                                iVar73 = piVar70[(int)uVar108];
                                                iVar66 = piVar70[(int)(uVar108 * 2)];
                                                *(int *)((long)local_298 + lVar76 + -0x30) =
                                                     *piVar70 + iVar73 + iVar66;
                                                *(int *)((long)local_298 + lVar76 + -0x20) =
                                                     (iVar73 - iVar66) + piVar70[(int)(uVar108 * 3)]
                                                ;
                                                piVar70 = piVar70 + (int)(uVar108 * 4);
                                                lVar76 = lVar76 + 4;
                                              } while (lVar76 != 0);
                                              iVar66 = iVar54 + (int)uVar77;
                                              iVar73 = iVar66 % iVar72;
                                              uVar105 = (iVar66 / iVar72) * 2;
                                              piVar70 = (int *)((long)pvVar57 +
                                                               (long)(iVar73 * 2) * 4 +
                                                               (long)local_328.w *
                                                               local_328.elemsize *
                                                               (long)(int)uVar105);
                                              piVar74 = (int *)((long)&opt_q.blob_allocator + 4);
                                              lVar76 = 0;
                                              do {
                                                if ((int)(uVar105 | (uint)lVar76) < local_328.h) {
                                                  iVar66 = piVar74[-2];
                                                  iVar84 = piVar74[-1];
                                                  iVar109 = *piVar74;
                                                  *piVar70 = piVar74[-3] + iVar66 + iVar84 >> 2;
                                                  if (iVar73 * 2 + 1 < local_328.w) {
                                                    piVar70[1] = (iVar66 - iVar84) + iVar109 >> 2;
                                                  }
                                                  piVar70 = piVar70 + local_328.w;
                                                }
                                                lVar76 = lVar76 + 1;
                                                piVar74 = piVar74 + 4;
                                              } while (lVar76 == 1);
                                              uVar77 = uVar77 + 1;
                                              piVar81 = piVar81 + 1;
                                            } while (uVar77 != uVar114);
                                          }
                                          local_4a8 = local_4a8 + 1;
                                          iVar100 = iVar100 + iVar87;
                                        } while (local_4a8 != uVar97);
                                      }
                                      iVar54 = iVar54 + TILE_N;
                                      pvVar57 = local_3e8;
                                    } while (iVar54 < (int)local_3e8);
                                  }
                                  piVar81 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
                                  iVar51 = (int)local_3f8;
                                  if (piVar81 != (int *)0x0) {
                                    LOCK();
                                    *piVar81 = *piVar81 + -1;
                                    UNLOCK();
                                    if (*piVar81 == 0) {
                                      if (m_1.allocator == (Allocator *)0x0) {
                                        if (m_1.data != (void *)0x0) {
                                          free(m_1.data);
                                        }
                                      }
                                      else {
                                        (*(m_1.allocator)->_vptr_Allocator[3])();
                                      }
                                    }
                                  }
                                  m_1.cstep = 0;
                                  m_1.data = (void *)0x0;
                                  m_1.refcount._0_4_ = 0;
                                  m_1.refcount._4_4_ = 0;
                                  m_1.elemsize = 0;
                                  m_1.elempack = 0;
                                  m_1.dims = 0;
                                  m_1.w = 0;
                                  m_1.h = 0;
                                  m_1.d = 0;
                                  m_1.c = 0;
                                  iVar51 = iVar51 + 1;
                                } while (iVar51 != (int)local_2e0);
                              }
                              local_498 = 0;
                            }
                            piVar81 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
                            if (piVar81 != (int *)0x0) {
                              LOCK();
                              *piVar81 = *piVar81 + -1;
                              UNLOCK();
                              if (*piVar81 == 0) {
                                if (m.allocator == (Allocator *)0x0) {
                                  if (m.data != (void *)0x0) {
                                    free(m.data);
                                  }
                                }
                                else {
                                  (*(m.allocator)->_vptr_Allocator[3])();
                                }
                              }
                            }
                            m.cstep = 0;
                            m.data = (void *)0x0;
                            m.refcount._0_4_ = 0;
                            m.refcount._4_4_ = 0;
                            m.elemsize = 0;
                            m.elempack = 0;
                            m.dims = 0;
                            m.w = 0;
                            m.h = 0;
                            m.d = 0;
                            m.c = 0;
                          }
                          goto LAB_001de7c4;
                        }
                        piVar81 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,
                                                  opt_q.blob_allocator._0_4_);
                        if (piVar81 != (int *)0x0) {
                          LOCK();
                          *piVar81 = *piVar81 + -1;
                          UNLOCK();
                          if (*piVar81 == 0) {
                            if (opt_q._32_8_ == 0) {
joined_r0x001dd96e:
                              if ((void *)opt_q._0_8_ != (void *)0x0) {
                                free((void *)opt_q._0_8_);
                              }
                            }
                            else {
                              (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
                            }
                          }
                        }
                      }
                      local_298[0] = 0;
                      opt_q.lightmode = false;
                      opt_q.use_shader_pack8 = false;
                      opt_q.use_subgroup_ops = false;
                      opt_q.use_reserved_0 = false;
                      opt_q.num_threads = 0;
                      opt_q.blob_allocator._0_4_ = 0;
                      opt_q.blob_allocator._4_4_ = 0;
                      opt_q.workspace_allocator = (Allocator *)0x0;
                      opt_q.openmp_blocktime = 0;
                      opt_q.vulkan_device_index = 0;
                      opt_q.use_reserved_1 = false;
                      opt_q.use_image_storage = false;
                      opt_q.use_tensor_storage = false;
                      opt_q.use_reserved_2 = false;
                      opt_q.flush_denormals = 0;
                      opt_q.use_local_pool_allocator = false;
                      opt_q.use_shader_local_memory = false;
                      opt_q.use_cooperative_matrix = false;
                      opt_q.use_winograd23_convolution = false;
                      opt_q.use_winograd43_convolution = false;
                      opt_q.use_winograd63_convolution = false;
                      opt_q.use_a53_a55_optimized_kernel = false;
                      opt_q.use_fp16_uniform = false;
                    }
LAB_001de7c4:
                    piVar81 = (int *)CONCAT44(local_248.refcount._4_4_,local_248.refcount._0_4_);
                    if (piVar81 != (int *)0x0) {
                      LOCK();
                      *piVar81 = *piVar81 + -1;
                      UNLOCK();
                      if (*piVar81 == 0) {
                        if (local_248.allocator == (Allocator *)0x0) {
                          if (local_248.data != (void *)0x0) {
                            free(local_248.data);
                          }
                        }
                        else {
                          (*(local_248.allocator)->_vptr_Allocator[3])();
                        }
                      }
                    }
                    local_248.cstep = 0;
                    local_248.data = (void *)0x0;
                    local_248.refcount._0_4_ = 0;
                    local_248.refcount._4_4_ = 0;
                    local_248.elemsize = 0;
                    local_248.elempack = 0;
                    local_248.dims = 0;
                    local_248.w = 0;
                    local_248.h = 0;
                    local_248.d = 0;
                    local_248.c = 0;
                  }
                  else {
                    local_498 = conv3x3s1_winograd23_int8_xop
                                          (&local_3b8,&local_328,AT,iVar54,local_358);
                  }
                }
                else {
                  local_498 = conv3x3s1_winograd23_int8_avx2
                                        (&local_3b8,&local_328,AT,iVar54,local_358);
                }
              }
              else {
                local_498 = conv3x3s1_winograd23_int8_avxvnni
                                      (&local_3b8,&local_328,AT,iVar54,local_358);
              }
            }
          }
          else {
            local_3d8 = auVar128;
            if (pOVar1->use_sgemm_convolution == true) {
              iVar71 = auVar128._4_4_ * auVar128._0_4_;
              uVar108 = local_328.elempack * local_328.c;
              pvVar57 = (void *)(ulong)uVar108;
              uVar105 = local_328.h * local_328.w;
              iVar100 = local_3b8.c * iVar71 * local_3b8.elempack;
              convolution_im2col_gemm_get_optimal_tile_mnk_int8
                        (uVar108,uVar105,iVar100,&TILE_M,&TILE_N,&TILE_K,iVar54);
              local_3f0 = CONCAT44(local_3f0._4_4_,(int)(uVar108 + TILE_M + -1) / TILE_M);
              iVar72 = (int)(uVar105 + TILE_N + -1) / TILE_N;
              iVar87 = (TILE_K + iVar100 + -1) / TILE_K;
              local_298[0] = 0;
              opt_q.lightmode = false;
              opt_q.use_shader_pack8 = false;
              opt_q.use_subgroup_ops = false;
              opt_q.use_reserved_0 = false;
              opt_q.num_threads = 0;
              opt_q.blob_allocator._0_4_ = 0;
              opt_q.blob_allocator._4_4_ = 0;
              opt_q.workspace_allocator = (Allocator *)0x0;
              opt_q.openmp_blocktime = 0;
              opt_q.use_bf16_storage = false;
              opt_q.use_fp16_packed = false;
              opt_q.use_fp16_storage = false;
              opt_q.use_fp16_arithmetic = false;
              opt_q.use_int8_packed = false;
              opt_q.use_int8_storage = false;
              opt_q.use_int8_arithmetic = false;
              opt_q.use_packing_layout = false;
              opt_q.vulkan_device_index = 0;
              opt_q.use_reserved_1 = false;
              opt_q.use_image_storage = false;
              opt_q.use_tensor_storage = false;
              opt_q.use_reserved_2 = false;
              opt_q.flush_denormals = 0;
              opt_q.use_local_pool_allocator = false;
              opt_q.use_shader_local_memory = false;
              opt_q.use_cooperative_matrix = false;
              opt_q.use_winograd23_convolution = false;
              opt_q.use_winograd43_convolution = false;
              opt_q.use_winograd63_convolution = false;
              opt_q.use_a53_a55_optimized_kernel = false;
              opt_q.use_fp16_uniform = false;
              Mat::create((Mat *)&opt_q,TILE_K * TILE_N,iVar87,iVar72,1,
                          local_358->workspace_allocator);
              local_498 = -100;
              local_350 = pvVar57;
              if ((opt_q._0_8_ != 0) && ((long)(int)opt_q._56_4_ * local_298[0] != 0)) {
                iVar72 = iVar72 * iVar87;
                local_3c8 = (ulong)uVar105;
                if (0 < iVar72) {
                  auVar122 = vpcmpeqd_avx(local_3d8,_DAT_005efe40);
                  uVar63 = vmovmskps_avx(auVar122);
                  local_3c0 = CONCAT31(local_3c0._1_3_,
                                       (((auVar128._4_4_ == 1 && auVar128._0_4_ == 1) && iVar51 == 1
                                        ) && uVar97 == 1) & (byte)uVar63 >> 2 & (byte)uVar63 >> 3);
                  uVar108 = local_3d8._8_4_;
                  uVar114 = (ulong)uVar108;
                  iVar73 = local_3d8._12_4_;
                  local_348 = vpshufd_avx(ZEXT416(uVar97),0);
                  iVar66 = 0;
                  local_3f8 = (void *)CONCAT44(local_3f8._4_4_,iVar71);
                  local_370 = uVar114;
                  do {
                    auVar122 = local_3d8;
                    local_3d8._0_4_ = TILE_N * (iVar66 / iVar87);
                    local_3d8._4_4_ = 0;
                    iVar84 = TILE_K * (int)((long)iVar66 % (long)iVar87);
                    local_3d8._8_8_ = auVar122._8_8_;
                    uVar105 = (int)local_3c8 - local_3d8._0_4_;
                    if (TILE_N < (int)uVar105) {
                      uVar105 = TILE_N;
                    }
                    uVar95 = iVar100 - iVar84;
                    if (TILE_K < iVar100 - iVar84) {
                      uVar95 = TILE_K;
                    }
                    local_248.cstep = (size_t)(int)opt_q._44_4_;
                    local_248.data =
                         (void *)(((long)iVar66 % (long)iVar87 & 0xffffffffU) * local_248.cstep *
                                  (long)opt_q.workspace_allocator +
                                 (long)(iVar66 / iVar87) * local_298[0] *
                                 (long)opt_q.workspace_allocator + opt_q._0_8_);
                    local_248.refcount._0_4_ = 0;
                    local_248.refcount._4_4_ = 0;
                    local_248.elemsize = (size_t)opt_q.workspace_allocator;
                    local_248.elempack = opt_q.openmp_blocktime;
                    local_248.allocator = (Allocator *)opt_q._32_8_;
                    local_248.dims = 2;
                    local_248.w._0_1_ = opt_q.use_reserved_1;
                    local_248.w._1_1_ = opt_q.use_image_storage;
                    local_248.w._2_1_ = opt_q.use_tensor_storage;
                    local_248.w._3_1_ = opt_q.use_reserved_2;
                    local_248.h = 1;
                    local_248.d = 1;
                    local_248.c = 1;
                    iVar109 = cpu_support_x86_avx_vnni_int8();
                    iVar78 = (int)uVar114;
                    if (iVar109 == 0) {
                      iVar109 = cpu_support_x86_avx_vnni();
                      if (iVar109 == 0) {
                        iVar109 = cpu_support_x86_avx2();
                        iVar89 = local_3d8._0_4_;
                        if (iVar109 == 0) {
                          iVar109 = (int)local_3b8.cstep;
                          if ((char)local_3c0 == '\0') {
                            uVar106 = (int)(~((auVar128._0_4_ + -1) * uVar108) + local_3b8.w) /
                                      (int)uVar97;
                            uVar82 = uVar106 + 1;
                            if (uVar106 == 0) {
                              uVar106 = 1;
                              uVar65 = 0;
                              uVar52 = 0;
                            }
                            else {
                              uVar65 = 0x1f;
                              if (uVar106 != 0) {
                                for (; uVar106 >> uVar65 == 0; uVar65 = uVar65 - 1) {
                                }
                              }
                              iVar47 = 1 << (-(char)(uVar65 ^ 0x1f) & 0x1fU);
                              uVar52 = 1;
                              if ((uVar65 ^ 0x1f) == 0) {
                                iVar47 = 0;
                              }
                              auVar11._4_8_ = 0;
                              auVar11._0_4_ = uVar82;
                              auVar15._4_8_ = 0;
                              auVar15._0_4_ = iVar47 - uVar82;
                              uVar106 = SUB124((auVar15 << 0x20) / auVar11,0) + 1;
                            }
                            auVar129 = vpshufd_avx(ZEXT416(uVar106),0);
                            auVar122 = vpmovzxdq_avx(ZEXT416(uVar52));
                            pauVar111 = (undefined1 (*) [16])local_248.data;
                            if ((int)uVar105 < 8) {
                              uVar106 = 0;
                            }
                            else {
                              auVar158 = vpshufd_avx(ZEXT416(uVar82),0);
                              iVar47 = local_3b8.w * iVar73;
                              uVar52 = uVar95 + 7;
                              if (-1 < (int)uVar95) {
                                uVar52 = uVar95;
                              }
                              iVar50 = iVar84 + 7;
                              if (-1 < iVar84) {
                                iVar50 = iVar84;
                              }
                              auVar149 = vpshufd_avx(ZEXT416((uint)(local_3b8.w * iVar51)),0);
                              uVar83 = 0;
                              do {
                                auVar147 = vpshufd_avx(ZEXT416(iVar89 + uVar83),0);
                                auVar182 = vpaddd_avx(auVar147,_DAT_005eff50);
                                auVar167 = vpmuludq_avx(auVar182,auVar129);
                                auVar162 = vpsrlq_avx(auVar167,0x20);
                                auVar167 = vpsrlq_avx(auVar182,0x20);
                                auVar167 = vpmuludq_avx(auVar167,auVar129);
                                auVar162 = vpblendw_avx(auVar162,auVar167,0xcc);
                                auVar167 = vpsubd_avx(auVar182,auVar162);
                                auVar168 = vpsrld_avx(auVar167,auVar122);
                                auVar167 = vpaddd_avx(auVar147,_DAT_005eff60);
                                auVar162 = vpaddd_avx(auVar168,auVar162);
                                auVar147 = vpsrld_avx(auVar162,ZEXT416(uVar65));
                                auVar162 = vpmuludq_avx(auVar167,auVar129);
                                auVar168 = vpsrlq_avx(auVar162,0x20);
                                auVar162 = vpsrlq_avx(auVar167,0x20);
                                auVar162 = vpmuludq_avx(auVar162,auVar129);
                                auVar162 = vpblendw_avx(auVar168,auVar162,0xcc);
                                auVar168 = vpsubd_avx(auVar167,auVar162);
                                auVar168 = vpsrld_avx(auVar168,auVar122);
                                auVar162 = vpaddd_avx(auVar168,auVar162);
                                auVar168 = vpsrld_avx(auVar162,ZEXT416(uVar65));
                                auVar162 = vpmulld_avx(auVar147,auVar158);
                                auVar182 = vpsubd_avx(auVar182,auVar162);
                                auVar182 = vpmulld_avx(auVar182,local_348);
                                auVar162 = vpmulld_avx(auVar147,auVar149);
                                auVar147 = vpmulld_avx(auVar168,auVar149);
                                auVar182 = vpaddd_avx(auVar182,auVar162);
                                if ((uVar97 == 1) && (auVar162._0_4_ == auVar147._12_4_)) {
                                  iVar49 = auVar182._0_4_;
                                  if (local_3b8.elempack == 1) {
                                    iVar48 = 0;
                                    if (1 < (int)uVar95) {
                                      iVar79 = 0;
                                      do {
                                        uVar77 = (long)(iVar84 + iVar79) % (long)iVar71;
                                        iVar48 = iVar84 + iVar79 + 1;
                                        uVar62 = (long)iVar48 % (long)iVar71;
                                        uVar77 = (ulong)(uint)((int)uVar77 >> 0x1f) << 0x20 |
                                                 uVar77 & 0xffffffff;
                                        uVar62 = (ulong)(uint)((int)uVar62 >> 0x1f) << 0x20 |
                                                 uVar62 & 0xffffffff;
                                        auVar155._8_8_ = 0;
                                        auVar155._0_8_ =
                                             *(ulong *)((long)local_3b8.data +
                                                       (long)((int)((long)uVar77 %
                                                                   (long)(int)auVar128._0_4_) *
                                                              iVar78 + ((iVar84 + iVar79) / iVar71)
                                                                       * iVar109 + iVar49 +
                                                             (int)((long)uVar77 /
                                                                  (long)(int)auVar128._0_4_) *
                                                             iVar47));
                                        auVar163._8_8_ = 0;
                                        auVar163._0_8_ =
                                             *(ulong *)((long)local_3b8.data +
                                                       (long)((int)((long)uVar62 %
                                                                   (long)(int)auVar128._0_4_) *
                                                              iVar78 + (iVar48 / iVar71) * iVar109 +
                                                                       iVar49 +
                                                             (int)((long)uVar62 /
                                                                  (long)(int)auVar128._0_4_) *
                                                             iVar47));
                                        auVar182 = vpunpcklbw_avx(auVar155,auVar163);
                                        *pauVar111 = auVar182;
                                        pauVar111 = pauVar111 + 1;
                                        iVar48 = iVar79 + 2;
                                        iVar107 = iVar79 + 3;
                                        iVar79 = iVar48;
                                      } while (iVar107 < (int)uVar95);
                                    }
                                    iVar79 = uVar95 - iVar48;
                                    if (iVar79 != 0 && iVar48 <= (int)uVar95) {
                                      iVar48 = iVar48 + iVar84;
                                      do {
                                        uVar77 = (ulong)(uint)((int)((long)iVar48 % (long)iVar71) >>
                                                              0x1f) << 0x20 |
                                                 (long)iVar48 % (long)iVar71 & 0xffffffffU;
                                        *(undefined8 *)*pauVar111 =
                                             *(undefined8 *)
                                              ((long)local_3b8.data +
                                              (long)((int)((long)uVar77 % (long)(int)auVar128._0_4_)
                                                     * iVar78 + (iVar48 / iVar71) * iVar109 + iVar49
                                                    + (int)((long)uVar77 / (long)(int)auVar128._0_4_
                                                           ) * iVar47));
                                        pauVar111 = (undefined1 (*) [16])(*pauVar111 + 8);
                                        iVar48 = iVar48 + 1;
                                        iVar79 = iVar79 + -1;
                                      } while (iVar79 != 0);
                                    }
                                  }
                                  iVar48 = (int)uVar52 >> 3;
                                  iVar79 = iVar50 >> 3;
                                  if (7 < (int)uVar95 && local_3b8.elempack == 8) {
                                    do {
                                      uVar77 = (ulong)(uint)((int)((long)iVar79 % (long)iVar71) >>
                                                            0x1f) << 0x20 |
                                               (long)iVar79 % (long)iVar71 & 0xffffffffU;
                                      lVar76 = (long)((int)((long)uVar77 % (long)(int)auVar128._0_4_
                                                           ) * iVar78 +
                                                      (iVar79 / iVar71) * iVar109 + iVar49 +
                                                     (int)((long)uVar77 / (long)(int)auVar128._0_4_)
                                                     * iVar47);
                                      auVar182 = *(undefined1 (*) [16])
                                                  ((long)local_3b8.data + lVar76 * 8);
                                      auVar167 = *(undefined1 (*) [16])
                                                  ((long)local_3b8.data + lVar76 * 8 + 0x10);
                                      auVar162 = *(undefined1 (*) [16])
                                                  ((long)local_3b8.data + lVar76 * 8 + 0x20);
                                      auVar147 = *(undefined1 (*) [16])
                                                  ((long)local_3b8.data + lVar76 * 8 + 0x30);
                                      auVar168 = vpunpcklwd_avx(auVar182,auVar167);
                                      auVar182 = vpunpckhwd_avx(auVar182,auVar167);
                                      auVar169 = vpunpcklwd_avx(auVar162,auVar147);
                                      auVar167 = vpunpckhwd_avx(auVar162,auVar147);
                                      auVar162 = vpunpcklwd_avx(auVar168,auVar182);
                                      auVar147 = vpunpcklwd_avx(auVar169,auVar167);
                                      auVar182 = vpunpckhwd_avx(auVar168,auVar182);
                                      auVar167 = vpunpckhwd_avx(auVar169,auVar167);
                                      auVar168 = vpunpcklqdq_avx(auVar162,auVar147);
                                      auVar162 = vpunpckhqdq_avx(auVar162,auVar147);
                                      auVar147 = vpunpcklqdq_avx(auVar182,auVar167);
                                      auVar182 = vpunpckhqdq_avx(auVar182,auVar167);
                                      *pauVar111 = auVar168;
                                      pauVar111[1] = auVar162;
                                      pauVar111[2] = auVar147;
                                      pauVar111[3] = auVar182;
                                      pauVar111 = pauVar111 + 4;
                                      iVar48 = iVar48 + -1;
                                      iVar79 = iVar79 + 1;
                                    } while (iVar48 != 0);
                                  }
                                }
                                else {
                                  auVar162 = vpmulld_avx(auVar168,auVar158);
                                  auVar167 = vpsubd_avx(auVar167,auVar162);
                                  auVar167 = vpmulld_avx(auVar167,local_348);
                                  auVar167 = vpaddd_avx(auVar147,auVar167);
                                  if (local_3b8.elempack == 1) {
                                    iVar49 = 0;
                                    if (1 < (int)uVar95) {
                                      iVar48 = 0;
                                      do {
                                        uVar77 = (long)(iVar84 + iVar48) % (long)iVar71;
                                        iVar49 = iVar84 + iVar48 + 1;
                                        uVar62 = (long)iVar49 % (long)iVar71;
                                        uVar77 = (ulong)(uint)((int)uVar77 >> 0x1f) << 0x20 |
                                                 uVar77 & 0xffffffff;
                                        uVar62 = (ulong)(uint)((int)uVar62 >> 0x1f) << 0x20 |
                                                 uVar62 & 0xffffffff;
                                        auVar147 = vpshufd_avx(ZEXT416((uint)((int)((long)uVar77 %
                                                                                   (long)(int)
                                                  auVar128._0_4_) * iVar78 +
                                                  ((iVar84 + iVar48) / iVar71) * iVar109 +
                                                  (int)((long)uVar77 / (long)(int)auVar128._0_4_) *
                                                  iVar47)),0);
                                        auVar162 = vpaddd_avx(auVar147,auVar182);
                                        auVar147 = vpaddd_avx(auVar147,auVar167);
                                        auVar169 = vpshufd_avx(ZEXT416((uint)((int)((long)uVar62 %
                                                                                   (long)(int)
                                                  auVar128._0_4_) * iVar78 +
                                                  (iVar49 / iVar71) * iVar109 +
                                                  (int)((long)uVar62 / (long)(int)auVar128._0_4_) *
                                                  iVar47)),0);
                                        auVar168 = vpaddd_avx(auVar169,auVar182);
                                        auVar169 = vpaddd_avx(auVar169,auVar167);
                                        (*pauVar111)[0] =
                                             *(undefined1 *)
                                              ((long)local_3b8.data + (long)auVar162._0_4_);
                                        (*pauVar111)[1] =
                                             *(undefined1 *)
                                              ((long)local_3b8.data + (long)auVar168._0_4_);
                                        (*pauVar111)[2] =
                                             *(undefined1 *)
                                              ((long)local_3b8.data + (long)auVar162._4_4_);
                                        (*pauVar111)[3] =
                                             *(undefined1 *)
                                              ((long)local_3b8.data + (long)auVar168._4_4_);
                                        (*pauVar111)[4] =
                                             *(undefined1 *)
                                              ((long)local_3b8.data + (long)auVar162._8_4_);
                                        (*pauVar111)[5] =
                                             *(undefined1 *)
                                              ((long)local_3b8.data + (long)auVar168._8_4_);
                                        (*pauVar111)[6] =
                                             *(undefined1 *)
                                              ((long)local_3b8.data + (long)auVar162._12_4_);
                                        (*pauVar111)[7] =
                                             *(undefined1 *)
                                              ((long)local_3b8.data + (long)auVar168._12_4_);
                                        (*pauVar111)[8] =
                                             *(undefined1 *)
                                              ((long)local_3b8.data + (long)auVar147._0_4_);
                                        (*pauVar111)[9] =
                                             *(undefined1 *)
                                              ((long)local_3b8.data + (long)auVar169._0_4_);
                                        (*pauVar111)[10] =
                                             *(undefined1 *)
                                              ((long)local_3b8.data + (long)auVar147._4_4_);
                                        (*pauVar111)[0xb] =
                                             *(undefined1 *)
                                              ((long)local_3b8.data + (long)auVar169._4_4_);
                                        (*pauVar111)[0xc] =
                                             *(undefined1 *)
                                              ((long)local_3b8.data + (long)auVar147._8_4_);
                                        (*pauVar111)[0xd] =
                                             *(undefined1 *)
                                              ((long)local_3b8.data + (long)auVar169._8_4_);
                                        (*pauVar111)[0xe] =
                                             *(undefined1 *)
                                              ((long)local_3b8.data + (long)auVar147._12_4_);
                                        (*pauVar111)[0xf] =
                                             *(undefined1 *)
                                              ((long)local_3b8.data + (long)auVar169._12_4_);
                                        pauVar111 = pauVar111 + 1;
                                        iVar49 = iVar48 + 2;
                                        iVar79 = iVar48 + 3;
                                        iVar48 = iVar49;
                                      } while (iVar79 < (int)uVar95);
                                    }
                                    iVar48 = uVar95 - iVar49;
                                    if (iVar48 != 0 && iVar49 <= (int)uVar95) {
                                      iVar49 = iVar49 + iVar84;
                                      do {
                                        uVar77 = (ulong)(uint)((int)((long)iVar49 % (long)iVar71) >>
                                                              0x1f) << 0x20 |
                                                 (long)iVar49 % (long)iVar71 & 0xffffffffU;
                                        auVar147 = vpshufd_avx(ZEXT416((uint)((int)((long)uVar77 %
                                                                                   (long)(int)
                                                  auVar128._0_4_) * iVar78 +
                                                  (iVar49 / iVar71) * iVar109 +
                                                  (int)((long)uVar77 / (long)(int)auVar128._0_4_) *
                                                  iVar47)),0);
                                        auVar162 = vpaddd_avx(auVar147,auVar182);
                                        auVar147 = vpaddd_avx(auVar147,auVar167);
                                        (*pauVar111)[0] =
                                             *(undefined1 *)
                                              ((long)local_3b8.data + (long)auVar162._0_4_);
                                        (*pauVar111)[1] =
                                             *(undefined1 *)
                                              ((long)local_3b8.data + (long)auVar162._4_4_);
                                        (*pauVar111)[2] =
                                             *(undefined1 *)
                                              ((long)local_3b8.data + (long)auVar162._8_4_);
                                        (*pauVar111)[3] =
                                             *(undefined1 *)
                                              ((long)local_3b8.data + (long)auVar162._12_4_);
                                        (*pauVar111)[4] =
                                             *(undefined1 *)
                                              ((long)local_3b8.data + (long)auVar147._0_4_);
                                        (*pauVar111)[5] =
                                             *(undefined1 *)
                                              ((long)local_3b8.data + (long)auVar147._4_4_);
                                        (*pauVar111)[6] =
                                             *(undefined1 *)
                                              ((long)local_3b8.data + (long)auVar147._8_4_);
                                        (*pauVar111)[7] =
                                             *(undefined1 *)
                                              ((long)local_3b8.data + (long)auVar147._12_4_);
                                        pauVar111 = (undefined1 (*) [16])(*pauVar111 + 8);
                                        iVar49 = iVar49 + 1;
                                        iVar48 = iVar48 + -1;
                                      } while (iVar48 != 0);
                                    }
                                  }
                                  iVar49 = (int)uVar52 >> 3;
                                  iVar48 = iVar50 >> 3;
                                  if (7 < (int)uVar95 && local_3b8.elempack == 8) {
                                    do {
                                      uVar77 = (ulong)(uint)((int)((long)iVar48 % (long)iVar71) >>
                                                            0x1f) << 0x20 |
                                               (long)iVar48 % (long)iVar71 & 0xffffffffU;
                                      auVar147 = vpshufd_avx(ZEXT416((uint)((int)((long)uVar77 %
                                                                                 (long)(int)auVar128
                                                  ._0_4_) * iVar78 + (iVar48 / iVar71) * iVar109 +
                                                  (int)((long)uVar77 / (long)(int)auVar128._0_4_) *
                                                  iVar47)),0);
                                      auVar162 = vpaddd_avx(auVar147,auVar182);
                                      auVar147 = vpaddd_avx(auVar147,auVar167);
                                      auVar168 = vpslld_avx(auVar162,3);
                                      auVar169 = vpslld_avx(auVar147,3);
                                      auVar181._8_8_ = 0;
                                      auVar181._0_8_ =
                                           *(ulong *)((long)local_3b8.data + (long)auVar168._0_4_);
                                      auVar192._8_8_ = 0;
                                      auVar192._0_8_ =
                                           *(ulong *)((long)local_3b8.data + (long)auVar168._4_4_);
                                      auVar162 = vpunpcklwd_avx(auVar181,auVar192);
                                      auVar174._8_8_ = 0;
                                      auVar174._0_8_ =
                                           *(ulong *)((long)local_3b8.data + (long)auVar168._8_4_);
                                      auVar195._8_8_ = 0;
                                      auVar195._0_8_ =
                                           *(ulong *)((long)local_3b8.data + (long)auVar168._12_4_);
                                      auVar147 = vpunpcklwd_avx(auVar174,auVar195);
                                      auVar187._8_8_ = 0;
                                      auVar187._0_8_ =
                                           *(ulong *)((long)local_3b8.data + (long)auVar169._0_4_);
                                      auVar196._8_8_ = 0;
                                      auVar196._0_8_ =
                                           *(ulong *)((long)local_3b8.data + (long)auVar169._4_4_);
                                      auVar168 = vpunpcklwd_avx(auVar187,auVar196);
                                      auVar175._8_8_ = 0;
                                      auVar175._0_8_ =
                                           *(ulong *)((long)local_3b8.data + (long)auVar169._8_4_);
                                      auVar193._8_8_ = 0;
                                      auVar193._0_8_ =
                                           *(ulong *)((long)local_3b8.data + (long)auVar169._12_4_);
                                      auVar169 = vpunpcklwd_avx(auVar175,auVar193);
                                      auVar14 = vpunpckldq_avx(auVar162,auVar147);
                                      auVar162 = vpunpckhdq_avx(auVar162,auVar147);
                                      auVar148 = vpunpckldq_avx(auVar168,auVar169);
                                      auVar147 = vpunpckhdq_avx(auVar168,auVar169);
                                      auVar169 = vpunpcklqdq_avx(auVar14,auVar148);
                                      auVar168 = vpunpckhqdq_avx(auVar14,auVar148);
                                      auVar14 = vpunpcklqdq_avx(auVar162,auVar147);
                                      auVar162 = vpunpckhqdq_avx(auVar162,auVar147);
                                      *pauVar111 = auVar169;
                                      pauVar111[1] = auVar168;
                                      pauVar111[2] = auVar14;
                                      pauVar111[3] = auVar162;
                                      pauVar111 = pauVar111 + 4;
                                      iVar49 = iVar49 + -1;
                                      iVar48 = iVar48 + 1;
                                    } while (iVar49 != 0);
                                  }
                                }
                                uVar106 = uVar83 + 8;
                                iVar49 = uVar83 + 0xf;
                                uVar83 = uVar106;
                              } while (iVar49 < (int)uVar105);
                            }
                            if ((int)(uVar106 | 3) < (int)uVar105) {
                              auVar158 = vpshufd_avx(ZEXT416(uVar82),0);
                              auVar149 = vpshufd_avx(ZEXT416((uint)(local_3b8.w * iVar51)),0);
                              iVar47 = local_3b8.w * iVar73;
                              uVar52 = uVar95 + 7;
                              if (-1 < (int)uVar95) {
                                uVar52 = uVar95;
                              }
                              iVar50 = iVar84 + 7;
                              if (-1 < iVar84) {
                                iVar50 = iVar84;
                              }
                              uVar83 = uVar106;
                              do {
                                auVar182 = vpshufd_avx(ZEXT416(iVar89 + uVar83),0);
                                auVar182 = vpaddd_avx(auVar182,_DAT_005eff50);
                                auVar167 = vpmuludq_avx(auVar182,auVar129);
                                auVar162 = vpsrlq_avx(auVar167,0x20);
                                auVar167 = vpsrlq_avx(auVar182,0x20);
                                auVar167 = vpmuludq_avx(auVar167,auVar129);
                                auVar167 = vpblendw_avx(auVar162,auVar167,0xcc);
                                auVar162 = vpsubd_avx(auVar182,auVar167);
                                auVar162 = vpsrld_avx(auVar162,auVar122);
                                auVar167 = vpaddd_avx(auVar162,auVar167);
                                auVar162 = vpsrld_avx(auVar167,ZEXT416(uVar65));
                                auVar167 = vpmulld_avx(auVar162,auVar158);
                                auVar182 = vpsubd_avx(auVar182,auVar167);
                                auVar182 = vpmulld_avx(auVar182,local_348);
                                auVar167 = vpmulld_avx(auVar162,auVar149);
                                auVar182 = vpaddd_avx(auVar182,auVar167);
                                if ((uVar97 == 1) && (auVar167._0_4_ == auVar167._12_4_)) {
                                  iVar49 = auVar182._0_4_;
                                  if (local_3b8.elempack == 1) {
                                    iVar48 = 0;
                                    if (1 < (int)uVar95) {
                                      iVar79 = 0;
                                      do {
                                        uVar77 = (long)(iVar84 + iVar79) % (long)iVar71;
                                        iVar48 = iVar84 + iVar79 + 1;
                                        uVar62 = (long)iVar48 % (long)iVar71;
                                        uVar77 = (ulong)(uint)((int)uVar77 >> 0x1f) << 0x20 |
                                                 uVar77 & 0xffffffff;
                                        uVar62 = (ulong)(uint)((int)uVar62 >> 0x1f) << 0x20 |
                                                 uVar62 & 0xffffffff;
                                        auVar146._8_8_ = 0;
                                        auVar146._0_8_ =
                                             *(ulong *)((long)local_3b8.data +
                                                       (long)((int)((long)uVar77 %
                                                                   (long)(int)auVar128._0_4_) *
                                                              iVar78 + ((iVar84 + iVar79) / iVar71)
                                                                       * iVar109 + iVar49 +
                                                             (int)((long)uVar77 /
                                                                  (long)(int)auVar128._0_4_) *
                                                             iVar47));
                                        auVar156._8_8_ = 0;
                                        auVar156._0_8_ =
                                             *(ulong *)((long)local_3b8.data +
                                                       (long)((int)((long)uVar62 %
                                                                   (long)(int)auVar128._0_4_) *
                                                              iVar78 + (iVar48 / iVar71) * iVar109 +
                                                                       iVar49 +
                                                             (int)((long)uVar62 /
                                                                  (long)(int)auVar128._0_4_) *
                                                             iVar47));
                                        auVar182 = vpunpcklbw_avx(auVar146,auVar156);
                                        *(long *)*pauVar111 = auVar182._0_8_;
                                        pauVar111 = (undefined1 (*) [16])(*pauVar111 + 8);
                                        iVar48 = iVar79 + 2;
                                        iVar107 = iVar79 + 3;
                                        iVar79 = iVar48;
                                      } while (iVar107 < (int)uVar95);
                                    }
                                    iVar79 = uVar95 - iVar48;
                                    if (iVar79 != 0 && iVar48 <= (int)uVar95) {
                                      iVar48 = iVar48 + iVar84;
                                      do {
                                        uVar77 = (ulong)(uint)((int)((long)iVar48 % (long)iVar71) >>
                                                              0x1f) << 0x20 |
                                                 (long)iVar48 % (long)iVar71 & 0xffffffffU;
                                        lVar76 = (long)((int)((long)uVar77 %
                                                             (long)(int)auVar128._0_4_) * iVar78 +
                                                        (iVar48 / iVar71) * iVar109 + iVar49 +
                                                       (int)((long)uVar77 /
                                                            (long)(int)auVar128._0_4_) * iVar47);
                                        (*pauVar111)[0] =
                                             *(undefined1 *)((long)local_3b8.data + lVar76);
                                        (*pauVar111)[1] =
                                             *(undefined1 *)((long)local_3b8.data + lVar76 + 1);
                                        (*pauVar111)[2] =
                                             *(undefined1 *)((long)local_3b8.data + lVar76 + 2);
                                        (*pauVar111)[3] =
                                             *(undefined1 *)((long)local_3b8.data + lVar76 + 3);
                                        pauVar111 = (undefined1 (*) [16])(*pauVar111 + 4);
                                        iVar48 = iVar48 + 1;
                                        iVar79 = iVar79 + -1;
                                      } while (iVar79 != 0);
                                    }
                                  }
                                  iVar48 = (int)uVar52 >> 3;
                                  iVar79 = iVar50 >> 3;
                                  if (7 < (int)uVar95 && local_3b8.elempack == 8) {
                                    do {
                                      uVar77 = (ulong)(uint)((int)((long)iVar79 % (long)iVar71) >>
                                                            0x1f) << 0x20 |
                                               (long)iVar79 % (long)iVar71 & 0xffffffffU;
                                      lVar76 = (long)((int)((long)uVar77 % (long)(int)auVar128._0_4_
                                                           ) * iVar78 +
                                                      (iVar79 / iVar71) * iVar109 + iVar49 +
                                                     (int)((long)uVar77 / (long)(int)auVar128._0_4_)
                                                     * iVar47);
                                      auVar182 = *(undefined1 (*) [16])
                                                  ((long)local_3b8.data + lVar76 * 8);
                                      auVar167 = *(undefined1 (*) [16])
                                                  ((long)local_3b8.data + lVar76 * 8 + 0x10);
                                      auVar162 = vpunpcklwd_avx(auVar182,auVar167);
                                      auVar182 = vpunpckhwd_avx(auVar182,auVar167);
                                      auVar167 = vpunpcklwd_avx(auVar162,auVar182);
                                      auVar182 = vpunpckhwd_avx(auVar162,auVar182);
                                      *pauVar111 = auVar167;
                                      pauVar111[1] = auVar182;
                                      pauVar111 = pauVar111 + 2;
                                      iVar48 = iVar48 + -1;
                                      iVar79 = iVar79 + 1;
                                    } while (iVar48 != 0);
                                  }
                                }
                                else {
                                  if (local_3b8.elempack == 1) {
                                    iVar49 = 0;
                                    if (1 < (int)uVar95) {
                                      iVar48 = 0;
                                      do {
                                        uVar77 = (long)(iVar84 + iVar48) % (long)iVar71;
                                        iVar49 = iVar84 + iVar48 + 1;
                                        uVar62 = (long)iVar49 % (long)iVar71;
                                        uVar77 = (ulong)(uint)((int)uVar77 >> 0x1f) << 0x20 |
                                                 uVar77 & 0xffffffff;
                                        uVar62 = (ulong)(uint)((int)uVar62 >> 0x1f) << 0x20 |
                                                 uVar62 & 0xffffffff;
                                        auVar167 = vpshufd_avx(ZEXT416((uint)((int)((long)uVar77 %
                                                                                   (long)(int)
                                                  auVar128._0_4_) * iVar78 +
                                                  ((iVar84 + iVar48) / iVar71) * iVar109 +
                                                  (int)((long)uVar77 / (long)(int)auVar128._0_4_) *
                                                  iVar47)),0);
                                        auVar167 = vpaddd_avx(auVar167,auVar182);
                                        auVar162 = vpshufd_avx(ZEXT416((uint)((int)((long)uVar62 %
                                                                                   (long)(int)
                                                  auVar128._0_4_) * iVar78 +
                                                  (iVar49 / iVar71) * iVar109 +
                                                  (int)((long)uVar62 / (long)(int)auVar128._0_4_) *
                                                  iVar47)),0);
                                        auVar162 = vpaddd_avx(auVar162,auVar182);
                                        (*pauVar111)[0] =
                                             *(undefined1 *)
                                              ((long)local_3b8.data + (long)auVar167._0_4_);
                                        (*pauVar111)[1] =
                                             *(undefined1 *)
                                              ((long)local_3b8.data + (long)auVar162._0_4_);
                                        (*pauVar111)[2] =
                                             *(undefined1 *)
                                              ((long)local_3b8.data + (long)auVar167._4_4_);
                                        (*pauVar111)[3] =
                                             *(undefined1 *)
                                              ((long)local_3b8.data + (long)auVar162._4_4_);
                                        (*pauVar111)[4] =
                                             *(undefined1 *)
                                              ((long)local_3b8.data + (long)auVar167._8_4_);
                                        (*pauVar111)[5] =
                                             *(undefined1 *)
                                              ((long)local_3b8.data + (long)auVar162._8_4_);
                                        (*pauVar111)[6] =
                                             *(undefined1 *)
                                              ((long)local_3b8.data + (long)auVar167._12_4_);
                                        (*pauVar111)[7] =
                                             *(undefined1 *)
                                              ((long)local_3b8.data + (long)auVar162._12_4_);
                                        pauVar111 = (undefined1 (*) [16])(*pauVar111 + 8);
                                        iVar49 = iVar48 + 2;
                                        iVar79 = iVar48 + 3;
                                        iVar48 = iVar49;
                                      } while (iVar79 < (int)uVar95);
                                    }
                                    iVar48 = uVar95 - iVar49;
                                    if (iVar48 != 0 && iVar49 <= (int)uVar95) {
                                      iVar49 = iVar49 + iVar84;
                                      do {
                                        uVar77 = (ulong)(uint)((int)((long)iVar49 % (long)iVar71) >>
                                                              0x1f) << 0x20 |
                                                 (long)iVar49 % (long)iVar71 & 0xffffffffU;
                                        auVar167 = vpshufd_avx(ZEXT416((uint)((int)((long)uVar77 %
                                                                                   (long)(int)
                                                  auVar128._0_4_) * iVar78 +
                                                  (iVar49 / iVar71) * iVar109 +
                                                  (int)((long)uVar77 / (long)(int)auVar128._0_4_) *
                                                  iVar47)),0);
                                        auVar167 = vpaddd_avx(auVar167,auVar182);
                                        (*pauVar111)[0] =
                                             *(undefined1 *)
                                              ((long)local_3b8.data + (long)auVar167._0_4_);
                                        (*pauVar111)[1] =
                                             *(undefined1 *)
                                              ((long)local_3b8.data + (long)auVar167._4_4_);
                                        (*pauVar111)[2] =
                                             *(undefined1 *)
                                              ((long)local_3b8.data + (long)auVar167._8_4_);
                                        (*pauVar111)[3] =
                                             *(undefined1 *)
                                              ((long)local_3b8.data + (long)auVar167._12_4_);
                                        pauVar111 = (undefined1 (*) [16])(*pauVar111 + 4);
                                        iVar49 = iVar49 + 1;
                                        iVar48 = iVar48 + -1;
                                      } while (iVar48 != 0);
                                    }
                                  }
                                  iVar49 = (int)uVar52 >> 3;
                                  iVar48 = iVar50 >> 3;
                                  if (7 < (int)uVar95 && local_3b8.elempack == 8) {
                                    do {
                                      uVar77 = (ulong)(uint)((int)((long)iVar48 % (long)iVar71) >>
                                                            0x1f) << 0x20 |
                                               (long)iVar48 % (long)iVar71 & 0xffffffffU;
                                      auVar167 = vpshufd_avx(ZEXT416((uint)((int)((long)uVar77 %
                                                                                 (long)(int)auVar128
                                                  ._0_4_) * iVar78 + (iVar48 / iVar71) * iVar109 +
                                                  (int)((long)uVar77 / (long)(int)auVar128._0_4_) *
                                                  iVar47)),0);
                                      auVar167 = vpaddd_avx(auVar167,auVar182);
                                      auVar162 = vpslld_avx(auVar167,3);
                                      auVar157._8_8_ = 0;
                                      auVar157._0_8_ =
                                           *(ulong *)((long)local_3b8.data + (long)auVar162._4_4_);
                                      auVar164._8_8_ = 0;
                                      auVar164._0_8_ =
                                           *(ulong *)((long)local_3b8.data + (long)auVar162._0_4_);
                                      auVar167 = vpunpcklwd_avx(auVar164,auVar157);
                                      auVar170._8_8_ = 0;
                                      auVar170._0_8_ =
                                           *(ulong *)((long)local_3b8.data + (long)auVar162._8_4_);
                                      auVar176._8_8_ = 0;
                                      auVar176._0_8_ =
                                           *(ulong *)((long)local_3b8.data + (long)auVar162._12_4_);
                                      auVar162 = vpunpcklwd_avx(auVar170,auVar176);
                                      auVar147 = vpunpckldq_avx(auVar167,auVar162);
                                      auVar167 = vpunpckhdq_avx(auVar167,auVar162);
                                      *pauVar111 = auVar147;
                                      pauVar111[1] = auVar167;
                                      pauVar111 = pauVar111 + 2;
                                      iVar49 = iVar49 + -1;
                                      iVar48 = iVar48 + 1;
                                    } while (iVar49 != 0);
                                  }
                                }
                                uVar106 = uVar83 + 4;
                                iVar49 = uVar83 + 7;
                                uVar83 = uVar106;
                              } while (iVar49 < (int)uVar105);
                            }
                            if ((int)(uVar106 | 1) < (int)uVar105) {
                              iVar78 = local_3b8.w * iVar73;
                              uVar65 = uVar95 + 7;
                              if (-1 < (int)uVar95) {
                                uVar65 = uVar95;
                              }
                              iVar50 = (int)uVar65 >> 3;
                              iVar47 = iVar84 + 7;
                              if (-1 < iVar84) {
                                iVar47 = iVar84;
                              }
                              local_3e0 = CONCAT71(local_3e0._1_7_,
                                                   (int)uVar95 < 8 || local_3b8.elempack != 8);
                              uVar65 = uVar106;
                              do {
                                iVar49 = uVar65 + iVar89 + 1;
                                iVar107 = ((int)(uVar65 + iVar89) / (int)uVar82) *
                                          local_3b8.w * iVar51;
                                iVar48 = (iVar49 / (int)uVar82) * local_3b8.w * iVar51;
                                iVar79 = ((int)(uVar65 + iVar89) % (int)uVar82) * uVar97 + iVar107;
                                iVar64 = (int)local_370;
                                if ((uVar97 == 1) && (iVar107 == iVar48)) {
                                  if (local_3b8.elempack == 1) {
                                    iVar49 = 0;
                                    if (1 < (int)uVar95) {
                                      iVar71 = 0;
                                      do {
                                        uVar114 = (long)(iVar84 + iVar71) % (long)(int)local_3f8;
                                        iVar49 = iVar84 + iVar71 + 1;
                                        uVar77 = (long)iVar49 % (long)(int)local_3f8;
                                        uVar114 = (ulong)(uint)((int)uVar114 >> 0x1f) << 0x20 |
                                                  uVar114 & 0xffffffff;
                                        uVar77 = (ulong)(uint)((int)uVar77 >> 0x1f) << 0x20 |
                                                 uVar77 & 0xffffffff;
                                        lVar55 = (long)((int)((long)uVar114 %
                                                             (long)(int)auVar128._0_4_) * iVar64 +
                                                        ((iVar84 + iVar71) / (int)local_3f8) *
                                                        iVar109 + iVar79 +
                                                       (int)((long)uVar114 /
                                                            (long)(int)auVar128._0_4_) * iVar78);
                                        lVar76 = (long)((int)((long)uVar77 %
                                                             (long)(int)auVar128._0_4_) * iVar64 +
                                                        (iVar49 / (int)local_3f8) * iVar109 + iVar79
                                                       + (int)((long)uVar77 /
                                                              (long)(int)auVar128._0_4_) * iVar78);
                                        (*pauVar111)[0] =
                                             *(undefined1 *)((long)local_3b8.data + lVar55);
                                        (*pauVar111)[1] =
                                             *(undefined1 *)((long)local_3b8.data + lVar76);
                                        (*pauVar111)[2] =
                                             *(undefined1 *)((long)local_3b8.data + lVar55 + 1);
                                        (*pauVar111)[3] =
                                             *(undefined1 *)((long)local_3b8.data + lVar76 + 1);
                                        pauVar111 = (undefined1 (*) [16])(*pauVar111 + 4);
                                        iVar49 = iVar71 + 2;
                                        iVar48 = iVar71 + 3;
                                        iVar71 = iVar49;
                                      } while (iVar48 < (int)uVar95);
                                    }
                                    iVar48 = uVar95 - iVar49;
                                    uVar114 = local_370;
                                    iVar71 = (int)local_3f8;
                                    if (iVar48 != 0 && iVar49 <= (int)uVar95) {
                                      iVar49 = iVar49 + iVar84;
                                      do {
                                        uVar114 = (ulong)(uint)((int)((long)iVar49 %
                                                                     (long)(int)local_3f8) >> 0x1f)
                                                  << 0x20 | (long)iVar49 % (long)(int)local_3f8 &
                                                            0xffffffffU;
                                        lVar76 = (long)((int)((long)uVar114 %
                                                             (long)(int)auVar128._0_4_) * iVar64 +
                                                        (iVar49 / (int)local_3f8) * iVar109 + iVar79
                                                       + (int)((long)uVar114 /
                                                              (long)(int)auVar128._0_4_) * iVar78);
                                        (*pauVar111)[0] =
                                             *(undefined1 *)((long)local_3b8.data + lVar76);
                                        (*pauVar111)[1] =
                                             *(undefined1 *)((long)local_3b8.data + lVar76 + 1);
                                        pauVar111 = (undefined1 (*) [16])(*pauVar111 + 2);
                                        iVar49 = iVar49 + 1;
                                        iVar48 = iVar48 + -1;
                                        uVar114 = local_370;
                                      } while (iVar48 != 0);
                                    }
                                  }
                                  iVar49 = iVar50;
                                  iVar48 = iVar47 >> 3;
                                  if ((int)uVar95 >= 8 && local_3b8.elempack == 8) {
                                    do {
                                      uVar77 = (ulong)(uint)((int)((long)iVar48 % (long)iVar71) >>
                                                            0x1f) << 0x20 |
                                               (long)iVar48 % (long)iVar71 & 0xffffffffU;
                                      auVar122 = vpshufb_avx(*(undefined1 (*) [16])
                                                              ((long)local_3b8.data +
                                                              (long)((int)((long)uVar77 %
                                                                          (long)(int)auVar128._0_4_)
                                                                     * (int)uVar114 +
                                                                     (iVar48 / iVar71) * iVar109 +
                                                                     iVar79 + (int)((long)uVar77 /
                                                                                   (long)(int)
                                                  auVar128._0_4_) * iVar78) * 8),_DAT_005f0470);
                                      *pauVar111 = auVar122;
                                      pauVar111 = pauVar111 + 1;
                                      iVar49 = iVar49 + -1;
                                      iVar48 = iVar48 + 1;
                                    } while (iVar49 != 0);
                                  }
                                }
                                else {
                                  iVar48 = (iVar49 % (int)uVar82) * uVar97 + iVar48;
                                  uVar106 = 0;
                                  if (local_3b8.elempack == 1) {
                                    uVar106 = 0;
                                    if (1 < (int)uVar95) {
                                      uVar52 = 0;
                                      do {
                                        uVar114 = (long)(int)(iVar84 + uVar52) %
                                                  (long)(int)local_3f8;
                                        iVar71 = iVar84 + uVar52 + 1;
                                        uVar77 = (long)iVar71 % (long)(int)local_3f8;
                                        uVar114 = (ulong)(uint)((int)uVar114 >> 0x1f) << 0x20 |
                                                  uVar114 & 0xffffffff;
                                        iVar49 = (int)((long)uVar114 % (long)(int)auVar128._0_4_) *
                                                 iVar64 + ((int)(iVar84 + uVar52) / (int)local_3f8)
                                                          * iVar109 +
                                                 (int)((long)uVar114 / (long)(int)auVar128._0_4_) *
                                                 iVar78;
                                        uVar114 = (ulong)(uint)((int)uVar77 >> 0x1f) << 0x20 |
                                                  uVar77 & 0xffffffff;
                                        iVar71 = (int)((long)uVar114 % (long)(int)auVar128._0_4_) *
                                                 iVar64 + (iVar71 / (int)local_3f8) * iVar109 +
                                                 (int)((long)uVar114 / (long)(int)auVar128._0_4_) *
                                                 iVar78;
                                        (*pauVar111)[0] =
                                             *(undefined1 *)
                                              ((long)local_3b8.data + (long)(iVar49 + iVar79));
                                        (*pauVar111)[1] =
                                             *(undefined1 *)
                                              ((long)local_3b8.data + (long)(iVar71 + iVar79));
                                        (*pauVar111)[2] =
                                             *(undefined1 *)
                                              ((long)local_3b8.data + (long)(iVar49 + iVar48));
                                        (*pauVar111)[3] =
                                             *(undefined1 *)
                                              ((long)local_3b8.data + (long)(iVar71 + iVar48));
                                        pauVar111 = (undefined1 (*) [16])(*pauVar111 + 4);
                                        uVar106 = uVar52 + 2;
                                        iVar71 = uVar52 + 3;
                                        uVar52 = uVar106;
                                      } while (iVar71 < (int)uVar95);
                                    }
                                    iVar49 = uVar95 - uVar106;
                                    uVar114 = local_370;
                                    iVar71 = (int)local_3f8;
                                    if (iVar49 != 0 && (int)uVar106 <= (int)uVar95) {
                                      iVar107 = uVar106 + iVar84;
                                      do {
                                        uVar114 = (ulong)(uint)((int)((long)iVar107 %
                                                                     (long)(int)local_3f8) >> 0x1f)
                                                  << 0x20 | (long)iVar107 % (long)(int)local_3f8 &
                                                            0xffffffffU;
                                        iVar71 = (int)((long)uVar114 % (long)(int)auVar128._0_4_) *
                                                 iVar64 + (iVar107 / (int)local_3f8) * iVar109 +
                                                 (int)((long)uVar114 / (long)(int)auVar128._0_4_) *
                                                 iVar78;
                                        (*pauVar111)[0] =
                                             *(undefined1 *)
                                              ((long)local_3b8.data + (long)(iVar71 + iVar79));
                                        (*pauVar111)[1] =
                                             *(undefined1 *)
                                              ((long)local_3b8.data + (long)(iVar71 + iVar48));
                                        pauVar111 = (undefined1 (*) [16])(*pauVar111 + 2);
                                        iVar107 = iVar107 + 1;
                                        iVar49 = iVar49 + -1;
                                        uVar114 = local_370;
                                        iVar71 = (int)local_3f8;
                                        uVar106 = uVar95;
                                      } while (iVar49 != 0);
                                    }
                                  }
                                  if ((local_3b8.elempack == 8) &&
                                     (iVar49 = iVar50 - uVar106,
                                     iVar49 != 0 && (int)uVar106 <= iVar50)) {
                                    iVar107 = uVar106 + (iVar47 >> 3);
                                    do {
                                      uVar77 = (ulong)(uint)((int)((long)iVar107 % (long)iVar71) >>
                                                            0x1f) << 0x20 |
                                               (long)iVar107 % (long)iVar71 & 0xffffffffU;
                                      iVar64 = (int)((long)uVar77 % (long)(int)auVar128._0_4_) *
                                               (int)uVar114 + (iVar107 / iVar71) * iVar109 +
                                               (int)((long)uVar77 / (long)(int)auVar128._0_4_) *
                                               iVar78;
                                      auVar120._8_8_ = 0;
                                      auVar120._0_8_ =
                                           *(ulong *)((long)local_3b8.data +
                                                     (long)(iVar64 + iVar79) * 8);
                                      auVar126._8_8_ = 0;
                                      auVar126._0_8_ =
                                           *(ulong *)((long)local_3b8.data +
                                                     (long)(iVar64 + iVar48) * 8);
                                      auVar122 = vpunpcklwd_avx(auVar120,auVar126);
                                      *pauVar111 = auVar122;
                                      pauVar111 = pauVar111 + 1;
                                      iVar107 = iVar107 + 1;
                                      iVar49 = iVar49 + -1;
                                    } while (iVar49 != 0);
                                  }
                                }
                                uVar106 = uVar65 + 2;
                                iVar49 = uVar65 + 3;
                                uVar65 = uVar106;
                              } while (iVar49 < (int)uVar105);
                            }
                            if ((int)uVar106 < (int)uVar105) {
                              iVar78 = local_3b8.w * iVar73;
                              uVar65 = uVar95 + 7;
                              if (-1 < (int)uVar95) {
                                uVar65 = uVar95;
                              }
                              iVar47 = iVar84 + 7;
                              if (-1 < iVar84) {
                                iVar47 = iVar84;
                              }
                              do {
                                iVar50 = ((int)(iVar89 + uVar106) / (int)uVar82) *
                                         local_3b8.w * iVar51 +
                                         ((int)(iVar89 + uVar106) % (int)uVar82) * uVar97;
                                iVar49 = (int)uVar114;
                                if (local_3b8.elempack == 1) {
                                  lVar76 = 0;
                                  if (1 < (int)uVar95) {
                                    lVar76 = 0;
                                    do {
                                      iVar48 = (int)lVar76;
                                      uVar77 = (long)(iVar84 + iVar48) % (long)iVar71;
                                      iVar79 = iVar84 + iVar48 + 1;
                                      uVar62 = (long)iVar79 % (long)iVar71;
                                      uVar77 = (ulong)(uint)((int)uVar77 >> 0x1f) << 0x20 |
                                               uVar77 & 0xffffffff;
                                      uVar62 = (ulong)(uint)((int)uVar62 >> 0x1f) << 0x20 |
                                               uVar62 & 0xffffffff;
                                      (*pauVar111)[lVar76] =
                                           *(undefined1 *)
                                            ((long)local_3b8.data +
                                            (long)((int)((long)uVar77 % (long)(int)auVar128._0_4_) *
                                                   iVar49 + ((iVar84 + iVar48) / iVar71) * iVar109 +
                                                            iVar50 +
                                                  (int)((long)uVar77 / (long)(int)auVar128._0_4_) *
                                                  iVar78));
                                      (*pauVar111)[lVar76 + 1] =
                                           *(undefined1 *)
                                            ((long)local_3b8.data +
                                            (long)((int)((long)uVar62 % (long)(int)auVar128._0_4_) *
                                                   iVar49 + (iVar79 / iVar71) * iVar109 + iVar50 +
                                                  (int)((long)uVar62 / (long)(int)auVar128._0_4_) *
                                                  iVar78));
                                      lVar76 = lVar76 + 2;
                                    } while (iVar48 + 3 < (int)uVar95);
                                    pauVar111 = (undefined1 (*) [16])(*pauVar111 + lVar76);
                                  }
                                  iVar48 = (int)lVar76;
                                  iVar79 = uVar95 - iVar48;
                                  if (iVar79 != 0 && iVar48 <= (int)uVar95) {
                                    iVar48 = iVar48 + iVar84;
                                    do {
                                      uVar77 = (ulong)(uint)((int)((long)iVar48 % (long)iVar71) >>
                                                            0x1f) << 0x20 |
                                               (long)iVar48 % (long)iVar71 & 0xffffffffU;
                                      (*pauVar111)[0] =
                                           *(undefined1 *)
                                            ((long)local_3b8.data +
                                            (long)((int)((long)uVar77 % (long)(int)auVar128._0_4_) *
                                                   iVar49 + (iVar48 / iVar71) * iVar109 + iVar50 +
                                                  (int)((long)uVar77 / (long)(int)auVar128._0_4_) *
                                                  iVar78));
                                      pauVar111 = (undefined1 (*) [16])(*pauVar111 + 1);
                                      iVar48 = iVar48 + 1;
                                      iVar79 = iVar79 + -1;
                                    } while (iVar79 != 0);
                                  }
                                }
                                iVar48 = (int)uVar65 >> 3;
                                iVar79 = iVar47 >> 3;
                                if (7 < (int)uVar95 && local_3b8.elempack == 8) {
                                  do {
                                    uVar77 = (ulong)(uint)((int)((long)iVar79 % (long)iVar71) >>
                                                          0x1f) << 0x20 |
                                             (long)iVar79 % (long)iVar71 & 0xffffffffU;
                                    *(undefined8 *)*pauVar111 =
                                         *(undefined8 *)
                                          ((long)local_3b8.data +
                                          (long)((int)((long)uVar77 % (long)(int)auVar128._0_4_) *
                                                 iVar49 + (iVar79 / iVar71) * iVar109 + iVar50 +
                                                (int)((long)uVar77 / (long)(int)auVar128._0_4_) *
                                                iVar78) * 8);
                                    pauVar111 = (undefined1 (*) [16])(*pauVar111 + 8);
                                    iVar48 = iVar48 + -1;
                                    iVar79 = iVar79 + 1;
                                  } while (iVar48 != 0);
                                }
                                uVar106 = uVar106 + 1;
                              } while (uVar106 != uVar105);
                            }
                          }
                          else {
                            uVar77 = 0;
                            lVar55 = (long)iVar84;
                            lVar76 = (long)iVar89;
                            pauVar111 = (undefined1 (*) [16])local_248.data;
                            if (7 < (int)uVar105) {
                              iVar78 = iVar84 + 7;
                              if (-1 < iVar84) {
                                iVar78 = iVar84;
                              }
                              uVar106 = uVar95 + 7;
                              if (-1 < (int)uVar95) {
                                uVar106 = uVar95;
                              }
                              lVar61 = lVar76 + iVar109;
                              uVar62 = 0;
                              lVar56 = lVar76;
                              do {
                                if (7 < (int)uVar95 && local_3b8.elempack == 8) {
                                  pauVar58 = (undefined1 (*) [16])
                                             ((long)local_3b8.data +
                                             (lVar76 + uVar62) * 8 +
                                             local_3b8.cstep * (long)(iVar78 >> 3) *
                                             local_3b8.elemsize);
                                  iVar89 = (int)uVar106 >> 3;
                                  do {
                                    auVar158 = vpunpcklwd_avx(*pauVar58,pauVar58[1]);
                                    auVar122 = vpunpckhwd_avx(*pauVar58,pauVar58[1]);
                                    auVar149 = vpunpcklwd_avx(pauVar58[2],pauVar58[3]);
                                    auVar129 = vpunpckhwd_avx(pauVar58[2],pauVar58[3]);
                                    auVar182 = vpunpcklwd_avx(auVar158,auVar122);
                                    auVar122 = vpunpckhwd_avx(auVar158,auVar122);
                                    auVar158 = vpunpcklwd_avx(auVar149,auVar129);
                                    auVar129 = vpunpckhwd_avx(auVar149,auVar129);
                                    auVar149 = vpunpcklqdq_avx(auVar182,auVar158);
                                    auVar158 = vpunpckhqdq_avx(auVar182,auVar158);
                                    auVar182 = vpunpcklqdq_avx(auVar122,auVar129);
                                    auVar122 = vpunpckhqdq_avx(auVar122,auVar129);
                                    *pauVar111 = auVar149;
                                    pauVar111[1] = auVar158;
                                    pauVar111[2] = auVar182;
                                    pauVar111[3] = auVar122;
                                    pauVar111 = pauVar111 + 4;
                                    pauVar58 = (undefined1 (*) [16])(*pauVar58 + iVar109 * 8);
                                    iVar89 = iVar89 + -1;
                                  } while (iVar89 != 0);
                                }
                                if (local_3b8.elempack == 1) {
                                  lVar68 = local_3b8.cstep * lVar55 * local_3b8.elemsize;
                                  if ((int)uVar95 < 2) {
                                    lVar75 = (long)local_3b8.data + lVar76 + uVar62;
                                    uVar82 = 0;
                                  }
                                  else {
                                    lVar75 = (long)local_3b8.data + lVar56;
                                    lVar85 = (long)local_3b8.data + lVar61;
                                    iVar89 = 1;
                                    do {
                                      auVar118._8_8_ = 0;
                                      auVar118._0_8_ = *(ulong *)(lVar75 + lVar68);
                                      auVar124._8_8_ = 0;
                                      auVar124._0_8_ = *(ulong *)(lVar85 + lVar68);
                                      auVar122 = vpunpcklbw_avx(auVar118,auVar124);
                                      *pauVar111 = auVar122;
                                      pauVar111 = pauVar111 + 1;
                                      lVar75 = lVar75 + iVar109 * 2;
                                      lVar85 = lVar85 + iVar109 * 2;
                                      iVar89 = iVar89 + 2;
                                    } while (iVar89 < (int)uVar95);
                                    uVar82 = uVar95 & 0xfffffffe;
                                  }
                                  puVar91 = (undefined8 *)(lVar75 + lVar68);
                                  iVar89 = uVar95 - uVar82;
                                  if (iVar89 != 0 && (int)uVar82 <= (int)uVar95) {
                                    do {
                                      *(undefined8 *)*pauVar111 = *puVar91;
                                      pauVar111 = (undefined1 (*) [16])(*pauVar111 + 8);
                                      puVar91 = (undefined8 *)((long)puVar91 + (long)iVar109);
                                      iVar89 = iVar89 + -1;
                                    } while (iVar89 != 0);
                                  }
                                }
                                uVar77 = uVar62 + 8;
                                uVar80 = uVar62 + 0xf;
                                lVar56 = lVar56 + 8;
                                lVar61 = lVar61 + 8;
                                uVar62 = uVar77;
                              } while (uVar80 < uVar105);
                            }
                            local_3d8._0_8_ = SEXT48((int)uVar105);
                            if ((int)((uint)uVar77 | 3) < (int)uVar105) {
                              iVar78 = iVar84 + 7;
                              if (-1 < iVar84) {
                                iVar78 = iVar84;
                              }
                              local_250 = (long)(iVar78 >> 3);
                              uVar106 = uVar95 + 7;
                              if (-1 < (int)uVar95) {
                                uVar106 = uVar95;
                              }
                              local_330 = (void *)CONCAT44(local_330._4_4_,(int)uVar106 >> 3);
                              lVar61 = local_3b8.cstep << 0x20;
                              local_338 = lVar61 + 0x100000000 >> 0x20;
                              lVar56 = (long)(iVar109 * 2);
                              local_3bc = uVar95 & 0xfffffffe;
                              local_3e8 = (void *)(lVar76 + (uVar77 & 0xffffffff));
                              local_480 = (long)local_3e8 * 8 + 0x10;
                              local_458 = (undefined1 (*) [16])
                                          ((lVar61 + 0x300000000 >> 0x20) + (long)local_3e8);
                              local_2e0 = (long)local_3e8 + (long)iVar109;
                              local_3e0 = (lVar61 + 0x200000000 >> 0x20) + (long)local_3e8;
                              lVar61 = local_338 + (long)local_3e8;
                              local_364 = CONCAT31(local_364._1_3_,
                                                   (int)uVar95 < 8 || local_3b8.elempack != 8);
                              uVar62 = uVar77 & 0xffffffff;
                              do {
                                if ((int)uVar95 >= 8 && local_3b8.elempack == 8) {
                                  lVar68 = local_3b8.cstep * local_250 * local_3b8.elemsize;
                                  lVar75 = (long)local_3b8.data + local_480;
                                  iVar78 = (int)uVar106 >> 3;
                                  do {
                                    auVar122 = *(undefined1 (*) [16])(lVar75 + -0x10 + lVar68);
                                    auVar129 = *(undefined1 (*) [16])(lVar75 + lVar68);
                                    auVar158 = vpunpcklwd_avx(auVar122,auVar129);
                                    auVar122 = vpunpckhwd_avx(auVar122,auVar129);
                                    auVar129 = vpunpcklwd_avx(auVar158,auVar122);
                                    auVar122 = vpunpckhwd_avx(auVar158,auVar122);
                                    *pauVar111 = auVar129;
                                    pauVar111[1] = auVar122;
                                    pauVar111 = pauVar111 + 2;
                                    lVar75 = lVar75 + iVar109 * 8;
                                    iVar78 = iVar78 + -1;
                                  } while (iVar78 != 0);
                                }
                                if (local_3b8.elempack == 1) {
                                  lVar68 = local_3b8.cstep * lVar55 * local_3b8.elemsize;
                                  if ((int)uVar95 < 2) {
                                    lVar75 = (long)local_3b8.data + lVar76 + uVar62;
                                    uVar82 = 0;
                                  }
                                  else {
                                    lVar75 = (long)local_3b8.data + (long)local_3e8;
                                    lVar85 = (long)local_3b8.data + (long)local_458;
                                    lVar93 = (long)local_3b8.data + local_2e0;
                                    lVar110 = (long)local_3b8.data + local_3e0;
                                    lVar112 = (long)local_3b8.data + lVar61;
                                    iVar78 = 1;
                                    do {
                                      (*pauVar111)[0] = *(undefined1 *)(lVar75 + lVar68);
                                      (*pauVar111)[1] = *(undefined1 *)(lVar93 + lVar68);
                                      (*pauVar111)[2] = *(undefined1 *)(lVar75 + 1 + lVar68);
                                      (*pauVar111)[3] = *(undefined1 *)(lVar112 + lVar68);
                                      (*pauVar111)[4] = *(undefined1 *)(lVar75 + 2 + lVar68);
                                      (*pauVar111)[5] = *(undefined1 *)(lVar110 + lVar68);
                                      (*pauVar111)[6] = *(undefined1 *)(lVar75 + 3 + lVar68);
                                      (*pauVar111)[7] = *(undefined1 *)(lVar85 + lVar68);
                                      pauVar111 = (undefined1 (*) [16])(*pauVar111 + 8);
                                      iVar78 = iVar78 + 2;
                                      lVar75 = lVar75 + lVar56;
                                      lVar85 = lVar85 + lVar56;
                                      lVar93 = lVar93 + lVar56;
                                      lVar110 = lVar110 + lVar56;
                                      lVar112 = lVar112 + lVar56;
                                      uVar82 = local_3bc;
                                    } while (iVar78 < (int)uVar95);
                                  }
                                  iVar78 = uVar95 - uVar82;
                                  if (iVar78 != 0 && (int)uVar82 <= (int)uVar95) {
                                    puVar92 = (undefined1 *)(lVar75 + lVar68 + 3);
                                    do {
                                      (*pauVar111)[0] = puVar92[-3];
                                      (*pauVar111)[1] = puVar92[-2];
                                      (*pauVar111)[2] = puVar92[-1];
                                      (*pauVar111)[3] = *puVar92;
                                      pauVar111 = (undefined1 (*) [16])(*pauVar111 + 4);
                                      puVar92 = puVar92 + iVar109;
                                      iVar78 = iVar78 + -1;
                                    } while (iVar78 != 0);
                                  }
                                }
                                uVar77 = uVar62 + 4;
                                lVar68 = uVar62 + 7;
                                local_480 = local_480 + 0x20;
                                local_3e8 = (void *)((long)local_3e8 + 4);
                                local_458 = (undefined1 (*) [16])((long)local_458 + 4);
                                local_2e0 = local_2e0 + 4;
                                local_3e0 = local_3e0 + 4;
                                lVar61 = lVar61 + 4;
                                uVar62 = uVar77;
                              } while (lVar68 < (long)local_3d8._0_8_);
                            }
                            if ((int)((uint)uVar77 | 1) < (int)uVar105) {
                              iVar78 = iVar84 + 7;
                              if (-1 < iVar84) {
                                iVar78 = iVar84;
                              }
                              local_3e0 = (ulong)(iVar78 >> 3);
                              uVar106 = uVar95 + 7;
                              if (-1 < (int)uVar95) {
                                uVar106 = uVar95;
                              }
                              local_3e8 = (void *)CONCAT44(local_3e8._4_4_,(int)uVar106 >> 3);
                              lVar75 = (long)(iVar109 * 2);
                              local_2e0 = CONCAT44(local_2e0._4_4_,uVar95) & 0xfffffffffffffffe;
                              lVar61 = lVar76 + (uVar77 & 0xffffffff);
                              lVar56 = lVar61 * 8 + 8;
                              lVar68 = ((long)((local_3b8.cstep << 0x20) + 0x100000000) >> 0x20) +
                                       lVar61;
                              local_438 = lVar61 + iVar109;
                              uVar62 = uVar77 & 0xffffffff;
                              do {
                                if (7 < (int)uVar95 && local_3b8.elempack == 8) {
                                  lVar85 = local_3b8.cstep * local_3e0 * local_3b8.elemsize;
                                  lVar93 = (long)local_3b8.data + lVar56;
                                  iVar78 = (int)uVar106 >> 3;
                                  do {
                                    auVar119._8_8_ = 0;
                                    auVar119._0_8_ = *(ulong *)(lVar93 + -8 + lVar85);
                                    auVar125._8_8_ = 0;
                                    auVar125._0_8_ = *(ulong *)(lVar93 + lVar85);
                                    auVar122 = vpunpcklwd_avx(auVar119,auVar125);
                                    *pauVar111 = auVar122;
                                    pauVar111 = pauVar111 + 1;
                                    lVar93 = lVar93 + iVar109 * 8;
                                    iVar78 = iVar78 + -1;
                                  } while (iVar78 != 0);
                                }
                                if (local_3b8.elempack == 1) {
                                  lVar85 = local_3b8.cstep * lVar55 * local_3b8.elemsize;
                                  if ((int)uVar95 < 2) {
                                    lVar93 = (long)local_3b8.data + lVar76 + uVar62;
                                    iVar78 = 0;
                                  }
                                  else {
                                    lVar93 = (long)local_3b8.data + lVar61;
                                    lVar110 = (long)local_3b8.data + lVar68;
                                    lVar112 = (long)local_3b8.data + local_438;
                                    iVar78 = 1;
                                    do {
                                      (*pauVar111)[0] = *(undefined1 *)(lVar93 + lVar85);
                                      (*pauVar111)[1] = *(undefined1 *)(lVar112 + lVar85);
                                      (*pauVar111)[2] = *(undefined1 *)(lVar93 + 1 + lVar85);
                                      (*pauVar111)[3] = *(undefined1 *)(lVar110 + lVar85);
                                      pauVar111 = (undefined1 (*) [16])(*pauVar111 + 4);
                                      iVar78 = iVar78 + 2;
                                      lVar93 = lVar93 + lVar75;
                                      lVar110 = lVar110 + lVar75;
                                      lVar112 = lVar112 + lVar75;
                                    } while (iVar78 < (int)uVar95);
                                    iVar78 = (int)local_2e0;
                                  }
                                  iVar89 = uVar95 - iVar78;
                                  if (iVar89 != 0 && iVar78 <= (int)uVar95) {
                                    puVar92 = (undefined1 *)(lVar93 + lVar85 + 1);
                                    do {
                                      (*pauVar111)[0] = puVar92[-1];
                                      (*pauVar111)[1] = *puVar92;
                                      pauVar111 = (undefined1 (*) [16])(*pauVar111 + 2);
                                      puVar92 = puVar92 + iVar109;
                                      iVar89 = iVar89 + -1;
                                    } while (iVar89 != 0);
                                  }
                                }
                                uVar77 = uVar62 + 2;
                                lVar85 = uVar62 + 3;
                                lVar56 = lVar56 + 0x10;
                                lVar61 = lVar61 + 2;
                                lVar68 = lVar68 + 2;
                                local_438 = local_438 + 2;
                                uVar62 = uVar77;
                              } while (lVar85 < (long)local_3d8._0_8_);
                            }
                            if ((int)uVar77 < (int)uVar105) {
                              iVar78 = iVar84 + 7;
                              if (-1 < iVar84) {
                                iVar78 = iVar84;
                              }
                              uVar105 = uVar95 + 7;
                              if (-1 < (int)uVar95) {
                                uVar105 = uVar95;
                              }
                              lVar61 = (long)(int)uVar77;
                              do {
                                if (7 < (int)uVar95 && local_3b8.elempack == 8) {
                                  puVar91 = (undefined8 *)
                                            ((long)local_3b8.data +
                                            (lVar76 + lVar61) * 8 +
                                            local_3b8.cstep * (long)(iVar78 >> 3) *
                                            local_3b8.elemsize);
                                  iVar84 = (int)uVar105 >> 3;
                                  do {
                                    *(undefined8 *)*pauVar111 = *puVar91;
                                    pauVar111 = (undefined1 (*) [16])(*pauVar111 + 8);
                                    puVar91 = (undefined8 *)((long)puVar91 + (long)(iVar109 * 8));
                                    iVar84 = iVar84 + -1;
                                  } while (iVar84 != 0);
                                }
                                if (local_3b8.elempack == 1 && 0 < (int)uVar95) {
                                  puVar92 = (undefined1 *)
                                            ((long)local_3b8.data +
                                            lVar76 + lVar61 +
                                            local_3b8.cstep * lVar55 * local_3b8.elemsize);
                                  uVar106 = uVar95;
                                  do {
                                    (*pauVar111)[0] = *puVar92;
                                    pauVar111 = (undefined1 (*) [16])(*pauVar111 + 1);
                                    puVar92 = puVar92 + iVar109;
                                    uVar106 = uVar106 - 1;
                                  } while (uVar106 != 0);
                                }
                                lVar61 = lVar61 + 1;
                              } while (lVar61 != local_3d8._0_8_);
                            }
                          }
                        }
                        else {
                          convolution_im2col_input_tile_int8_avx2
                                    (&local_3b8,&local_248,iVar89,uVar105,iVar84,uVar95,
                                     auVar128._0_4_,auVar128._4_4_,iVar78,iVar73,uVar97,iVar51);
                        }
                      }
                      else {
                        convolution_im2col_input_tile_int8_avxvnni
                                  (&local_3b8,&local_248,local_3d8._0_4_,uVar105,iVar84,uVar95,
                                   auVar128._0_4_,auVar128._4_4_,iVar78,iVar73,uVar97,iVar51);
                      }
                    }
                    else {
                      convolution_im2col_input_tile_int8_avxvnniint8
                                (&local_3b8,&local_248,local_3d8._0_4_,uVar105,iVar84,uVar95,
                                 auVar128._0_4_,auVar128._4_4_,iVar78,iVar73,uVar97,iVar51);
                    }
                    piVar81 = (int *)CONCAT44(local_248.refcount._4_4_,local_248.refcount._0_4_);
                    if (piVar81 != (int *)0x0) {
                      LOCK();
                      *piVar81 = *piVar81 + -1;
                      UNLOCK();
                      if (*piVar81 == 0) {
                        if (local_248.allocator == (Allocator *)0x0) {
                          if ((undefined1 (*) [16])local_248.data != (undefined1 (*) [16])0x0) {
                            free(local_248.data);
                          }
                        }
                        else {
                          (*(local_248.allocator)->_vptr_Allocator[3])();
                        }
                      }
                    }
                    iVar66 = iVar66 + 1;
                  } while (iVar66 != iVar72);
                }
                uVar114 = local_3c8;
                local_248.cstep = 0;
                local_248.data = (void *)0x0;
                local_248.refcount._0_4_ = 0;
                local_248.refcount._4_4_ = 0;
                local_248.elemsize = 0;
                local_248.elempack = 0;
                local_248.allocator = (Allocator *)0x0;
                local_248.dims = 0;
                local_248.w = 0;
                local_248.h = 0;
                local_248.d = 0;
                local_248.c = 0;
                Mat::create(&local_248,TILE_M * TILE_N,1,iVar54,4,local_358->workspace_allocator);
                local_498 = -100;
                if ((local_248.data != (void *)0x0) && ((long)local_248.c * local_248.cstep != 0)) {
                  if (0 < (int)local_3f0) {
                    iVar51 = 0;
                    do {
                      local_348._0_4_ = TILE_M * iVar51;
                      uVar97 = (int)local_350 - TILE_M * iVar51;
                      if (TILE_M < (int)uVar97) {
                        uVar97 = TILE_M;
                      }
                      iVar54 = get_omp_thread_num();
                      m.data = (void *)((long)iVar54 * local_248.cstep * local_248.elemsize +
                                       (long)local_248.data);
                      m.refcount._0_4_ = 0;
                      m.refcount._4_4_ = 0;
                      m.elemsize = local_248.elemsize;
                      m.elempack = local_248.elempack;
                      m.allocator = local_248.allocator;
                      m.w = local_248.w;
                      m.h = local_248.h;
                      m.d = 1;
                      m.c = local_248.d;
                      m.dims = local_248.dims + -1;
                      m.cstep = (local_248.elemsize * (long)local_248.h * (long)local_248.w + 0xf &
                                0xfffffffffffffff0) / local_248.elemsize;
                      if (local_248.dims == 4) {
                        m.cstep = (long)local_248.h * (long)local_248.w;
                      }
                      if (0 < (int)uVar114) {
                        lVar55 = (long)(int)local_348._0_4_;
                        lVar76 = (long)(int)uVar97;
                        iVar54 = 0;
                        do {
                          uVar108 = (int)uVar114 - iVar54;
                          if (TILE_N < (int)uVar108) {
                            uVar108 = TILE_N;
                          }
                          if (0 < iVar100) {
                            iVar71 = 0;
                            do {
                              iVar72 = iVar100 - iVar71;
                              if (TILE_K < iVar100 - iVar71) {
                                iVar72 = TILE_K;
                              }
                              m_1.w = (this->weight_sgemm_data).w;
                              m_1.cstep = (size_t)m_1.w;
                              m_1.elemsize = (this->weight_sgemm_data).elemsize;
                              m_1.elempack = (this->weight_sgemm_data).elempack;
                              m_1.allocator = (this->weight_sgemm_data).allocator;
                              m_1.data = (void *)((long)(this->weight_sgemm_data).data +
                                                 m_1.elemsize * m_1.cstep * (long)(iVar71 / TILE_K)
                                                 + (long)((int)local_348._0_4_ / TILE_M) *
                                                   (this->weight_sgemm_data).cstep * m_1.elemsize);
                              m_1.refcount._0_4_ = 0;
                              m_1.refcount._4_4_ = 0;
                              m_1.dims = 2;
                              m_1.h = 1;
                              m_1.d = 1;
                              m_1.c = 1;
                              local_128.cstep = (size_t)(int)opt_q._44_4_;
                              local_128.data =
                                   (void *)(local_128.cstep * (long)opt_q.workspace_allocator *
                                            (long)(iVar71 / TILE_K) +
                                           (long)(iVar54 / TILE_N) * local_298[0] *
                                           (long)opt_q.workspace_allocator + opt_q._0_8_);
                              local_128.refcount._0_4_ = 0;
                              local_128.refcount._4_4_ = 0;
                              local_128.elemsize = (size_t)opt_q.workspace_allocator;
                              local_128.elempack = opt_q.openmp_blocktime;
                              local_128.allocator = (Allocator *)opt_q._32_8_;
                              local_128.dims = 2;
                              local_128.w._0_1_ = opt_q.use_reserved_1;
                              local_128.w._1_1_ = opt_q.use_image_storage;
                              local_128.w._2_1_ = opt_q.use_tensor_storage;
                              local_128.w._3_1_ = opt_q.use_reserved_2;
                              local_128.h = 1;
                              local_128.d = 1;
                              local_128.c = 1;
                              Gemm_x86_fma_utility::gemm_transB_packed_tile_int8
                                        (&m_1,&local_128,&m,local_348._0_4_,uVar97,iVar54,uVar108,
                                         iVar71,iVar72);
                              piVar81 = (int *)CONCAT44(local_128.refcount._4_4_,
                                                        local_128.refcount._0_4_);
                              if (piVar81 != (int *)0x0) {
                                LOCK();
                                *piVar81 = *piVar81 + -1;
                                UNLOCK();
                                if (*piVar81 == 0) {
                                  if (local_128.allocator == (Allocator *)0x0) {
                                    if (local_128.data != (void *)0x0) {
                                      free(local_128.data);
                                    }
                                  }
                                  else {
                                    (*(local_128.allocator)->_vptr_Allocator[3])();
                                  }
                                }
                              }
                              local_128.cstep = 0;
                              local_128.data = (void *)0x0;
                              local_128.refcount._0_4_ = 0;
                              local_128.refcount._4_4_ = 0;
                              local_128.elemsize = 0;
                              local_128.elempack = 0;
                              local_128.dims = 0;
                              local_128.w = 0;
                              local_128.h = 0;
                              local_128.d = 0;
                              local_128.c = 0;
                              piVar81 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
                              if (piVar81 != (int *)0x0) {
                                LOCK();
                                *piVar81 = *piVar81 + -1;
                                UNLOCK();
                                if (*piVar81 == 0) {
                                  if (m_1.allocator == (Allocator *)0x0) {
                                    if (m_1.data != (void *)0x0) {
                                      free(m_1.data);
                                    }
                                  }
                                  else {
                                    (*(m_1.allocator)->_vptr_Allocator[3])();
                                  }
                                }
                              }
                              m_1.cstep = 0;
                              m_1.data = (void *)0x0;
                              m_1.refcount._0_4_ = 0;
                              m_1.refcount._4_4_ = 0;
                              m_1.elemsize = 0;
                              m_1.elempack = 0;
                              m_1.dims = 0;
                              m_1.w = 0;
                              m_1.h = 0;
                              m_1.d = 0;
                              m_1.c = 0;
                              iVar71 = iVar71 + TILE_K;
                            } while (iVar71 < iVar100);
                          }
                          iVar71 = cpu_support_x86_avx2();
                          uVar114 = local_3c8;
                          if (iVar71 == 0) {
                            uVar77 = 0;
                            iVar71 = (int)local_328.cstep;
                            pauVar59 = (undefined1 (*) [32])m.data;
                            if (7 < (int)uVar97) {
                              lVar85 = (long)(iVar71 * 4);
                              lVar93 = (long)(iVar71 * 2);
                              lVar110 = (long)(local_328.cstep * 0x300000000) >> 0x20;
                              lVar56 = (long)((local_328.cstep << 0x20) * 5) >> 0x20;
                              lVar68 = (long)(local_328.cstep * 0x600000000) >> 0x20;
                              lVar75 = (long)(local_328.cstep * 0x700000000) >> 0x20;
                              local_3d8._0_8_ = (long)(iVar71 * 3);
                              lVar112 = (long)iVar71;
                              lVar61 = (long)(int)(uVar108 * 4) * 4;
                              uVar62 = 0;
                              do {
                                pauVar86 = (undefined1 (*) [32])
                                           ((long)local_328.data +
                                           (long)(local_328.elempack * iVar54) * 4 +
                                           (lVar55 + uVar62) * lVar112 * 4);
                                if ((int)uVar108 < 8) {
                                  uVar105 = 0;
                                  pauVar101 = (undefined1 (*) [32])
                                              (*pauVar59 + (long)(int)(uVar108 * 4) * 4);
                                }
                                else {
                                  iVar72 = 7;
                                  do {
                                    pauVar101 = pauVar59;
                                    auVar171._16_16_ =
                                         SUB3216(*(undefined1 (*) [32])(*pauVar101 + lVar61),0);
                                    auVar171._0_16_ = SUB3216(*pauVar101,0);
                                    auVar178._16_16_ =
                                         SUB3216(*(undefined1 (*) [32])(pauVar101[1] + lVar61),0);
                                    auVar178._0_16_ = SUB3216(pauVar101[1],0);
                                    auVar184._16_16_ =
                                         SUB3216(*(undefined1 (*) [32])(pauVar101[2] + lVar61),0);
                                    auVar184._0_16_ = SUB3216(pauVar101[2],0);
                                    auVar184 = vshufps_avx(auVar184,auVar184,0x93);
                                    auVar189._16_16_ =
                                         SUB3216(*(undefined1 (*) [32])(pauVar101[3] + lVar61),0);
                                    auVar189._0_16_ = SUB3216(pauVar101[3],0);
                                    auVar189 = vshufps_avx(auVar189,auVar189,0x93);
                                    auVar144 = vperm2f128_avx(*pauVar101,
                                                              *(undefined1 (*) [32])
                                                               (*pauVar101 + lVar61),0x31);
                                    auVar132 = vperm2f128_avx(pauVar101[1],
                                                              *(undefined1 (*) [32])
                                                               (pauVar101[1] + lVar61),0x31);
                                    auVar143 = vperm2f128_avx(pauVar101[2],
                                                              *(undefined1 (*) [32])
                                                               (pauVar101[2] + lVar61),0x31);
                                    auVar143 = vshufps_avx(auVar143,auVar143,0x93);
                                    auVar152 = vperm2f128_avx(pauVar101[3],
                                                              *(undefined1 (*) [32])
                                                               (pauVar101[3] + lVar61),0x31);
                                    auVar152 = vshufps_avx(auVar152,auVar152,0x93);
                                    auVar186 = vunpcklps_avx(auVar171,auVar189);
                                    auVar191 = vunpcklps_avx(auVar178,auVar184);
                                    auVar178 = vunpckhps_avx(auVar178,auVar184);
                                    auVar189 = vunpckhps_avx(auVar171,auVar189);
                                    auVar172 = vunpcklps_avx(auVar144,auVar152);
                                    auVar179 = vunpcklps_avx(auVar132,auVar143);
                                    auVar132 = vunpckhps_avx(auVar132,auVar143);
                                    auVar152 = vunpckhps_avx(auVar144,auVar152);
                                    auVar144 = vunpcklpd_avx(auVar186,auVar191);
                                    auVar171 = vunpcklpd_avx(auVar178,auVar189);
                                    auVar153 = vunpcklpd_avx(auVar172,auVar179);
                                    auVar180 = vunpcklpd_avx(auVar132,auVar152);
                                    auVar184 = vshufps_avx(auVar186,auVar191,0xbe);
                                    auVar184 = vshufps_avx(auVar184,auVar184,0xd2);
                                    auVar189 = vshufps_avx(auVar178,auVar189,0xbe);
                                    auVar189 = vshufps_avx(auVar189,auVar189,0xd2);
                                    auVar143 = vshufps_avx(auVar172,auVar179,0xbe);
                                    auVar143 = vshufps_avx(auVar143,auVar143,0xd2);
                                    auVar152 = vshufps_avx(auVar132,auVar152,0xbe);
                                    auVar152 = vshufps_avx(auVar152,auVar152,0xd2);
                                    if (local_328.elempack == 8) {
                                      *pauVar86 = auVar144;
                                      pauVar86[1] = auVar184;
                                      pauVar86[2] = auVar171;
                                      pauVar86[3] = auVar189;
                                      pauVar86[4] = auVar153;
                                      pauVar86[5] = auVar143;
                                      pauVar86[6] = auVar180;
                                      pauVar86[7] = auVar152;
                                      pauVar86 = pauVar86 + 8;
                                    }
                                    if (local_328.elempack == 4) {
                                      auVar172._16_16_ = auVar184._0_16_;
                                      auVar172._0_16_ = auVar144._0_16_;
                                      auVar179._16_16_ = auVar189._0_16_;
                                      auVar179._0_16_ = auVar171._0_16_;
                                      auVar185._16_16_ = auVar143._0_16_;
                                      auVar185._0_16_ = auVar153._0_16_;
                                      auVar190._16_16_ = auVar152._0_16_;
                                      auVar190._0_16_ = auVar180._0_16_;
                                      auVar178 = vperm2f128_avx(auVar144,auVar184,0x31);
                                      auVar132 = vperm2f128_avx(auVar171,auVar189,0x31);
                                      auVar186 = vperm2f128_avx(auVar153,auVar143,0x31);
                                      auVar191 = vperm2f128_avx(auVar180,auVar152,0x31);
                                      *pauVar86 = auVar172;
                                      pauVar86[1] = auVar179;
                                      pauVar86[2] = auVar185;
                                      pauVar86[3] = auVar190;
                                      *(undefined1 (*) [32])(*pauVar86 + lVar85 * 4) = auVar178;
                                      *(undefined1 (*) [32])(pauVar86[1] + lVar85 * 4) = auVar132;
                                      *(undefined1 (*) [32])(pauVar86[2] + lVar85 * 4) = auVar186;
                                      *(undefined1 (*) [32])(pauVar86[3] + lVar85 * 4) = auVar191;
                                      pauVar86 = pauVar86 + 4;
                                    }
                                    if (local_328.elempack == 1) {
                                      auVar186 = vunpcklps_avx(auVar144,auVar184);
                                      auVar178 = vunpckhps_avx(auVar144,auVar184);
                                      auVar184 = vunpcklps_avx(auVar171,auVar189);
                                      auVar189 = vunpckhps_avx(auVar171,auVar189);
                                      auVar191 = vunpcklps_avx(auVar153,auVar143);
                                      auVar132 = vunpckhps_avx(auVar153,auVar143);
                                      auVar143 = vunpcklps_avx(auVar180,auVar152);
                                      auVar152 = vunpckhps_avx(auVar180,auVar152);
                                      auVar144 = vunpcklpd_avx(auVar186,auVar184);
                                      auVar184 = vunpckhpd_avx(auVar186,auVar184);
                                      auVar171 = vunpcklpd_avx(auVar178,auVar189);
                                      auVar189 = vunpckhpd_avx(auVar178,auVar189);
                                      auVar178 = vunpcklpd_avx(auVar191,auVar143);
                                      auVar143 = vunpckhpd_avx(auVar191,auVar143);
                                      auVar153 = vunpcklpd_avx(auVar132,auVar152);
                                      auVar152 = vunpckhpd_avx(auVar132,auVar152);
                                      auVar132._16_16_ = auVar178._0_16_;
                                      auVar132._0_16_ = auVar144._0_16_;
                                      auVar180._16_16_ = auVar143._0_16_;
                                      auVar180._0_16_ = auVar184._0_16_;
                                      auVar186._16_16_ = auVar153._0_16_;
                                      auVar186._0_16_ = auVar171._0_16_;
                                      auVar191._16_16_ = auVar152._0_16_;
                                      auVar191._0_16_ = auVar189._0_16_;
                                      auVar178 = vperm2f128_avx(auVar144,auVar178,0x31);
                                      auVar184 = vperm2f128_avx(auVar184,auVar143,0x31);
                                      auVar143 = vperm2f128_avx(auVar171,auVar153,0x31);
                                      auVar189 = vperm2f128_avx(auVar189,auVar152,0x31);
                                      *pauVar86 = auVar132;
                                      *(undefined1 (*) [32])(*pauVar86 + lVar112 * 4) = auVar180;
                                      *(undefined1 (*) [32])(*pauVar86 + lVar93 * 4) = auVar186;
                                      *(undefined1 (*) [32])(*pauVar86 + lVar110 * 4) = auVar191;
                                      *(undefined1 (*) [32])(*pauVar86 + lVar85 * 4) = auVar178;
                                      *(undefined1 (*) [32])(*pauVar86 + lVar56 * 4) = auVar184;
                                      *(undefined1 (*) [32])(*pauVar86 + lVar68 * 4) = auVar143;
                                      *(undefined1 (*) [32])(*pauVar86 + lVar75 * 4) = auVar189;
                                      pauVar86 = pauVar86 + 1;
                                    }
                                    iVar72 = iVar72 + 8;
                                    pauVar59 = pauVar101 + 4;
                                  } while (iVar72 < (int)uVar108);
                                  pauVar59 = pauVar101 + 4;
                                  pauVar101 = (undefined1 (*) [32])(*pauVar59 + lVar61);
                                  uVar105 = uVar108 & 0xfffffff8;
                                }
                                uVar95 = uVar105;
                                if ((int)(uVar105 | 3) < (int)uVar108) {
                                  do {
                                    pauVar102 = pauVar101;
                                    pauVar88 = pauVar59;
                                    auVar143._16_16_ = SUB3216(*pauVar102,0);
                                    auVar143._0_16_ = SUB3216(*pauVar88,0);
                                    auVar152._16_16_ = SUB3216(pauVar102[1],0);
                                    auVar152._0_16_ = SUB3216(pauVar88[1],0);
                                    auVar184 = vperm2f128_avx(*pauVar88,*pauVar102,0x31);
                                    auVar184 = vshufps_avx(auVar184,auVar184,0x93);
                                    auVar189 = vperm2f128_avx(pauVar88[1],pauVar102[1],0x31);
                                    auVar189 = vshufps_avx(auVar189,auVar189,0x93);
                                    auVar132 = vunpcklps_avx(auVar143,auVar189);
                                    auVar189 = vunpckhps_avx(auVar143,auVar189);
                                    auVar144 = vunpcklps_avx(auVar152,auVar184);
                                    auVar143 = vunpckhps_avx(auVar152,auVar184);
                                    auVar152 = vunpcklpd_avx(auVar132,auVar144);
                                    auVar178 = vunpcklpd_avx(auVar143,auVar189);
                                    auVar184 = vshufps_avx(auVar132,auVar144,0xbe);
                                    auVar184 = vshufps_avx(auVar184,auVar184,0xd2);
                                    auVar189 = vshufps_avx(auVar143,auVar189,0xbe);
                                    auVar189 = vshufps_avx(auVar189,auVar189,0xd2);
                                    if (local_328.elempack == 8) {
                                      *pauVar86 = auVar152;
                                      pauVar86[1] = auVar184;
                                      pauVar86[2] = auVar178;
                                      pauVar86[3] = auVar189;
                                      pauVar86 = pauVar86 + 4;
                                    }
                                    if (local_328.elempack == 4) {
                                      auVar144._16_16_ = auVar184._0_16_;
                                      auVar144._0_16_ = auVar152._0_16_;
                                      auVar153._16_16_ = auVar189._0_16_;
                                      auVar153._0_16_ = auVar178._0_16_;
                                      auVar143 = vperm2f128_avx(auVar152,auVar184,0x31);
                                      auVar132 = vperm2f128_avx(auVar178,auVar189,0x31);
                                      *pauVar86 = auVar144;
                                      pauVar86[1] = auVar153;
                                      *(undefined1 (*) [32])(*pauVar86 + lVar85 * 4) = auVar143;
                                      *(undefined1 (*) [32])(pauVar86[1] + lVar85 * 4) = auVar132;
                                      pauVar86 = pauVar86 + 2;
                                    }
                                    if (local_328.elempack == 1) {
                                      auVar132 = vunpcklps_avx(auVar152,auVar184);
                                      auVar143 = vunpckhps_avx(auVar152,auVar184);
                                      auVar184 = vunpcklps_avx(auVar178,auVar189);
                                      auVar189 = vunpckhps_avx(auVar178,auVar189);
                                      auVar152 = vunpcklpd_avx(auVar132,auVar184);
                                      auVar184 = vunpckhpd_avx(auVar132,auVar184);
                                      auVar178 = vunpcklpd_avx(auVar143,auVar189);
                                      auVar189 = vunpckhpd_avx(auVar143,auVar189);
                                      *(undefined1 (*) [16])*pauVar86 = auVar152._0_16_;
                                      *(undefined1 (*) [16])(*pauVar86 + lVar112 * 4) =
                                           auVar184._0_16_;
                                      *(undefined1 (*) [16])(*pauVar86 + lVar93 * 4) =
                                           auVar178._0_16_;
                                      *(undefined1 (*) [16])(*pauVar86 + lVar110 * 4) =
                                           auVar189._0_16_;
                                      *(undefined1 (*) [16])(*pauVar86 + lVar85 * 4) =
                                           auVar152._16_16_;
                                      *(undefined1 (*) [16])(*pauVar86 + lVar56 * 4) =
                                           auVar184._16_16_;
                                      *(undefined1 (*) [16])(*pauVar86 + lVar68 * 4) =
                                           auVar178._16_16_;
                                      *(undefined1 (*) [16])(*pauVar86 + lVar75 * 4) =
                                           auVar189._16_16_;
                                      pauVar86 = (undefined1 (*) [32])(*pauVar86 + 0x10);
                                    }
                                    uVar105 = uVar95 + 4;
                                    iVar72 = uVar95 + 7;
                                    pauVar59 = pauVar88 + 2;
                                    pauVar101 = pauVar102 + 2;
                                    uVar95 = uVar105;
                                  } while (iVar72 < (int)uVar108);
                                  pauVar59 = pauVar88 + 2;
                                  pauVar101 = pauVar102 + 2;
                                }
                                uVar95 = uVar105 | 1;
                                pauVar88 = pauVar59;
                                pauVar59 = pauVar101;
                                while ((int)uVar95 < (int)uVar108) {
                                  auVar136._16_16_ = SUB3216(*pauVar59,0);
                                  auVar136._0_16_ = SUB3216(*pauVar88,0);
                                  auVar189 = vperm2f128_avx(*pauVar88,*pauVar59,0x31);
                                  auVar184 = vblendps_avx(auVar136,auVar189,0xaa);
                                  auVar189 = vblendps_avx(auVar189,auVar136,0xaa);
                                  if (local_328.elempack == 8) {
                                    *pauVar86 = auVar184;
                                    pauVar86[1] = auVar189;
                                    pauVar86 = pauVar86 + 2;
                                  }
                                  auVar122 = auVar184._0_16_;
                                  auVar128 = auVar184._16_16_;
                                  auVar129 = auVar189._0_16_;
                                  if (local_328.elempack == 4) {
                                    auVar137._16_16_ = auVar129;
                                    auVar137._0_16_ = auVar122;
                                    auVar184 = vperm2f128_avx(auVar184,auVar189,0x31);
                                    *pauVar86 = auVar137;
                                    *(undefined1 (*) [32])(*pauVar86 + lVar85 * 4) = auVar184;
                                    pauVar86 = pauVar86 + 1;
                                  }
                                  if (local_328.elempack == 1) {
                                    auVar158 = vunpcklps_avx(auVar122,auVar129);
                                    uVar3 = vmovlps_avx(auVar158);
                                    *(undefined8 *)*pauVar86 = uVar3;
                                    uVar63 = vextractps_avx(auVar122,1);
                                    *(undefined4 *)(*pauVar86 + lVar112 * 4) = uVar63;
                                    uVar63 = vextractps_avx(auVar129,1);
                                    *(undefined4 *)
                                     (*pauVar86 +
                                     ((long)((local_328.cstep << 0x20) + 0x100000000) >> 0x20) * 4)
                                         = uVar63;
                                    uVar63 = vextractps_avx(auVar122,2);
                                    *(undefined4 *)(*pauVar86 + lVar93 * 4) = uVar63;
                                    uVar63 = vextractps_avx(auVar129,2);
                                    *(undefined4 *)(*pauVar86 + (long)(iVar71 * 2 + 1) * 4) = uVar63
                                    ;
                                    uVar63 = vextractps_avx(auVar122,3);
                                    *(undefined4 *)(*pauVar86 + (long)(iVar71 * 3) * 4) = uVar63;
                                    uVar63 = vextractps_avx(auVar129,3);
                                    *(undefined4 *)(*pauVar86 + (long)(iVar71 * 3 + 1) * 4) = uVar63
                                    ;
                                    auVar129 = auVar189._16_16_;
                                    auVar122 = vunpcklps_avx(auVar128,auVar129);
                                    uVar3 = vmovlps_avx(auVar122);
                                    *(undefined8 *)(*pauVar86 + lVar85 * 4) = uVar3;
                                    uVar63 = vextractps_avx(auVar128,1);
                                    *(undefined4 *)(*pauVar86 + (long)(iVar71 * 5) * 4) = uVar63;
                                    uVar63 = vextractps_avx(auVar129,1);
                                    *(undefined4 *)(*pauVar86 + (long)(iVar71 * 5 + 1) * 4) = uVar63
                                    ;
                                    auVar122 = vunpckhps_avx(auVar128,auVar129);
                                    uVar3 = vmovlps_avx(auVar122);
                                    *(undefined8 *)(*pauVar86 + lVar68 * 4) = uVar3;
                                    uVar63 = vextractps_avx(auVar128,3);
                                    *(undefined4 *)(*pauVar86 + (long)(iVar71 * 7) * 4) = uVar63;
                                    uVar63 = vextractps_avx(auVar129,3);
                                    *(undefined4 *)(*pauVar86 + (long)(iVar71 * 7 + 1) * 4) = uVar63
                                    ;
                                    pauVar86 = (undefined1 (*) [32])(*pauVar86 + 8);
                                  }
                                  pauVar88 = pauVar88 + 1;
                                  pauVar59 = pauVar59 + 1;
                                  uVar95 = uVar105 + 3;
                                  uVar105 = uVar105 + 2;
                                }
                                iVar72 = uVar108 - uVar105;
                                if (iVar72 != 0 && (int)uVar105 <= (int)uVar108) {
                                  do {
                                    auVar122 = *(undefined1 (*) [16])*pauVar88;
                                    auVar128 = *(undefined1 (*) [16])*pauVar59;
                                    if (local_328.elempack == 8) {
                                      *(undefined1 (*) [16])(*pauVar86 + 0x10) = auVar128;
                                      *(undefined1 (*) [16])*pauVar86 = auVar122;
                                      pauVar86 = pauVar86 + 1;
                                    }
                                    if (local_328.elempack == 4) {
                                      *(undefined1 (*) [16])*pauVar86 = auVar122;
                                      *(undefined1 (*) [16])(*pauVar86 + lVar85 * 4) = auVar128;
                                      pauVar86 = (undefined1 (*) [32])(*pauVar86 + 0x10);
                                    }
                                    if (local_328.elempack == 1) {
                                      *(int *)*pauVar86 = auVar122._0_4_;
                                      uVar63 = vextractps_avx(auVar122,1);
                                      *(undefined4 *)(*pauVar86 + lVar112 * 4) = uVar63;
                                      uVar63 = vextractps_avx(auVar122,2);
                                      *(undefined4 *)(*pauVar86 + lVar93 * 4) = uVar63;
                                      uVar63 = vextractps_avx(auVar122,3);
                                      *(undefined4 *)(*pauVar86 + lVar110 * 4) = uVar63;
                                      *(int *)(*pauVar86 + lVar85 * 4) = auVar128._0_4_;
                                      uVar63 = vextractps_avx(auVar128,1);
                                      *(undefined4 *)(*pauVar86 + lVar56 * 4) = uVar63;
                                      uVar63 = vextractps_avx(auVar128,2);
                                      *(undefined4 *)(*pauVar86 + lVar68 * 4) = uVar63;
                                      uVar63 = vextractps_avx(auVar128,3);
                                      *(undefined4 *)(*pauVar86 + lVar75 * 4) = uVar63;
                                      pauVar86 = (undefined1 (*) [32])(*pauVar86 + 4);
                                    }
                                    pauVar88 = (undefined1 (*) [32])(*pauVar88 + 0x10);
                                    pauVar59 = (undefined1 (*) [32])(*pauVar59 + 0x10);
                                    iVar72 = iVar72 + -1;
                                  } while (iVar72 != 0);
                                }
                                uVar77 = uVar62 + 8;
                                uVar80 = uVar62 + 0xf;
                                uVar62 = uVar77;
                              } while (uVar80 < uVar97);
                            }
                            if ((int)((uint)uVar77 | 3) < (int)uVar97) {
                              lVar61 = (long)iVar71;
                              lVar56 = (long)(iVar71 * 2);
                              lVar68 = (long)(local_328.cstep * 0x300000000) >> 0x20;
                              uVar62 = uVar77 & 0xffffffff;
                              do {
                                pauVar111 = (undefined1 (*) [16])
                                            ((long)local_328.data +
                                            (long)(local_328.elempack * iVar54) * 4 +
                                            (lVar55 + uVar62) * lVar61 * 4);
                                uVar105 = 0;
                                if (7 < (int)uVar108) {
                                  iVar72 = 7;
                                  do {
                                    auVar122 = vpermilps_avx(*(undefined1 (*) [16])pauVar59[2],0x93)
                                    ;
                                    auVar128 = vpermilps_avx(*(undefined1 (*) [16])
                                                              (pauVar59[2] + 0x10),0x93);
                                    auVar129 = vpermilps_avx(*(undefined1 (*) [16])pauVar59[3],0x93)
                                    ;
                                    auVar158 = vpermilps_avx(*(undefined1 (*) [16])
                                                              (pauVar59[3] + 0x10),0x93);
                                    auVar149 = vunpcklps_avx(*(undefined1 (*) [16])*pauVar59,
                                                             auVar129);
                                    auVar182 = vunpckhps_avx(*(undefined1 (*) [16])*pauVar59,
                                                             auVar129);
                                    auVar168 = vunpcklps_avx(*(undefined1 (*) [16])
                                                              (*pauVar59 + 0x10),auVar158);
                                    auVar162 = vunpckhps_avx(*(undefined1 (*) [16])
                                                              (*pauVar59 + 0x10),auVar158);
                                    auVar169 = vunpcklps_avx(*(undefined1 (*) [16])pauVar59[1],
                                                             auVar122);
                                    auVar167 = vunpckhps_avx(*(undefined1 (*) [16])pauVar59[1],
                                                             auVar122);
                                    auVar14 = vunpcklps_avx(*(undefined1 (*) [16])
                                                             (pauVar59[1] + 0x10),auVar128);
                                    auVar147 = vunpckhps_avx(*(undefined1 (*) [16])
                                                              (pauVar59[1] + 0x10),auVar128);
                                    auVar122 = vmovlhps_avx(auVar149,auVar169);
                                    auVar128 = vmovlhps_avx(auVar167,auVar182);
                                    auVar129 = vmovlhps_avx(auVar168,auVar14);
                                    auVar158 = vmovlhps_avx(auVar147,auVar162);
                                    auVar149 = vunpckhps_avx(auVar149,auVar169);
                                    auVar149 = vshufps_avx(auVar149,auVar149,99);
                                    auVar182 = vunpckhps_avx(auVar167,auVar182);
                                    auVar182 = vshufps_avx(auVar182,auVar182,99);
                                    auVar167 = vunpckhps_avx(auVar168,auVar14);
                                    auVar167 = vshufps_avx(auVar167,auVar167,99);
                                    auVar162 = vunpckhps_avx(auVar147,auVar162);
                                    auVar162 = vshufps_avx(auVar162,auVar162,99);
                                    if (local_328.elempack == 4) {
                                      *pauVar111 = auVar122;
                                      pauVar111[1] = auVar149;
                                      pauVar111[2] = auVar128;
                                      pauVar111[3] = auVar182;
                                      pauVar111[4] = auVar129;
                                      pauVar111[5] = auVar167;
                                      pauVar111[6] = auVar158;
                                      pauVar111[7] = auVar162;
                                      pauVar111 = pauVar111 + 8;
                                    }
                                    if (local_328.elempack == 1) {
                                      auVar168 = vunpcklps_avx(auVar122,auVar149);
                                      auVar147 = vunpckhps_avx(auVar122,auVar149);
                                      auVar149 = vunpcklps_avx(auVar128,auVar182);
                                      auVar182 = vunpckhps_avx(auVar128,auVar182);
                                      auVar122 = vmovlhps_avx(auVar168,auVar149);
                                      auVar149 = vunpckhpd_avx(auVar168,auVar149);
                                      auVar128 = vmovlhps_avx(auVar147,auVar182);
                                      auVar182 = vunpckhpd_avx(auVar147,auVar182);
                                      auVar168 = vunpcklps_avx(auVar129,auVar167);
                                      auVar147 = vunpckhps_avx(auVar129,auVar167);
                                      auVar167 = vunpcklps_avx(auVar158,auVar162);
                                      auVar162 = vunpckhps_avx(auVar158,auVar162);
                                      auVar129 = vmovlhps_avx(auVar168,auVar167);
                                      auVar167 = vunpckhpd_avx(auVar168,auVar167);
                                      auVar158 = vmovlhps_avx(auVar147,auVar162);
                                      auVar162 = vunpckhpd_avx(auVar147,auVar162);
                                      *pauVar111 = auVar122;
                                      pauVar111[1] = auVar129;
                                      *(undefined1 (*) [16])(*pauVar111 + lVar61 * 4) = auVar149;
                                      *(undefined1 (*) [16])(pauVar111[1] + lVar61 * 4) = auVar167;
                                      *(undefined1 (*) [16])(*pauVar111 + lVar56 * 4) = auVar128;
                                      *(undefined1 (*) [16])(pauVar111[1] + lVar56 * 4) = auVar158;
                                      *(undefined1 (*) [16])(*pauVar111 + lVar68 * 4) = auVar182;
                                      *(undefined1 (*) [16])(pauVar111[1] + lVar68 * 4) = auVar162;
                                      pauVar111 = pauVar111 + 2;
                                    }
                                    pauVar59 = pauVar59 + 4;
                                    iVar72 = iVar72 + 8;
                                    uVar105 = uVar108 & 0xfffffff8;
                                  } while (iVar72 < (int)uVar108);
                                }
                                uVar95 = uVar105 | 3;
                                while ((int)uVar95 < (int)uVar108) {
                                  auVar122 = vpermilps_avx(*(undefined1 (*) [16])(*pauVar59 + 0x10),
                                                           0x93);
                                  auVar128 = vpermilps_avx(*(undefined1 (*) [16])
                                                            (pauVar59[1] + 0x10),0x93);
                                  auVar129 = vunpcklps_avx(*(undefined1 (*) [16])*pauVar59,auVar128)
                                  ;
                                  auVar158 = vunpckhps_avx(*(undefined1 (*) [16])*pauVar59,auVar128)
                                  ;
                                  auVar182 = vunpcklps_avx(*(undefined1 (*) [16])pauVar59[1],
                                                           auVar122);
                                  auVar149 = vunpckhps_avx(*(undefined1 (*) [16])pauVar59[1],
                                                           auVar122);
                                  auVar122 = vmovlhps_avx(auVar129,auVar182);
                                  auVar128 = vmovlhps_avx(auVar149,auVar158);
                                  auVar129 = vunpckhps_avx(auVar129,auVar182);
                                  auVar129 = vshufps_avx(auVar129,auVar129,99);
                                  auVar158 = vunpckhps_avx(auVar149,auVar158);
                                  auVar158 = vshufps_avx(auVar158,auVar158,99);
                                  if (local_328.elempack == 4) {
                                    *pauVar111 = auVar122;
                                    pauVar111[1] = auVar129;
                                    pauVar111[2] = auVar128;
                                    pauVar111[3] = auVar158;
                                    pauVar111 = pauVar111 + 4;
                                  }
                                  if (local_328.elempack == 1) {
                                    auVar182 = vunpcklps_avx(auVar122,auVar129);
                                    auVar149 = vunpckhps_avx(auVar122,auVar129);
                                    auVar129 = vunpcklps_avx(auVar128,auVar158);
                                    auVar158 = vunpckhps_avx(auVar128,auVar158);
                                    auVar122 = vmovlhps_avx(auVar182,auVar129);
                                    auVar129 = vunpckhpd_avx(auVar182,auVar129);
                                    auVar128 = vmovlhps_avx(auVar149,auVar158);
                                    auVar158 = vunpckhpd_avx(auVar149,auVar158);
                                    *pauVar111 = auVar122;
                                    *(undefined1 (*) [16])(*pauVar111 + lVar61 * 4) = auVar129;
                                    *(undefined1 (*) [16])(*pauVar111 + lVar56 * 4) = auVar128;
                                    *(undefined1 (*) [16])(*pauVar111 + lVar68 * 4) = auVar158;
                                    pauVar111 = pauVar111 + 1;
                                  }
                                  pauVar59 = pauVar59 + 2;
                                  uVar95 = uVar105 + 7;
                                  uVar105 = uVar105 + 4;
                                }
                                uVar95 = uVar105 | 1;
                                while ((int)uVar95 < (int)uVar108) {
                                  auVar122 = *(undefined1 (*) [16])*pauVar59;
                                  auVar128 = *(undefined1 (*) [16])(*pauVar59 + 0x10);
                                  if (local_328.elempack == 4) {
                                    auVar129 = vblendps_avx(auVar128,auVar122,10);
                                    auVar158 = vblendps_avx(auVar122,auVar128,10);
                                    *pauVar111 = auVar158;
                                    pauVar111[1] = auVar129;
                                    pauVar111 = pauVar111 + 2;
                                  }
                                  if (local_328.elempack == 1) {
                                    auVar129 = vunpcklps_avx(auVar122,auVar128);
                                    uVar3 = vmovlps_avx(auVar129);
                                    *(undefined8 *)*pauVar111 = uVar3;
                                    uVar63 = vextractps_avx(auVar128,1);
                                    *(undefined4 *)(*pauVar111 + lVar61 * 4) = uVar63;
                                    uVar63 = vextractps_avx(auVar122,1);
                                    *(undefined4 *)
                                     (*pauVar111 +
                                     ((long)((local_328.cstep << 0x20) + 0x100000000) >> 0x20) * 4)
                                         = uVar63;
                                    auVar129 = vunpckhps_avx(auVar122,auVar128);
                                    uVar3 = vmovlps_avx(auVar129);
                                    *(undefined8 *)(*pauVar111 + lVar56 * 4) = uVar3;
                                    uVar63 = vextractps_avx(auVar128,3);
                                    *(undefined4 *)(*pauVar111 + (long)(iVar71 * 3) * 4) = uVar63;
                                    uVar63 = vextractps_avx(auVar122,3);
                                    *(undefined4 *)(*pauVar111 + (long)(iVar71 * 3 + 1) * 4) =
                                         uVar63;
                                    pauVar111 = (undefined1 (*) [16])(*pauVar111 + 8);
                                  }
                                  pauVar59 = pauVar59 + 1;
                                  uVar95 = uVar105 + 3;
                                  uVar105 = uVar105 + 2;
                                }
                                iVar72 = uVar108 - uVar105;
                                if (iVar72 != 0 && (int)uVar105 <= (int)uVar108) {
                                  do {
                                    auVar122 = *(undefined1 (*) [16])*pauVar59;
                                    if (local_328.elempack == 4) {
                                      *pauVar111 = auVar122;
                                      pauVar111 = pauVar111 + 1;
                                    }
                                    if (local_328.elempack == 1) {
                                      *(int *)*pauVar111 = auVar122._0_4_;
                                      uVar63 = vextractps_avx(auVar122,1);
                                      *(undefined4 *)(*pauVar111 + lVar61 * 4) = uVar63;
                                      uVar63 = vextractps_avx(auVar122,2);
                                      *(undefined4 *)(*pauVar111 + lVar56 * 4) = uVar63;
                                      uVar63 = vextractps_avx(auVar122,3);
                                      *(undefined4 *)(*pauVar111 + lVar68 * 4) = uVar63;
                                      pauVar111 = (undefined1 (*) [16])(*pauVar111 + 4);
                                    }
                                    pauVar59 = (undefined1 (*) [32])(*pauVar59 + 0x10);
                                    iVar72 = iVar72 + -1;
                                  } while (iVar72 != 0);
                                }
                                uVar77 = uVar62 + 4;
                                lVar75 = uVar62 + 7;
                                uVar62 = uVar77;
                              } while (lVar75 < lVar76);
                            }
                            lVar61 = (long)iVar54;
                            if ((int)((uint)uVar77 | 1) < (int)uVar97) {
                              lVar85 = (long)iVar71;
                              lVar68 = lVar55 + (uVar77 & 0xffffffff);
                              lVar56 = lVar68 * 4 * lVar85 + lVar61 * 4;
                              lVar75 = (lVar68 * 4 + 4) * lVar85 + lVar61 * 4 + 0x10;
                              lVar68 = lVar85 * 4;
                              local_3d8._0_8_ = lVar68;
                              uVar62 = uVar77 & 0xffffffff;
                              do {
                                if ((int)uVar108 < 8) {
                                  uVar105 = 0;
                                  lVar93 = lVar61 * 4 + (lVar55 + uVar62) * lVar85 * 4;
                                }
                                else {
                                  iVar72 = 7;
                                  lVar93 = 0;
                                  pauVar86 = pauVar59;
                                  do {
                                    pauVar101 = pauVar86;
                                    pauVar111 = (undefined1 (*) [16])(*pauVar59 + lVar93 * 2);
                                    auVar122 = vpermilps_avx(pauVar111[2],0xb1);
                                    auVar128 = vpermilps_avx(pauVar111[3],0xb1);
                                    auVar149 = vunpcklps_avx(*pauVar111,auVar122);
                                    auVar129 = vunpckhps_avx(*pauVar111,auVar122);
                                    auVar182 = vunpcklps_avx(pauVar111[1],auVar128);
                                    auVar158 = vunpckhps_avx(pauVar111[1],auVar128);
                                    auVar122 = vmovlhps_avx(auVar149,auVar129);
                                    auVar128 = vmovlhps_avx(auVar182,auVar158);
                                    auVar129 = vshufps_avx(auVar149,auVar129,0xbb);
                                    auVar158 = vshufps_avx(auVar182,auVar158,0xbb);
                                    *(undefined1 (*) [16])((long)local_328.data + lVar93 + lVar56) =
                                         auVar122;
                                    *(undefined1 (*) [16])
                                     ((long)local_328.data + lVar93 + lVar56 + 0x10) = auVar128;
                                    *(undefined1 (*) [16])
                                     ((long)local_328.data + lVar93 + lVar75 + -0x10) = auVar129;
                                    *(undefined1 (*) [16])((long)local_328.data + lVar93 + lVar75) =
                                         auVar158;
                                    lVar93 = lVar93 + 0x20;
                                    iVar72 = iVar72 + 8;
                                    pauVar86 = (undefined1 (*) [32])(pauVar111 + 4);
                                  } while (iVar72 < (int)uVar108);
                                  pauVar59 = pauVar101 + 2;
                                  lVar93 = lVar93 + lVar56;
                                  uVar105 = uVar108 & 0xfffffff8;
                                }
                                pauVar111 = (undefined1 (*) [16])((long)local_328.data + lVar93);
                                uVar95 = uVar105 | 3;
                                while ((int)uVar95 < (int)uVar108) {
                                  auVar129 = vunpcklps_avx(*(undefined1 (*) [16])*pauVar59,
                                                           *(undefined1 (*) [16])(*pauVar59 + 0x10))
                                  ;
                                  auVar128 = vunpckhps_avx(*(undefined1 (*) [16])*pauVar59,
                                                           *(undefined1 (*) [16])(*pauVar59 + 0x10))
                                  ;
                                  auVar122 = vmovlhps_avx(auVar129,auVar128);
                                  auVar128 = vunpckhps_avx(auVar128,auVar129);
                                  auVar128 = vshufps_avx(auVar128,auVar128,0x36);
                                  *pauVar111 = auVar122;
                                  *(undefined1 (*) [16])(*pauVar111 + lVar85 * 4) = auVar128;
                                  pauVar111 = pauVar111 + 1;
                                  pauVar59 = pauVar59 + 1;
                                  uVar95 = uVar105 + 7;
                                  uVar105 = uVar105 + 4;
                                }
                                if ((int)(uVar105 | 1) < (int)uVar108) {
                                  lVar93 = 0;
                                  lVar110 = 0;
                                  lVar112 = 0;
                                  do {
                                    uVar63 = *(undefined4 *)(*pauVar59 + lVar112 * 8 + 8);
                                    uVar9 = *(undefined4 *)(*pauVar59 + lVar112 * 8 + 0xc);
                                    *(undefined8 *)(*pauVar111 + lVar112 * 4) =
                                         *(undefined8 *)(*pauVar59 + lVar112 * 8);
                                    *(undefined4 *)(*pauVar111 + lVar112 * 4 + lVar68) = uVar63;
                                    *(undefined4 *)
                                     (*pauVar111 +
                                     lVar112 * 4 +
                                     ((long)((local_328.cstep << 0x20) + 0x100000000) >> 0x20) * 4)
                                         = uVar9;
                                    lVar112 = lVar112 + 2;
                                    lVar110 = lVar110 + 0x10;
                                    lVar93 = lVar93 + 8;
                                  } while ((int)(uVar105 + (int)lVar112 + 1) < (int)uVar108);
                                  pauVar59 = (undefined1 (*) [32])(*pauVar59 + lVar110);
                                  pauVar111 = (undefined1 (*) [16])(*pauVar111 + lVar93);
                                  uVar105 = uVar105 + (int)lVar112;
                                }
                                if ((int)uVar105 < (int)uVar108) {
                                  lVar93 = 0;
                                  do {
                                    uVar63 = *(undefined4 *)(*pauVar59 + 4);
                                    *(undefined4 *)(*pauVar111 + lVar93 * 4) =
                                         *(undefined4 *)*pauVar59;
                                    *(undefined4 *)(*pauVar111 + lVar93 * 4 + lVar68) = uVar63;
                                    pauVar59 = (undefined1 (*) [32])(*pauVar59 + 8);
                                    lVar93 = lVar93 + 1;
                                  } while (uVar108 - uVar105 != (int)lVar93);
                                }
                                uVar77 = uVar62 + 2;
                                lVar93 = uVar62 + 3;
                                lVar56 = lVar56 + lVar85 * 8;
                                lVar75 = lVar75 + lVar85 * 8;
                                uVar62 = uVar77;
                              } while (lVar93 < lVar76);
                            }
                            if ((int)uVar77 < (int)uVar97) {
                              lVar56 = (long)(int)uVar77;
                              do {
                                pauVar86 = (undefined1 (*) [32])
                                           ((long)local_328.data +
                                           lVar61 * 4 + (lVar55 + lVar56) * (long)iVar71 * 4);
                                uVar105 = 0;
                                if (7 < (int)uVar108) {
                                  iVar72 = 7;
                                  do {
                                    *pauVar86 = *pauVar59;
                                    pauVar86 = pauVar86 + 1;
                                    pauVar59 = pauVar59 + 1;
                                    iVar72 = iVar72 + 8;
                                    uVar105 = uVar108 & 0xfffffff8;
                                  } while (iVar72 < (int)uVar108);
                                }
                                uVar95 = uVar105 | 3;
                                while ((int)uVar95 < (int)uVar108) {
                                  *(undefined1 (*) [16])*pauVar86 = *(undefined1 (*) [16])*pauVar59;
                                  pauVar86 = (undefined1 (*) [32])(*pauVar86 + 0x10);
                                  pauVar59 = (undefined1 (*) [32])(*pauVar59 + 0x10);
                                  uVar95 = uVar105 + 7;
                                  uVar105 = uVar105 + 4;
                                }
                                uVar95 = uVar105 | 1;
                                while ((int)uVar95 < (int)uVar108) {
                                  *(undefined8 *)*pauVar86 = *(undefined8 *)*pauVar59;
                                  pauVar86 = (undefined1 (*) [32])(*pauVar86 + 8);
                                  pauVar59 = (undefined1 (*) [32])(*pauVar59 + 8);
                                  uVar95 = uVar105 + 3;
                                  uVar105 = uVar105 + 2;
                                }
                                if ((int)uVar105 < (int)uVar108) {
                                  lVar68 = 0;
                                  do {
                                    *(undefined4 *)(*pauVar86 + lVar68 * 4) =
                                         *(undefined4 *)*pauVar59;
                                    pauVar59 = (undefined1 (*) [32])(*pauVar59 + 4);
                                    lVar68 = lVar68 + 1;
                                  } while (uVar108 - uVar105 != (int)lVar68);
                                }
                                lVar56 = lVar56 + 1;
                              } while (lVar56 != lVar76);
                            }
                          }
                          else {
                            unpack_output_tile_int32_avx2
                                      (&m,&local_328,local_348._0_4_,uVar97,iVar54,uVar108);
                          }
                          iVar54 = iVar54 + TILE_N;
                        } while (iVar54 < (int)uVar114);
                      }
                      piVar81 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
                      if (piVar81 != (int *)0x0) {
                        LOCK();
                        *piVar81 = *piVar81 + -1;
                        UNLOCK();
                        if (*piVar81 == 0) {
                          if (m.allocator == (Allocator *)0x0) {
                            if (m.data != (void *)0x0) {
                              free(m.data);
                            }
                          }
                          else {
                            (*(m.allocator)->_vptr_Allocator[3])();
                          }
                        }
                      }
                      m.cstep = 0;
                      m.data = (void *)0x0;
                      m.refcount._0_4_ = 0;
                      m.refcount._4_4_ = 0;
                      m.elemsize = 0;
                      m.elempack = 0;
                      m.dims = 0;
                      m.w = 0;
                      m.h = 0;
                      m.d = 0;
                      m.c = 0;
                      iVar51 = iVar51 + 1;
                    } while (iVar51 != (int)local_3f0);
                  }
                  local_498 = 0;
                }
                piVar81 = (int *)CONCAT44(local_248.refcount._4_4_,local_248.refcount._0_4_);
                if (piVar81 != (int *)0x0) {
                  LOCK();
                  *piVar81 = *piVar81 + -1;
                  UNLOCK();
                  if (*piVar81 == 0) {
                    if (local_248.allocator == (Allocator *)0x0) {
                      if (local_248.data != (void *)0x0) {
                        free(local_248.data);
                      }
                    }
                    else {
                      (*(local_248.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
                local_248.cstep = 0;
                local_248.data = (void *)0x0;
                local_248.refcount._0_4_ = 0;
                local_248.refcount._4_4_ = 0;
                local_248.elemsize = 0;
                local_248.elempack = 0;
                local_248.dims = 0;
                local_248.w = 0;
                local_248.h = 0;
                local_248.d = 0;
                local_248.c = 0;
              }
              piVar81 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
              if (piVar81 != (int *)0x0) {
                LOCK();
                *piVar81 = *piVar81 + -1;
                UNLOCK();
                if (*piVar81 == 0) {
                  if (opt_q._32_8_ == 0) {
                    if (opt_q._0_8_ != 0) {
                      free((void *)opt_q._0_8_);
                    }
                  }
                  else {
                    (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
                  }
                }
              }
              local_298[0] = 0;
              opt_q.lightmode = false;
              opt_q.use_shader_pack8 = false;
              opt_q.use_subgroup_ops = false;
              opt_q.use_reserved_0 = false;
              opt_q.num_threads = 0;
              opt_q.blob_allocator._0_4_ = 0;
              opt_q.blob_allocator._4_4_ = 0;
              opt_q.workspace_allocator = (Allocator *)0x0;
              opt_q.openmp_blocktime = 0;
              opt_q.vulkan_device_index = 0;
              opt_q.use_reserved_1 = false;
              opt_q.use_image_storage = false;
              opt_q.use_tensor_storage = false;
              opt_q.use_reserved_2 = false;
              opt_q.flush_denormals = 0;
              opt_q.use_local_pool_allocator = false;
              opt_q.use_shader_local_memory = false;
              opt_q.use_cooperative_matrix = false;
              opt_q.use_winograd23_convolution = false;
              opt_q.use_winograd43_convolution = false;
              opt_q.use_winograd63_convolution = false;
              opt_q.use_a53_a55_optimized_kernel = false;
              opt_q.use_fp16_uniform = false;
            }
            else {
              iVar54 = cpu_support_x86_avx2();
              if (iVar54 == 0) {
                iVar72 = cpu_support_x86_xop();
                iVar71 = local_3b8.w;
                iVar54 = local_3b8.elempack;
                uVar63 = local_3d8._4_4_;
                if (iVar72 == 0) {
                  uVar105 = local_3b8.c * local_3b8.elempack;
                  iVar72 = (int)local_3b8.cstep * local_3b8.elempack;
                  local_2e0 = CONCAT44(local_2e0._4_4_,local_328.w);
                  local_350 = (void *)CONCAT44(local_350._4_4_,local_328.h);
                  local_3c8 = CONCAT44(local_3c8._4_4_,local_328.elempack);
                  uVar95 = local_328.c * local_328.elempack;
                  uVar108 = local_3d8._4_4_ * auVar128._0_4_;
                  uVar114 = CONCAT44(0,uVar108);
                  std::vector<int,_std::allocator<int>_>::vector
                            ((vector<int,_std::allocator<int>_> *)&opt_q,(long)(int)uVar108,
                             (allocator_type *)&local_248);
                  if (0 < (int)uVar63) {
                    iVar87 = local_3d8._8_4_;
                    iVar100 = 0;
                    iVar73 = 0;
                    iVar66 = 0;
                    do {
                      if (0 < (int)auVar128._0_4_) {
                        iVar84 = iVar54 * iVar73;
                        lVar76 = 0;
                        do {
                          *(int *)(opt_q._0_8_ + (long)iVar100 * 4 + lVar76 * 4) = iVar84;
                          iVar73 = iVar73 + iVar87;
                          lVar76 = lVar76 + 1;
                          iVar84 = iVar84 + iVar87 * iVar54;
                        } while (auVar128._0_4_ != (int)lVar76);
                        iVar100 = iVar100 + (int)lVar76;
                      }
                      iVar73 = iVar73 + (iVar71 * local_3d8._12_4_ - iVar87 * auVar128._0_4_);
                      iVar66 = iVar66 + 1;
                    } while (iVar66 != uVar63);
                  }
                  uVar106 = uVar95 + 3;
                  if (-1 < (int)uVar95) {
                    uVar106 = uVar95;
                  }
                  uVar106 = (int)uVar106 >> 2;
                  local_3d8._0_8_ = uVar114;
                  if (3 < (int)uVar95) {
                    iVar71 = iVar54 * uVar97;
                    local_338 = CONCAT44(local_338._4_4_,iVar71);
                    local_58 = (ulong)uVar106;
                    lVar61 = uVar114 * 0x20;
                    local_348._0_8_ = lVar61;
                    lVar76 = uVar114 * 8;
                    lVar55 = uVar114 * 4;
                    uVar77 = 0;
                    do {
                      local_3e0 = uVar77;
                      iVar87 = (int)local_3b8.cstep * iVar54;
                      local_410 = (undefined1 (*) [16])
                                  ((long)(((int)local_3e0 * 4) / (int)local_3c8) * local_328.cstep *
                                   local_328.elemsize + (long)local_328.data);
                      uVar65 = (int)local_3c8 * (int)local_328.cstep;
                      local_60 = (ulong)uVar65;
                      local_3e8 = (void *)CONCAT44(local_3e8._4_4_,local_328.w);
                      uVar82 = local_328.h * local_328.w;
                      if ((int)uVar82 < 4) {
                        uVar52 = 0;
                      }
                      else {
                        lVar93 = (long)iVar87;
                        lVar56 = lVar93 * 3;
                        lVar68 = lVar93 * 5;
                        lVar75 = lVar93 * 6;
                        lVar85 = lVar93 * 7;
                        local_d0 = (ulong)(int)uVar65;
                        local_d8 = (long)(int)(uVar65 + 3);
                        local_e0 = (ulong)(int)(uVar65 * 2);
                        local_38 = (long)(int)(uVar65 * 3);
                        local_40 = (long)(int)(uVar65 * 3 + 1);
                        local_48 = (long)(int)(uVar65 * 3 + 2);
                        local_50 = (long)(int)(uVar65 * 3 + 3);
                        uVar77 = 0;
                        do {
                          local_370 = uVar77;
                          uVar83 = (uint)local_370;
                          iVar109 = (int)uVar83 / local_328.w;
                          local_3c0 = (int)uVar83 % local_328.w;
                          uVar77 = CONCAT44((int)(uVar83 | 1) >> 0x1f,uVar83) | 1;
                          local_3bc = (uint)((long)uVar77 % (long)local_328.w);
                          uVar62 = CONCAT44((int)(uVar83 | 2) >> 0x1f,uVar83) | 2;
                          uVar80 = CONCAT44((int)(uVar83 | 3) >> 0x1f,uVar83) | 3;
                          iVar100 = (int)((long)uVar80 / (long)local_328.w);
                          iVar73 = (int)((long)uVar80 % (long)local_328.w);
                          pvVar57 = (void *)((this->weight_data_tm).cstep * local_3e0 *
                                             (this->weight_data_tm).elemsize +
                                            (long)(this->weight_data_tm).data);
                          auVar133 = ZEXT1664((undefined1  [16])0x0);
                          iVar84 = (int)((long)uVar62 / (long)local_328.w);
                          local_3f0 = CONCAT44(local_3f0._4_4_,iVar84);
                          iVar66 = (int)((long)uVar77 / (long)local_328.w);
                          local_3f8 = (void *)CONCAT44(local_3f8._4_4_,iVar66);
                          local_330 = (void *)CONCAT44(local_330._4_4_,iVar73);
                          local_364 = (int)((long)uVar62 % (long)local_328.w);
                          local_250 = CONCAT44(local_250._4_4_,iVar100);
                          if ((int)uVar105 < 8) {
                            uVar77 = 0;
                            auVar138 = ZEXT1664((undefined1  [16])0x0);
                            auVar145 = ZEXT1664((undefined1  [16])0x0);
                            auVar141 = ZEXT1664((undefined1  [16])0x0);
                          }
                          else {
                            lVar110 = (long)local_3b8.w * local_3b8.elemsize;
                            auVar141 = ZEXT1664((undefined1  [16])0x0);
                            auVar145 = ZEXT1664((undefined1  [16])0x0);
                            auVar138 = ZEXT1664((undefined1  [16])0x0);
                            iVar78 = 0;
                            do {
                              if (0 < (int)uVar108) {
                                lVar96 = (long)(iVar78 / iVar54) *
                                         local_3b8.cstep * local_3b8.elemsize;
                                lVar112 = 0;
                                do {
                                  lVar103 = (long)*(int *)(opt_q._0_8_ + lVar112);
                                  puVar98 = (ulong *)((long)local_3b8.data +
                                                     lVar103 + lVar96 + (iVar109 * iVar51) * lVar110
                                                                        + (long)(int)(local_3c0 *
                                                                                     iVar71));
                                  puVar69 = (ulong *)((long)local_3b8.data +
                                                     lVar103 + lVar96 + (iVar66 * iVar51) * lVar110
                                                                        + (long)(int)(local_3bc *
                                                                                     iVar71));
                                  puVar2 = (ulong *)((long)local_3b8.data +
                                                    lVar103 + lVar96 + (iVar84 * iVar51) * lVar110 +
                                                                       (long)(local_364 * iVar71));
                                  puVar104 = (ulong *)((long)local_3b8.data +
                                                      lVar103 + lVar96 + (iVar100 * iVar51) *
                                                                         lVar110 + (long)(iVar73 * 
                                                  iVar71));
                                  if (iVar54 == 8) {
                                    auVar129._8_8_ = 0;
                                    auVar129._0_8_ = *puVar98;
                                    auVar158._8_8_ = 0;
                                    auVar158._0_8_ = *puVar69;
                                    auVar149._8_8_ = 0;
                                    auVar149._0_8_ = *puVar2;
                                    auVar182._8_8_ = 0;
                                    auVar182._0_8_ = *puVar104;
                                  }
                                  else {
                                    auVar122 = vpinsrb_avx(ZEXT116((byte)*puVar98),
                                                           (uint)*(byte *)((long)puVar98 + lVar93),1
                                                          );
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar98 +
                                                                                   lVar93 * 2),2);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar98 +
                                                                                   lVar56),3);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar98 +
                                                                                   lVar93 * 4),4);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar98 +
                                                                                   lVar68),5);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar98 +
                                                                                   lVar75),6);
                                    auVar129 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar98 +
                                                                                   lVar85),7);
                                    auVar122 = vpinsrb_avx(ZEXT116((byte)*puVar69),
                                                           (uint)*(byte *)((long)puVar69 + lVar93),1
                                                          );
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar69 +
                                                                                   lVar93 * 2),2);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar69 +
                                                                                   lVar56),3);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar69 +
                                                                                   lVar93 * 4),4);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar69 +
                                                                                   lVar68),5);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar69 +
                                                                                   lVar75),6);
                                    auVar158 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar69 +
                                                                                   lVar85),7);
                                    auVar122 = vpinsrb_avx(ZEXT116((byte)*puVar2),
                                                           (uint)*(byte *)((long)puVar2 + lVar93),1)
                                    ;
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar2 +
                                                                                   lVar93 * 2),2);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar2 +
                                                                                   lVar56),3);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar2 +
                                                                                   lVar93 * 4),4);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar2 +
                                                                                   lVar68),5);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar2 +
                                                                                   lVar75),6);
                                    auVar149 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar2 +
                                                                                   lVar85),7);
                                    auVar122 = vpinsrb_avx(ZEXT116((byte)*puVar104),
                                                           (uint)*(byte *)((long)puVar104 + lVar93),
                                                           1);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar104 +
                                                                                   lVar93 * 2),2);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar104 +
                                                                                   lVar56),3);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar104 +
                                                                                   lVar93 * 4),4);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar104 +
                                                                                   lVar68),5);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar104 +
                                                                                   lVar75),6);
                                    auVar182 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar104 +
                                                                                   lVar85),7);
                                  }
                                  auVar168 = vpmovsxbw_avx(auVar129);
                                  auVar169 = vpmovsxbw_avx(auVar158);
                                  auVar14 = vpmovsxbw_avx(auVar149);
                                  auVar148 = vpmovsxbw_avx(auVar182);
                                  auVar122 = *(undefined1 (*) [16])((long)pvVar57 + lVar112 * 8);
                                  auVar128 = *(undefined1 (*) [16])
                                              ((long)pvVar57 + lVar112 * 8 + 0x10);
                                  auVar129 = vpcmpgtb_avx((undefined1  [16])0x0,auVar122);
                                  auVar158 = vpcmpgtb_avx((undefined1  [16])0x0,auVar128);
                                  auVar149 = vpunpcklbw_avx(auVar122,auVar129);
                                  auVar147 = vpunpckhbw_avx(auVar122,auVar129);
                                  auVar13 = vpunpcklbw_avx(auVar128,auVar158);
                                  auVar12 = vpunpckhbw_avx(auVar128,auVar158);
                                  auVar122 = vpshufd_avx(auVar168,0);
                                  auVar122 = vpmaddwd_avx(auVar122,auVar149);
                                  auVar122 = vpaddd_avx(auVar122,auVar141._0_16_);
                                  auVar128 = vpshufd_avx(auVar169,0);
                                  auVar128 = vpmaddwd_avx(auVar128,auVar149);
                                  auVar128 = vpaddd_avx(auVar128,auVar145._0_16_);
                                  auVar129 = vpshufd_avx(auVar14,0);
                                  auVar129 = vpmaddwd_avx(auVar129,auVar149);
                                  auVar129 = vpaddd_avx(auVar129,auVar138._0_16_);
                                  auVar158 = vpshufd_avx(auVar148,0);
                                  auVar158 = vpmaddwd_avx(auVar158,auVar149);
                                  auVar158 = vpaddd_avx(auVar158,auVar133._0_16_);
                                  auVar149 = vpshufd_avx(auVar168,0x55);
                                  auVar149 = vpmaddwd_avx(auVar149,auVar147);
                                  auVar182 = vpshufd_avx(auVar169,0x55);
                                  auVar182 = vpmaddwd_avx(auVar182,auVar147);
                                  auVar167 = vpshufd_avx(auVar14,0x55);
                                  auVar167 = vpmaddwd_avx(auVar167,auVar147);
                                  auVar162 = vpshufd_avx(auVar148,0x55);
                                  auVar162 = vpmaddwd_avx(auVar162,auVar147);
                                  auVar147 = vpshufd_avx(auVar168,0xaa);
                                  auVar147 = vpmaddwd_avx(auVar147,auVar13);
                                  auVar149 = vpaddd_avx(auVar149,auVar147);
                                  auVar122 = vpaddd_avx(auVar149,auVar122);
                                  auVar149 = vpshufd_avx(auVar169,0xaa);
                                  auVar149 = vpmaddwd_avx(auVar149,auVar13);
                                  auVar149 = vpaddd_avx(auVar182,auVar149);
                                  auVar128 = vpaddd_avx(auVar149,auVar128);
                                  auVar149 = vpshufd_avx(auVar14,0xaa);
                                  auVar149 = vpmaddwd_avx(auVar149,auVar13);
                                  auVar149 = vpaddd_avx(auVar167,auVar149);
                                  auVar129 = vpaddd_avx(auVar149,auVar129);
                                  auVar149 = vpshufd_avx(auVar148,0xaa);
                                  auVar149 = vpmaddwd_avx(auVar149,auVar13);
                                  auVar149 = vpaddd_avx(auVar162,auVar149);
                                  auVar158 = vpaddd_avx(auVar149,auVar158);
                                  auVar149 = vpshufd_avx(auVar168,0xff);
                                  auVar149 = vpmaddwd_avx(auVar149,auVar12);
                                  auVar122 = vpaddd_avx(auVar149,auVar122);
                                  auVar141 = ZEXT1664(auVar122);
                                  auVar122 = vpshufd_avx(auVar169,0xff);
                                  auVar122 = vpmaddwd_avx(auVar12,auVar122);
                                  auVar122 = vpaddd_avx(auVar128,auVar122);
                                  auVar145 = ZEXT1664(auVar122);
                                  auVar122 = vpshufd_avx(auVar14,0xff);
                                  auVar122 = vpmaddwd_avx(auVar12,auVar122);
                                  auVar122 = vpaddd_avx(auVar129,auVar122);
                                  auVar138 = ZEXT1664(auVar122);
                                  auVar122 = vpshufd_avx(auVar148,0xff);
                                  auVar122 = vpmaddwd_avx(auVar12,auVar122);
                                  auVar122 = vpaddd_avx(auVar158,auVar122);
                                  auVar133 = ZEXT1664(auVar122);
                                  lVar112 = lVar112 + 4;
                                } while (lVar55 != lVar112);
                                pvVar57 = (void *)((long)pvVar57 + lVar61);
                              }
                              iVar89 = iVar78 + 0xf;
                              iVar78 = iVar78 + 8;
                            } while (iVar89 < (int)uVar105);
                            uVar77 = (ulong)uVar105 & 0xfffffff8;
                          }
                          if ((int)((uint)uVar77 | 1) < (int)uVar105) {
                            lVar110 = (long)local_3b8.w * local_3b8.elemsize;
                            do {
                              if (0 < (int)uVar108) {
                                lVar67 = local_3b8.cstep * local_3b8.elemsize * uVar77;
                                lVar112 = lVar67 + (iVar109 * iVar51) * lVar110 +
                                                   (long)(int)(local_3c0 * uVar97);
                                lVar96 = lVar67 + (iVar66 * iVar51) * lVar110 +
                                                  (long)(int)(local_3bc * uVar97);
                                lVar103 = lVar67 + (iVar84 * iVar51) * lVar110 +
                                                   (long)(int)(local_364 * uVar97);
                                lVar67 = lVar67 + (iVar100 * iVar51) * lVar110 +
                                                  (long)(int)(iVar73 * uVar97);
                                uVar62 = 0;
                                do {
                                  lVar60 = (long)*(int *)(opt_q._0_8_ + uVar62 * 4);
                                  auVar122 = vpinsrb_avx(ZEXT116(*(byte *)((long)local_3b8.data +
                                                                          lVar60 + lVar112)),
                                                         (uint)*(byte *)((long)local_3b8.data +
                                                                        lVar93 + lVar60 + lVar112),1
                                                        );
                                  auVar122 = vpmovsxbw_avx(auVar122);
                                  auVar129 = vpshufd_avx(auVar122,0);
                                  auVar122 = vpinsrb_avx(ZEXT116(*(byte *)((long)local_3b8.data +
                                                                          lVar60 + lVar96)),
                                                         (uint)*(byte *)((long)local_3b8.data +
                                                                        lVar93 + lVar60 + lVar96),1)
                                  ;
                                  auVar122 = vpmovsxbw_avx(auVar122);
                                  auVar158 = vpshufd_avx(auVar122,0);
                                  auVar122 = vpinsrb_avx(ZEXT116(*(byte *)((long)local_3b8.data +
                                                                          lVar60 + lVar103)),
                                                         (uint)*(byte *)((long)local_3b8.data +
                                                                        lVar93 + lVar60 + lVar103),1
                                                        );
                                  auVar122 = vpmovsxbw_avx(auVar122);
                                  auVar149 = vpshufd_avx(auVar122,0);
                                  auVar122 = vpinsrb_avx(ZEXT116(*(byte *)((long)local_3b8.data +
                                                                          lVar60 + lVar67)),
                                                         (uint)*(byte *)((long)local_3b8.data +
                                                                        lVar93 + lVar60 + lVar67),1)
                                  ;
                                  auVar122 = vpmovsxbw_avx(auVar122);
                                  auVar182 = vpshufd_avx(auVar122,0);
                                  auVar167._8_8_ = 0;
                                  auVar167._0_8_ = *(ulong *)((long)pvVar57 + uVar62 * 8);
                                  auVar128 = vpmovsxbw_avx(auVar167);
                                  auVar122 = vpmaddwd_avx(auVar128,auVar129);
                                  auVar122 = vpaddd_avx(auVar122,auVar141._0_16_);
                                  auVar141 = ZEXT1664(auVar122);
                                  auVar122 = vpmaddwd_avx(auVar128,auVar158);
                                  auVar122 = vpaddd_avx(auVar122,auVar145._0_16_);
                                  auVar145 = ZEXT1664(auVar122);
                                  auVar122 = vpmaddwd_avx(auVar128,auVar149);
                                  auVar122 = vpaddd_avx(auVar122,auVar138._0_16_);
                                  auVar138 = ZEXT1664(auVar122);
                                  auVar122 = vpmaddwd_avx(auVar182,auVar128);
                                  auVar122 = vpaddd_avx(auVar122,auVar133._0_16_);
                                  auVar133 = ZEXT1664(auVar122);
                                  uVar62 = uVar62 + 1;
                                } while (uVar114 != uVar62);
                                pvVar57 = (void *)((long)pvVar57 + lVar76);
                              }
                              uVar77 = uVar77 + 2;
                            } while ((int)((uint)uVar77 | 1) < (int)uVar105);
                          }
                          auVar122 = auVar133._0_16_;
                          auVar128 = auVar138._0_16_;
                          auVar158 = auVar145._0_16_;
                          auVar129 = auVar141._0_16_;
                          if ((int)uVar77 < (int)uVar105) {
                            lVar110 = (long)local_3b8.w * local_3b8.elemsize;
                            uVar77 = uVar77 & 0xffffffff;
                            do {
                              if (0 < (int)uVar108) {
                                lVar112 = local_3b8.cstep * local_3b8.elemsize * uVar77;
                                uVar62 = 0;
                                do {
                                  lVar96 = (long)*(int *)(opt_q._0_8_ + uVar62 * 4);
                                  auVar122 = vpshuflw_avx(ZEXT416((uint)(int)*(char *)((long)
                                                  local_3b8.data +
                                                  lVar96 + lVar112 + (iVar109 * iVar51) * lVar110 +
                                                                     (long)(int)(local_3c0 * uVar97)
                                                  )),0);
                                  auVar122 = vpshufd_avx(auVar122,0);
                                  auVar128 = vpshuflw_avx(ZEXT416((uint)(int)*(char *)((long)
                                                  local_3b8.data +
                                                  lVar96 + lVar112 + (iVar66 * iVar51) * lVar110 +
                                                                     (long)(int)(local_3bc * uVar97)
                                                  )),0);
                                  auVar158 = vpshufd_avx(auVar128,0);
                                  auVar128 = vpshuflw_avx(ZEXT416((uint)(int)*(char *)((long)
                                                  local_3b8.data +
                                                  lVar96 + lVar112 + (iVar84 * iVar51) * lVar110 +
                                                                     (long)(int)(local_364 * uVar97)
                                                  )),0);
                                  auVar149 = vpshufd_avx(auVar128,0);
                                  auVar128 = vpshuflw_avx(ZEXT416((uint)(int)*(char *)((long)
                                                  local_3b8.data +
                                                  lVar96 + lVar112 + (iVar100 * iVar51) * lVar110 +
                                                                     (long)(int)(iVar73 * uVar97))),
                                                  0);
                                  auVar182 = vpshufd_avx(auVar128,0);
                                  auVar162._8_8_ = 0;
                                  auVar162._0_8_ = *(ulong *)((long)pvVar57 + uVar62 * 4);
                                  auVar128 = vpmovsxbw_avx(auVar162);
                                  auVar129 = vpmullw_avx(auVar128,auVar122);
                                  auVar122 = vpmulhw_avx(auVar128,auVar122);
                                  auVar122 = vpunpcklwd_avx(auVar129,auVar122);
                                  auVar122 = vpaddd_avx(auVar141._0_16_,auVar122);
                                  auVar141 = ZEXT1664(auVar122);
                                  auVar129 = vpmullw_avx(auVar128,auVar158);
                                  auVar122 = vpmulhw_avx(auVar128,auVar158);
                                  auVar122 = vpunpcklwd_avx(auVar129,auVar122);
                                  auVar122 = vpaddd_avx(auVar145._0_16_,auVar122);
                                  auVar145 = ZEXT1664(auVar122);
                                  auVar129 = vpmullw_avx(auVar128,auVar149);
                                  auVar122 = vpmulhw_avx(auVar128,auVar149);
                                  auVar122 = vpunpcklwd_avx(auVar129,auVar122);
                                  auVar122 = vpaddd_avx(auVar138._0_16_,auVar122);
                                  auVar138 = ZEXT1664(auVar122);
                                  auVar129 = vpmullw_avx(auVar182,auVar128);
                                  auVar122 = vpmulhw_avx(auVar182,auVar128);
                                  auVar122 = vpunpcklwd_avx(auVar129,auVar122);
                                  auVar122 = vpaddd_avx(auVar133._0_16_,auVar122);
                                  auVar133 = ZEXT1664(auVar122);
                                  uVar62 = uVar62 + 1;
                                } while (uVar114 != uVar62);
                                pvVar57 = (void *)((long)pvVar57 + lVar55);
                              }
                              auVar122 = auVar133._0_16_;
                              auVar128 = auVar138._0_16_;
                              auVar158 = auVar145._0_16_;
                              auVar129 = auVar141._0_16_;
                              uVar77 = uVar77 + 1;
                            } while ((int)uVar77 < (int)uVar105);
                          }
                          if ((int)local_3c8 == 4) {
                            *local_410 = auVar129;
                            local_410[1] = auVar158;
                            local_410[2] = auVar128;
                            local_410[3] = auVar122;
                            local_410 = local_410 + 4;
                          }
                          if ((int)local_3c8 == 1) {
                            auVar149 = vpunpckldq_avx(auVar129,auVar158);
                            auVar182 = vpunpcklqdq_avx(auVar149,auVar128);
                            auVar149 = vpshufd_avx(auVar122,0);
                            auVar149 = vpblendw_avx(auVar182,auVar149,0xc0);
                            *local_410 = auVar149;
                            *(int *)(*local_410 + local_d0 * 4) = auVar129._4_4_;
                            *(int *)(*local_410 + (long)(int)(uVar65 + 1) * 4) = auVar158._4_4_;
                            *(int *)(*local_410 + (long)(int)(uVar65 + 2) * 4) = auVar128._4_4_;
                            *(int *)(*local_410 + local_d8 * 4) = auVar122._4_4_;
                            auVar149 = vpunpckhdq_avx(auVar129,auVar158);
                            *(long *)(*local_410 + local_e0 * 4) = auVar149._0_8_;
                            auVar149 = vpunpckhdq_avx(auVar128,auVar122);
                            *(long *)(*local_410 + (long)(int)(uVar65 * 2 + 2) * 4) = auVar149._0_8_
                            ;
                            *(int *)(*local_410 + local_38 * 4) = auVar129._12_4_;
                            *(int *)(*local_410 + local_40 * 4) = auVar158._12_4_;
                            *(int *)(*local_410 + local_48 * 4) = auVar128._12_4_;
                            *(int *)(*local_410 + local_50 * 4) = auVar122._12_4_;
                            local_410 = local_410 + 1;
                          }
                          uVar52 = uVar83 + 4;
                          uVar77 = (ulong)uVar52;
                        } while ((int)(uVar83 + 7) < (int)uVar82);
                      }
                      uVar83 = uVar52 | 1;
                      if ((int)uVar83 < (int)uVar82) {
                        lVar56 = (long)iVar87;
                        local_3f0 = (ulong)(int)(uVar65 * 2);
                        local_3f8 = (void *)(long)(int)(uVar65 * 3);
                        local_370 = (ulong)(int)(uVar65 * 3 + 1);
                        uVar90 = uVar52;
                        do {
                          iVar66 = (int)uVar90 / local_328.w;
                          iVar84 = (int)uVar90 % local_328.w;
                          iVar100 = (int)uVar83 / local_328.w;
                          iVar73 = (int)uVar83 % local_328.w;
                          pvVar57 = (void *)((this->weight_data_tm).cstep * local_3e0 *
                                             (this->weight_data_tm).elemsize +
                                            (long)(this->weight_data_tm).data);
                          if ((int)uVar105 < 8) {
                            uVar77 = 0;
                            auVar122 = (undefined1  [16])0x0;
                            auVar128 = (undefined1  [16])0x0;
                            auVar138 = ZEXT1664((undefined1  [16])0x0);
                            auVar133 = ZEXT1664((undefined1  [16])0x0);
                          }
                          else {
                            auVar133 = ZEXT1664((undefined1  [16])0x0);
                            auVar138 = ZEXT1664((undefined1  [16])0x0);
                            auVar145 = ZEXT1664((undefined1  [16])0x0);
                            auVar141 = ZEXT1664((undefined1  [16])0x0);
                            iVar109 = 0;
                            do {
                              if (0 < (int)uVar108) {
                                lVar68 = (long)(iVar109 / iVar54) *
                                         local_3b8.cstep * local_3b8.elemsize;
                                lVar75 = 0;
                                do {
                                  puVar98 = (ulong *)((long)local_3b8.data +
                                                     (long)*(int *)(opt_q._0_8_ + lVar75) +
                                                     lVar68 + (long)(iVar66 * iVar51) *
                                                              (long)local_3b8.w * local_3b8.elemsize
                                                              + (long)(iVar84 * iVar71));
                                  puVar69 = (ulong *)((long)local_3b8.data +
                                                     (long)*(int *)(opt_q._0_8_ + lVar75) +
                                                     lVar68 + (long)(iVar100 * iVar51) *
                                                              (long)local_3b8.w * local_3b8.elemsize
                                                              + (long)(iVar73 * iVar71));
                                  if (iVar54 == 8) {
                                    auVar147._8_8_ = 0;
                                    auVar147._0_8_ = *puVar98;
                                    auVar168._8_8_ = 0;
                                    auVar168._0_8_ = *puVar69;
                                  }
                                  else {
                                    auVar122 = vpinsrb_avx(ZEXT116((byte)*puVar98),
                                                           (uint)*(byte *)((long)puVar98 + lVar56),1
                                                          );
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar98 +
                                                                                   lVar56 * 2),2);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar98 +
                                                                                   lVar56 * 3),3);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar98 +
                                                                                   lVar56 * 4),4);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar98 +
                                                                                   lVar56 * 5),5);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar98 +
                                                                                   lVar56 * 6),6);
                                    auVar147 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar98 +
                                                                                   lVar56 * 7),7);
                                    auVar122 = vpinsrb_avx(ZEXT116((byte)*puVar69),
                                                           (uint)*(byte *)((long)puVar69 + lVar56),1
                                                          );
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar69 +
                                                                                   lVar56 * 2),2);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar69 +
                                                                                   lVar56 * 3),3);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar69 +
                                                                                   lVar56 * 4),4);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar69 +
                                                                                   lVar56 * 5),5);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar69 +
                                                                                   lVar56 * 6),6);
                                    auVar168 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar69 +
                                                                                   lVar56 * 7),7);
                                  }
                                  auVar182 = vpmovsxbw_avx(auVar147);
                                  auVar167 = vpmovsxbw_avx(auVar168);
                                  auVar122 = *(undefined1 (*) [16])((long)pvVar57 + lVar75 * 8);
                                  auVar128 = *(undefined1 (*) [16])
                                              ((long)pvVar57 + lVar75 * 8 + 0x10);
                                  auVar129 = vpcmpgtb_avx((undefined1  [16])0x0,auVar122);
                                  auVar158 = vpcmpgtb_avx((undefined1  [16])0x0,auVar128);
                                  auVar147 = vpunpcklbw_avx(auVar122,auVar129);
                                  auVar149 = vpunpckhbw_avx(auVar122,auVar129);
                                  auVar168 = vpunpcklbw_avx(auVar128,auVar158);
                                  auVar162 = vpunpckhbw_avx(auVar128,auVar158);
                                  auVar122 = vpshufd_avx(auVar182,0);
                                  auVar122 = vpmaddwd_avx(auVar122,auVar147);
                                  auVar122 = vpaddd_avx(auVar122,auVar133._0_16_);
                                  auVar128 = vpshufd_avx(auVar167,0);
                                  auVar128 = vpmaddwd_avx(auVar128,auVar147);
                                  auVar128 = vpaddd_avx(auVar128,auVar138._0_16_);
                                  auVar129 = vpshufd_avx(auVar182,0x55);
                                  auVar129 = vpmaddwd_avx(auVar129,auVar149);
                                  auVar129 = vpaddd_avx(auVar129,auVar145._0_16_);
                                  auVar158 = vpshufd_avx(auVar167,0x55);
                                  auVar158 = vpmaddwd_avx(auVar158,auVar149);
                                  auVar158 = vpaddd_avx(auVar158,auVar141._0_16_);
                                  auVar149 = vpshufd_avx(auVar182,0xaa);
                                  auVar149 = vpmaddwd_avx(auVar168,auVar149);
                                  auVar122 = vpaddd_avx(auVar122,auVar149);
                                  auVar133 = ZEXT1664(auVar122);
                                  auVar122 = vpshufd_avx(auVar167,0xaa);
                                  auVar122 = vpmaddwd_avx(auVar168,auVar122);
                                  auVar122 = vpaddd_avx(auVar128,auVar122);
                                  auVar138 = ZEXT1664(auVar122);
                                  auVar122 = vpshufd_avx(auVar182,0xff);
                                  auVar122 = vpmaddwd_avx(auVar162,auVar122);
                                  auVar122 = vpaddd_avx(auVar129,auVar122);
                                  auVar145 = ZEXT1664(auVar122);
                                  auVar122 = vpshufd_avx(auVar167,0xff);
                                  auVar122 = vpmaddwd_avx(auVar162,auVar122);
                                  auVar122 = vpaddd_avx(auVar158,auVar122);
                                  auVar141 = ZEXT1664(auVar122);
                                  lVar75 = lVar75 + 4;
                                } while (lVar55 != lVar75);
                                pvVar57 = (void *)((long)pvVar57 + lVar61);
                              }
                              auVar128 = auVar145._0_16_;
                              auVar122 = auVar141._0_16_;
                              iVar78 = iVar109 + 0xf;
                              iVar109 = iVar109 + 8;
                            } while (iVar78 < (int)uVar105);
                            uVar77 = (ulong)uVar105 & 0xfffffff8;
                          }
                          if ((int)((uint)uVar77 | 1) < (int)uVar105) {
                            do {
                              if (0 < (int)uVar108) {
                                lVar75 = local_3b8.cstep * local_3b8.elemsize * uVar77;
                                lVar68 = lVar75 + (long)(iVar66 * iVar51) *
                                                  (long)local_3b8.w * local_3b8.elemsize +
                                                  (long)(int)(iVar84 * uVar97);
                                lVar75 = lVar75 + (long)(iVar100 * iVar51) *
                                                  (long)local_3b8.w * local_3b8.elemsize +
                                                  (long)(int)(iVar73 * uVar97);
                                uVar62 = 0;
                                do {
                                  lVar85 = (long)*(int *)(opt_q._0_8_ + uVar62 * 4);
                                  auVar129 = vpinsrb_avx(ZEXT116(*(byte *)((long)local_3b8.data +
                                                                          lVar85 + lVar68)),
                                                         (uint)*(byte *)((long)local_3b8.data +
                                                                        lVar56 + lVar85 + lVar68),1)
                                  ;
                                  auVar129 = vpmovsxbw_avx(auVar129);
                                  auVar149 = vpshufd_avx(auVar129,0);
                                  auVar129 = vpinsrb_avx(ZEXT116(*(byte *)((long)local_3b8.data +
                                                                          lVar85 + lVar75)),
                                                         (uint)*(byte *)((long)local_3b8.data +
                                                                        lVar56 + lVar85 + lVar75),1)
                                  ;
                                  auVar129 = vpmovsxbw_avx(auVar129);
                                  auVar182 = vpshufd_avx(auVar129,0);
                                  auVar169._8_8_ = 0;
                                  auVar169._0_8_ = *(ulong *)((long)pvVar57 + uVar62 * 8);
                                  auVar158 = vpmovsxbw_avx(auVar169);
                                  auVar129 = vpmaddwd_avx(auVar149,auVar158);
                                  auVar129 = vpaddd_avx(auVar129,auVar133._0_16_);
                                  auVar133 = ZEXT1664(auVar129);
                                  auVar129 = vpmaddwd_avx(auVar182,auVar158);
                                  auVar129 = vpaddd_avx(auVar129,auVar138._0_16_);
                                  auVar138 = ZEXT1664(auVar129);
                                  uVar62 = uVar62 + 1;
                                } while (uVar114 != uVar62);
                                pvVar57 = (void *)((long)pvVar57 + lVar76);
                              }
                              uVar77 = uVar77 + 2;
                            } while ((int)((uint)uVar77 | 1) < (int)uVar105);
                          }
                          auVar158 = auVar138._0_16_;
                          auVar129 = auVar133._0_16_;
                          if ((int)uVar77 < (int)uVar105) {
                            uVar77 = uVar77 & 0xffffffff;
                            do {
                              if (0 < (int)uVar108) {
                                lVar68 = local_3b8.cstep * local_3b8.elemsize * uVar77;
                                uVar62 = 0;
                                do {
                                  lVar75 = (long)*(int *)(opt_q._0_8_ + uVar62 * 4);
                                  auVar129 = vpshuflw_avx(ZEXT416((uint)(int)*(char *)((long)
                                                  local_3b8.data +
                                                  lVar75 + lVar68 + (long)(iVar66 * iVar51) *
                                                                    (long)local_3b8.w *
                                                                    local_3b8.elemsize +
                                                                    (long)(int)(iVar84 * uVar97))),0
                                                  );
                                  auVar129 = vpshufd_avx(auVar129,0);
                                  auVar158 = vpshuflw_avx(ZEXT416((uint)(int)*(char *)((long)
                                                  local_3b8.data +
                                                  lVar75 + lVar68 + (long)(iVar100 * iVar51) *
                                                                    (long)local_3b8.w *
                                                                    local_3b8.elemsize +
                                                                    (long)(int)(iVar73 * uVar97))),0
                                                  );
                                  auVar182 = vpshufd_avx(auVar158,0);
                                  auVar14._8_8_ = 0;
                                  auVar14._0_8_ = *(ulong *)((long)pvVar57 + uVar62 * 4);
                                  auVar158 = vpmovsxbw_avx(auVar14);
                                  auVar149 = vpmullw_avx(auVar129,auVar158);
                                  auVar129 = vpmulhw_avx(auVar129,auVar158);
                                  auVar129 = vpunpcklwd_avx(auVar149,auVar129);
                                  auVar129 = vpaddd_avx(auVar133._0_16_,auVar129);
                                  auVar133 = ZEXT1664(auVar129);
                                  auVar149 = vpmullw_avx(auVar182,auVar158);
                                  auVar129 = vpmulhw_avx(auVar182,auVar158);
                                  auVar129 = vpunpcklwd_avx(auVar149,auVar129);
                                  auVar129 = vpaddd_avx(auVar138._0_16_,auVar129);
                                  auVar138 = ZEXT1664(auVar129);
                                  uVar62 = uVar62 + 1;
                                } while (uVar114 != uVar62);
                                pvVar57 = (void *)((long)pvVar57 + lVar55);
                              }
                              auVar158 = auVar138._0_16_;
                              auVar129 = auVar133._0_16_;
                              uVar77 = uVar77 + 1;
                            } while ((int)uVar77 < (int)uVar105);
                          }
                          auVar122 = vpaddd_avx(auVar158,auVar122);
                          auVar128 = vpaddd_avx(auVar129,auVar128);
                          if ((int)local_3c8 == 4) {
                            *local_410 = auVar128;
                            local_410[1] = auVar122;
                            local_410 = local_410 + 2;
                          }
                          if ((int)local_3c8 == 1) {
                            auVar129 = vpunpckldq_avx(auVar128,auVar122);
                            *(long *)*local_410 = auVar129._0_8_;
                            *(int *)(*local_410 + (long)(int)uVar65 * 4) = auVar128._4_4_;
                            *(int *)(*local_410 + (long)(int)(uVar65 + 1) * 4) = auVar122._4_4_;
                            auVar129 = vpunpckhdq_avx(auVar128,auVar122);
                            *(long *)(*local_410 + local_3f0 * 4) = auVar129._0_8_;
                            *(int *)(*local_410 + (long)local_3f8 * 4) = auVar128._12_4_;
                            *(int *)(*local_410 + local_370 * 4) = auVar122._12_4_;
                            local_410 = (undefined1 (*) [16])(*local_410 + 8);
                          }
                          uVar52 = uVar90 + 2;
                          uVar83 = uVar90 + 3;
                          uVar90 = uVar52;
                        } while ((int)uVar83 < (int)uVar82);
                      }
                      if ((int)uVar52 < (int)uVar82) {
                        lVar56 = (long)iVar87;
                        do {
                          iVar87 = (int)uVar52 / local_328.w;
                          iVar100 = (int)uVar52 % local_328.w;
                          pvVar57 = (void *)((this->weight_data_tm).cstep * local_3e0 *
                                             (this->weight_data_tm).elemsize +
                                            (long)(this->weight_data_tm).data);
                          if ((int)uVar105 < 8) {
                            uVar77 = 0;
                            auVar133 = ZEXT1664((undefined1  [16])0x0);
                          }
                          else {
                            auVar133 = ZEXT1664((undefined1  [16])0x0);
                            auVar138 = ZEXT1664((undefined1  [16])0x0);
                            auVar141 = ZEXT1664((undefined1  [16])0x0);
                            auVar145 = ZEXT1664((undefined1  [16])0x0);
                            iVar73 = 0;
                            do {
                              if (0 < (int)uVar108) {
                                lVar68 = 0;
                                do {
                                  puVar98 = (ulong *)((long)local_3b8.data +
                                                     (long)*(int *)(opt_q._0_8_ + lVar68) +
                                                     (long)(iVar73 / iVar54) *
                                                     local_3b8.cstep * local_3b8.elemsize +
                                                     (long)(iVar100 * iVar71) +
                                                     (long)local_3b8.w * local_3b8.elemsize *
                                                     (long)(iVar87 * iVar51));
                                  if (iVar54 == 8) {
                                    auVar148._8_8_ = 0;
                                    auVar148._0_8_ = *puVar98;
                                  }
                                  else {
                                    auVar122 = vpinsrb_avx(ZEXT116((byte)*puVar98),
                                                           (uint)*(byte *)((long)puVar98 + lVar56),1
                                                          );
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar98 +
                                                                                   lVar56 * 2),2);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar98 +
                                                                                   lVar56 * 3),3);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar98 +
                                                                                   lVar56 * 4),4);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar98 +
                                                                                   lVar56 * 5),5);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar98 +
                                                                                   lVar56 * 6),6);
                                    auVar148 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar98 +
                                                                                   lVar56 * 7),7);
                                  }
                                  auVar149 = vpmovsxbw_avx(auVar148);
                                  auVar122 = *(undefined1 (*) [16])((long)pvVar57 + lVar68 * 8);
                                  auVar128 = *(undefined1 (*) [16])
                                              ((long)pvVar57 + lVar68 * 8 + 0x10);
                                  auVar129 = vpcmpgtb_avx((undefined1  [16])0x0,auVar122);
                                  auVar158 = vpcmpgtb_avx((undefined1  [16])0x0,auVar128);
                                  auVar182 = vpunpcklbw_avx(auVar122,auVar129);
                                  auVar129 = vpunpckhbw_avx(auVar122,auVar129);
                                  auVar167 = vpunpcklbw_avx(auVar128,auVar158);
                                  auVar128 = vpunpckhbw_avx(auVar128,auVar158);
                                  auVar122 = vpshufd_avx(auVar149,0);
                                  auVar122 = vpmaddwd_avx(auVar122,auVar182);
                                  auVar122 = vpaddd_avx(auVar122,auVar133._0_16_);
                                  auVar133 = ZEXT1664(auVar122);
                                  auVar122 = vpshufd_avx(auVar149,0x55);
                                  auVar122 = vpmaddwd_avx(auVar122,auVar129);
                                  auVar122 = vpaddd_avx(auVar122,auVar138._0_16_);
                                  auVar138 = ZEXT1664(auVar122);
                                  auVar122 = vpshufd_avx(auVar149,0xaa);
                                  auVar122 = vpmaddwd_avx(auVar167,auVar122);
                                  auVar122 = vpaddd_avx(auVar122,auVar141._0_16_);
                                  auVar141 = ZEXT1664(auVar122);
                                  auVar122 = vpshufd_avx(auVar149,0xff);
                                  auVar122 = vpmaddwd_avx(auVar122,auVar128);
                                  auVar122 = vpaddd_avx(auVar122,auVar145._0_16_);
                                  auVar145 = ZEXT1664(auVar122);
                                  lVar68 = lVar68 + 4;
                                } while (lVar55 != lVar68);
                                pvVar57 = (void *)((long)pvVar57 + lVar61);
                              }
                              iVar66 = iVar73 + 0xf;
                              iVar73 = iVar73 + 8;
                            } while (iVar66 < (int)uVar105);
                            auVar122 = vpaddd_avx(auVar141._0_16_,auVar145._0_16_);
                            auVar128 = vpaddd_avx(auVar138._0_16_,auVar133._0_16_);
                            auVar122 = vpaddd_avx(auVar122,auVar128);
                            auVar133 = ZEXT1664(auVar122);
                            uVar77 = (ulong)uVar105 & 0xfffffff8;
                          }
                          if ((int)((uint)uVar77 | 1) < (int)uVar105) {
                            do {
                              if (0 < (int)uVar108) {
                                lVar68 = local_3b8.cstep * local_3b8.elemsize * uVar77 +
                                         (long)(int)(iVar100 * uVar97) +
                                         (long)local_3b8.w * local_3b8.elemsize *
                                         (long)(iVar87 * iVar51);
                                uVar62 = 0;
                                do {
                                  lVar75 = (long)*(int *)(opt_q._0_8_ + uVar62 * 4);
                                  auVar122 = vpinsrb_avx(ZEXT116(*(byte *)((long)local_3b8.data +
                                                                          lVar75 + lVar68)),
                                                         (uint)*(byte *)((long)local_3b8.data +
                                                                        lVar56 + lVar75 + lVar68),1)
                                  ;
                                  auVar122 = vpmovsxbw_avx(auVar122);
                                  auVar128 = vpshufd_avx(auVar122,0);
                                  auVar12._8_8_ = 0;
                                  auVar12._0_8_ = *(ulong *)((long)pvVar57 + uVar62 * 8);
                                  auVar122 = vpmovsxbw_avx(auVar12);
                                  auVar122 = vpmaddwd_avx(auVar128,auVar122);
                                  auVar122 = vpaddd_avx(auVar122,auVar133._0_16_);
                                  auVar133 = ZEXT1664(auVar122);
                                  uVar62 = uVar62 + 1;
                                } while (uVar114 != uVar62);
                                pvVar57 = (void *)((long)pvVar57 + lVar76);
                              }
                              uVar77 = uVar77 + 2;
                            } while ((int)((uint)uVar77 | 1) < (int)uVar105);
                          }
                          auVar122 = auVar133._0_16_;
                          if ((int)uVar77 < (int)uVar105) {
                            uVar77 = uVar77 & 0xffffffff;
                            do {
                              if (0 < (int)uVar108) {
                                uVar62 = 0;
                                do {
                                  auVar122 = vpshuflw_avx(ZEXT416((uint)(int)*(char *)((long)
                                                  local_3b8.data +
                                                  (long)*(int *)(opt_q._0_8_ + uVar62 * 4) +
                                                  local_3b8.cstep * local_3b8.elemsize * uVar77 +
                                                  (long)(int)(iVar100 * uVar97) +
                                                  (long)(iVar87 * iVar51) * (long)local_3b8.w *
                                                  local_3b8.elemsize)),0);
                                  auVar129 = vpshufd_avx(auVar122,0);
                                  auVar13._8_8_ = 0;
                                  auVar13._0_8_ = *(ulong *)((long)pvVar57 + uVar62 * 4);
                                  auVar122 = vpmovsxbw_avx(auVar13);
                                  auVar128 = vpmullw_avx(auVar129,auVar122);
                                  auVar122 = vpmulhw_avx(auVar129,auVar122);
                                  auVar122 = vpunpcklwd_avx(auVar128,auVar122);
                                  auVar122 = vpaddd_avx(auVar133._0_16_,auVar122);
                                  auVar133 = ZEXT1664(auVar122);
                                  uVar62 = uVar62 + 1;
                                } while (uVar114 != uVar62);
                                pvVar57 = (void *)((long)pvVar57 + lVar55);
                              }
                              auVar122 = auVar133._0_16_;
                              uVar77 = uVar77 + 1;
                            } while ((int)uVar77 < (int)uVar105);
                          }
                          if ((int)local_3c8 == 4) {
                            *local_410 = auVar122;
                            local_410 = local_410 + 1;
                          }
                          if ((int)local_3c8 == 1) {
                            *(int *)*local_410 = auVar122._0_4_;
                            *(int *)(*local_410 + (long)(int)uVar65 * 4) = auVar122._4_4_;
                            *(int *)(*local_410 + (long)(int)(uVar65 * 2) * 4) = auVar122._8_4_;
                            *(int *)(*local_410 + (long)(int)(uVar65 * 3) * 4) = auVar122._12_4_;
                            local_410 = (undefined1 (*) [16])(*local_410 + 4);
                          }
                          uVar52 = uVar52 + 1;
                        } while (uVar52 != uVar82);
                      }
                      uVar77 = local_3e0 + 1;
                    } while (local_3e0 + 1 != local_58);
                  }
                  iVar71 = uVar95 + uVar106 * -4;
                  uVar82 = iVar71 / 2;
                  if (1 < iVar71) {
                    iVar71 = iVar54 * uVar97;
                    local_338 = CONCAT44(local_338._4_4_,iVar71);
                    local_d8 = (long)(int)(uVar106 * 4);
                    lVar61 = uVar114 * 0x10;
                    lVar76 = uVar114 * 4;
                    lVar55 = uVar114 * 2;
                    uVar77 = 0;
                    do {
                      local_d0 = uVar77;
                      lVar56 = local_d8 + local_d0 * 2;
                      iVar87 = (int)local_3b8.cstep * iVar54;
                      local_458 = (undefined1 (*) [16])
                                  (local_328.elemsize * local_328.cstep * lVar56 +
                                  (long)local_328.data);
                      local_410 = (undefined1 (*) [16])
                                  ((local_d8 + local_d0 * 2 + 1) *
                                   local_328.elemsize * local_328.cstep + (long)local_328.data);
                      local_3e8 = (void *)CONCAT44(local_3e8._4_4_,local_328.w);
                      uVar52 = local_328.h * local_328.w;
                      local_3e0 = CONCAT44(local_3e0._4_4_,uVar52);
                      uVar65 = (uint)lVar56;
                      if ((int)uVar52 < 4) {
                        uVar83 = 0;
                      }
                      else {
                        uVar90 = uVar65 + 3;
                        if (-1 < (int)uVar65) {
                          uVar90 = uVar65;
                        }
                        lVar93 = (long)iVar87;
                        lVar56 = lVar93 * 3;
                        lVar68 = lVar93 * 5;
                        lVar75 = lVar93 * 6;
                        lVar85 = lVar93 * 7;
                        local_348._0_8_ = lVar85;
                        pvVar57 = (void *)0x0;
                        do {
                          local_3f8 = pvVar57;
                          uVar53 = (uint)local_3f8;
                          iVar73 = (int)uVar53 / local_328.w;
                          local_3c0 = (int)uVar53 % local_328.w;
                          uVar77 = CONCAT44((int)(uVar53 | 1) >> 0x1f,uVar53) | 1;
                          uVar62 = CONCAT44((int)(uVar53 | 2) >> 0x1f,uVar53) | 2;
                          uVar80 = CONCAT44((int)(uVar53 | 3) >> 0x1f,uVar53) | 3;
                          local_364 = (int)((long)uVar80 / (long)local_328.w);
                          iVar100 = (int)((long)uVar80 % (long)local_328.w);
                          local_490 = (void *)((this->weight_data_tm).cstep *
                                               (long)(((int)(uVar65 - (uVar90 & 0xfffffffc)) >> 1) +
                                                     ((int)uVar90 >> 2)) *
                                               (this->weight_data_tm).elemsize +
                                              (long)(this->weight_data_tm).data);
                          auVar133 = ZEXT1664((undefined1  [16])0x0);
                          auVar122 = (undefined1  [16])0x0;
                          local_3bc = (uint)((long)uVar62 / (long)local_328.w);
                          iVar84 = (int)((long)uVar77 / (long)local_328.w);
                          local_3f0 = CONCAT44(local_3f0._4_4_,iVar84);
                          local_370 = CONCAT44(local_370._4_4_,iVar100);
                          iVar109 = (int)((long)uVar62 % (long)local_328.w);
                          local_330 = (void *)CONCAT44(local_330._4_4_,iVar109);
                          iVar66 = (int)((long)uVar77 % (long)local_328.w);
                          local_250 = CONCAT44(local_250._4_4_,iVar66);
                          if ((int)uVar105 < 8) {
                            auVar167 = (undefined1  [16])0x0;
                            auVar128 = (undefined1  [16])0x0;
                            auVar182 = (undefined1  [16])0x0;
                            auVar149 = (undefined1  [16])0x0;
                            auVar162 = (undefined1  [16])0x0;
                            auVar158 = (undefined1  [16])0x0;
                            auVar129 = (undefined1  [16])0x0;
                            uVar77 = 0;
                          }
                          else {
                            lVar110 = (long)local_3b8.w * local_3b8.elemsize;
                            local_3c8 = (long)local_3b8.data +
                                        (local_364 * iVar51) * lVar110 + (long)(iVar100 * iVar71);
                            auVar141 = ZEXT1664((undefined1  [16])0x0);
                            auVar145 = ZEXT1664((undefined1  [16])0x0);
                            auVar173 = ZEXT1664((undefined1  [16])0x0);
                            auVar154 = ZEXT1664((undefined1  [16])0x0);
                            auVar161 = ZEXT1664((undefined1  [16])0x0);
                            auVar138 = ZEXT1664((undefined1  [16])0x0);
                            auVar166 = ZEXT1664((undefined1  [16])0x0);
                            iVar78 = 0;
                            do {
                              if (0 < (int)uVar108) {
                                lVar112 = (long)(iVar78 / iVar54) *
                                          local_3b8.cstep * local_3b8.elemsize;
                                lVar96 = 0;
                                do {
                                  lVar103 = (long)*(int *)(opt_q._0_8_ + lVar96);
                                  puVar98 = (ulong *)((long)local_3b8.data +
                                                     lVar103 + lVar112 + (iVar73 * iVar51) * lVar110
                                                                         + (long)(int)(local_3c0 *
                                                                                      iVar71));
                                  puVar69 = (ulong *)((long)local_3b8.data +
                                                     lVar103 + lVar112 + (iVar84 * iVar51) * lVar110
                                                                         + (long)(iVar66 * iVar71));
                                  puVar2 = (ulong *)((long)local_3b8.data +
                                                    lVar103 + lVar112 + (int)(local_3bc * iVar51) *
                                                                        lVar110 + (long)(iVar109 *
                                                                                        iVar71));
                                  puVar104 = (ulong *)(lVar103 + lVar112 + local_3c8);
                                  if (iVar54 == 8) {
                                    auVar177._8_8_ = 0;
                                    auVar177._0_8_ = *puVar98;
                                    auVar183._8_8_ = 0;
                                    auVar183._0_8_ = *puVar69;
                                    auVar188._8_8_ = 0;
                                    auVar188._0_8_ = *puVar2;
                                    auVar194._8_8_ = 0;
                                    auVar194._0_8_ = *puVar104;
                                  }
                                  else {
                                    auVar122 = vpinsrb_avx(ZEXT116((byte)*puVar98),
                                                           (uint)*(byte *)((long)puVar98 + lVar93),1
                                                          );
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar98 +
                                                                                   lVar93 * 2),2);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar98 +
                                                                                   lVar56),3);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar98 +
                                                                                   lVar93 * 4),4);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar98 +
                                                                                   lVar68),5);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar98 +
                                                                                   lVar75),6);
                                    auVar177 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar98 +
                                                                                   lVar85),7);
                                    auVar122 = vpinsrb_avx(ZEXT116((byte)*puVar69),
                                                           (uint)*(byte *)((long)puVar69 + lVar93),1
                                                          );
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar69 +
                                                                                   lVar93 * 2),2);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar69 +
                                                                                   lVar56),3);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar69 +
                                                                                   lVar93 * 4),4);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar69 +
                                                                                   lVar68),5);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar69 +
                                                                                   lVar75),6);
                                    auVar183 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar69 +
                                                                                   lVar85),7);
                                    auVar122 = vpinsrb_avx(ZEXT116((byte)*puVar2),
                                                           (uint)*(byte *)((long)puVar2 + lVar93),1)
                                    ;
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar2 +
                                                                                   lVar93 * 2),2);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar2 +
                                                                                   lVar56),3);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar2 +
                                                                                   lVar93 * 4),4);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar2 +
                                                                                   lVar68),5);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar2 +
                                                                                   lVar75),6);
                                    auVar188 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar2 +
                                                                                   lVar85),7);
                                    auVar122 = vpinsrb_avx(ZEXT116((byte)*puVar104),
                                                           (uint)*(byte *)((long)puVar104 + lVar93),
                                                           1);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar104 +
                                                                                   lVar93 * 2),2);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar104 +
                                                                                   lVar56),3);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar104 +
                                                                                   lVar93 * 4),4);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar104 +
                                                                                   lVar68),5);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar104 +
                                                                                   lVar75),6);
                                    auVar194 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar104 +
                                                                                   lVar85),7);
                                  }
                                  auVar129 = vpmovsxbw_avx(auVar177);
                                  auVar158 = vpmovsxbw_avx(auVar183);
                                  auVar149 = vpmovsxbw_avx(auVar188);
                                  auVar182 = vpmovsxbw_avx(auVar194);
                                  auVar122 = *(undefined1 (*) [16])((long)local_490 + lVar96 * 4);
                                  auVar128 = vpcmpgtb_avx((undefined1  [16])0x0,auVar122);
                                  auVar167 = vpunpcklbw_avx(auVar122,auVar128);
                                  auVar128 = vpunpckhbw_avx(auVar122,auVar128);
                                  auVar122 = vpmaddwd_avx(auVar129,auVar167);
                                  auVar122 = vpaddd_avx(auVar122,auVar141._0_16_);
                                  auVar141 = ZEXT1664(auVar122);
                                  auVar122 = vpmaddwd_avx(auVar129,auVar128);
                                  auVar122 = vpaddd_avx(auVar122,auVar145._0_16_);
                                  auVar145 = ZEXT1664(auVar122);
                                  auVar122 = vpmaddwd_avx(auVar158,auVar167);
                                  auVar122 = vpaddd_avx(auVar122,auVar173._0_16_);
                                  auVar173 = ZEXT1664(auVar122);
                                  auVar122 = vpmaddwd_avx(auVar158,auVar128);
                                  auVar122 = vpaddd_avx(auVar122,auVar154._0_16_);
                                  auVar154 = ZEXT1664(auVar122);
                                  auVar122 = vpmaddwd_avx(auVar149,auVar167);
                                  auVar122 = vpaddd_avx(auVar122,auVar161._0_16_);
                                  auVar161 = ZEXT1664(auVar122);
                                  auVar122 = vpmaddwd_avx(auVar149,auVar128);
                                  auVar122 = vpaddd_avx(auVar122,auVar138._0_16_);
                                  auVar138 = ZEXT1664(auVar122);
                                  auVar122 = vpmaddwd_avx(auVar182,auVar167);
                                  auVar122 = vpaddd_avx(auVar122,auVar166._0_16_);
                                  auVar166 = ZEXT1664(auVar122);
                                  auVar122 = vpmaddwd_avx(auVar182,auVar128);
                                  auVar122 = vpaddd_avx(auVar122,auVar133._0_16_);
                                  auVar133 = ZEXT1664(auVar122);
                                  lVar96 = lVar96 + 4;
                                } while (lVar76 != lVar96);
                                local_490 = (void *)((long)local_490 + lVar61);
                              }
                              auVar128 = auVar138._0_16_;
                              auVar122 = auVar133._0_16_;
                              auVar149 = auVar154._0_16_;
                              auVar158 = auVar145._0_16_;
                              auVar167 = auVar166._0_16_;
                              auVar182 = auVar161._0_16_;
                              auVar162 = auVar173._0_16_;
                              auVar129 = auVar141._0_16_;
                              iVar89 = iVar78 + 0xf;
                              iVar78 = iVar78 + 8;
                            } while (iVar89 < (int)uVar105);
                            uVar77 = (ulong)uVar105 & 0xfffffff8;
                          }
                          auVar147 = vpunpckldq_avx(auVar129,auVar162);
                          auVar168 = vpunpckldq_avx(auVar182,auVar167);
                          auVar129 = vpunpckhdq_avx(auVar129,auVar162);
                          auVar182 = vpunpckhdq_avx(auVar182,auVar167);
                          auVar167 = vpunpckldq_avx(auVar158,auVar149);
                          auVar162 = vpunpckldq_avx(auVar128,auVar122);
                          auVar158 = vpunpckhdq_avx(auVar158,auVar149);
                          auVar149 = vpunpckhdq_avx(auVar128,auVar122);
                          auVar128 = vpunpcklqdq_avx(auVar147,auVar168);
                          auVar122 = vpunpckhqdq_avx(auVar147,auVar168);
                          auVar122 = vpaddd_avx(auVar128,auVar122);
                          auVar147 = vpunpcklqdq_avx(auVar129,auVar182);
                          auVar128 = vpunpckhqdq_avx(auVar129,auVar182);
                          auVar128 = vpaddd_avx(auVar128,auVar147);
                          auVar122 = vpaddd_avx(auVar122,auVar128);
                          auVar133 = ZEXT1664(auVar122);
                          auVar128 = vpunpcklqdq_avx(auVar167,auVar162);
                          auVar122 = vpunpckhqdq_avx(auVar167,auVar162);
                          auVar122 = vpaddd_avx(auVar128,auVar122);
                          auVar129 = vpunpcklqdq_avx(auVar158,auVar149);
                          auVar128 = vpunpckhqdq_avx(auVar158,auVar149);
                          auVar128 = vpaddd_avx(auVar128,auVar129);
                          auVar122 = vpaddd_avx(auVar122,auVar128);
                          auVar138 = ZEXT1664(auVar122);
                          if ((int)((uint)uVar77 | 1) < (int)uVar105) {
                            lVar110 = (long)local_3b8.w * local_3b8.elemsize;
                            do {
                              if (0 < (int)uVar108) {
                                lVar67 = local_3b8.cstep * local_3b8.elemsize * uVar77;
                                lVar112 = lVar67 + (iVar73 * iVar51) * lVar110 +
                                                   (long)(int)(local_3c0 * uVar97);
                                lVar96 = lVar67 + (iVar84 * iVar51) * lVar110 +
                                                  (long)(int)(iVar66 * uVar97);
                                lVar103 = lVar67 + (int)(local_3bc * iVar51) * lVar110 +
                                                   (long)(int)(iVar109 * uVar97);
                                lVar67 = lVar67 + (local_364 * iVar51) * lVar110 +
                                                  (long)(int)(iVar100 * uVar97);
                                uVar62 = 0;
                                do {
                                  lVar60 = (long)*(int *)(opt_q._0_8_ + uVar62 * 4);
                                  auVar122 = vpinsrw_avx(ZEXT416((uint)(int)*(char *)((long)
                                                  local_3b8.data + lVar60 + lVar112)),
                                                  (int)*(char *)((long)local_3b8.data +
                                                                lVar93 + lVar60 + lVar112),1);
                                  auVar122 = vpinsrw_avx(auVar122,(int)*(char *)((long)local_3b8.
                                                                                       data +
                                                                                lVar60 + lVar96),2);
                                  auVar122 = vpinsrw_avx(auVar122,(int)*(char *)((long)local_3b8.
                                                                                       data +
                                                                                lVar93 + lVar60 + 
                                                  lVar96),3);
                                  auVar122 = vpinsrw_avx(auVar122,(int)*(char *)((long)local_3b8.
                                                                                       data +
                                                                                lVar60 + lVar103),4)
                                  ;
                                  auVar122 = vpinsrw_avx(auVar122,(int)*(char *)((long)local_3b8.
                                                                                       data +
                                                                                lVar93 + lVar60 + 
                                                  lVar103),5);
                                  auVar122 = vpinsrw_avx(auVar122,(int)*(char *)((long)local_3b8.
                                                                                       data +
                                                                                lVar60 + lVar67),6);
                                  auVar128 = vpinsrw_avx(auVar122,(int)*(char *)((long)local_3b8.
                                                                                       data +
                                                                                lVar93 + lVar60 + 
                                                  lVar67),7);
                                  auVar122 = vpinsrb_avx(ZEXT116(*(byte *)((long)local_490 +
                                                                          uVar62 * 4)),
                                                         (uint)*(byte *)((long)local_490 +
                                                                        uVar62 * 4 + 2),1);
                                  auVar122 = vpmovsxbw_avx(auVar122);
                                  auVar129 = vpshufd_avx(auVar122,0);
                                  auVar122 = vpinsrb_avx(ZEXT116(*(byte *)((long)local_490 +
                                                                          uVar62 * 4 + 1)),
                                                         (uint)*(byte *)((long)local_490 +
                                                                        uVar62 * 4 + 3),1);
                                  auVar122 = vpmovsxbw_avx(auVar122);
                                  auVar158 = vpshufd_avx(auVar122,0);
                                  auVar122 = vpmaddwd_avx(auVar128,auVar129);
                                  auVar122 = vpaddd_avx(auVar122,auVar133._0_16_);
                                  auVar133 = ZEXT1664(auVar122);
                                  auVar122 = vpmaddwd_avx(auVar128,auVar158);
                                  auVar122 = vpaddd_avx(auVar122,auVar138._0_16_);
                                  auVar138 = ZEXT1664(auVar122);
                                  uVar62 = uVar62 + 1;
                                } while (uVar114 != uVar62);
                                local_490 = (void *)((long)local_490 + lVar76);
                              }
                              uVar77 = uVar77 + 2;
                            } while ((int)((uint)uVar77 | 1) < (int)uVar105);
                          }
                          auVar128 = auVar138._0_16_;
                          auVar122 = auVar133._0_16_;
                          if ((int)uVar77 < (int)uVar105) {
                            lVar110 = (long)local_3b8.w * local_3b8.elemsize;
                            uVar77 = uVar77 & 0xffffffff;
                            do {
                              if (0 < (int)uVar108) {
                                lVar112 = local_3b8.cstep * local_3b8.elemsize * uVar77;
                                uVar62 = 0;
                                do {
                                  lVar96 = (long)*(int *)(opt_q._0_8_ + uVar62 * 4);
                                  auVar122 = vpinsrb_avx(ZEXT116(*(byte *)((long)local_3b8.data +
                                                                          lVar96 + lVar112 + (iVar73
                                                                                             * 
                                                  iVar51) * lVar110 +
                                                  (long)(int)(local_3c0 * uVar97))),
                                                  (uint)*(byte *)((long)local_3b8.data +
                                                                 lVar96 + lVar112 + (iVar84 * iVar51
                                                                                    ) * lVar110 +
                                                                                    (long)(int)(
                                                  iVar66 * uVar97)),1);
                                  auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)local_3b8.
                                                                                        data +
                                                                                 lVar96 + lVar112 + 
                                                  (int)(local_3bc * iVar51) * lVar110 +
                                                  (long)(int)(iVar109 * uVar97)),2);
                                  auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)local_3b8.
                                                                                        data +
                                                                                 lVar96 + lVar112 + 
                                                  (local_364 * iVar51) * lVar110 +
                                                  (long)(int)(iVar100 * uVar97)),3);
                                  auVar122 = vpmovsxbw_avx(auVar122);
                                  auVar128 = vpshufd_avx(auVar122,0x44);
                                  auVar122 = vpmovsxbw_avx(ZEXT216(*(ushort *)
                                                                    ((long)local_490 + uVar62 * 2)))
                                  ;
                                  auVar122 = vpshuflw_avx(auVar122,0x50);
                                  auVar122 = vpshufd_avx(auVar122,0x50);
                                  auVar129 = vpmullw_avx(auVar122,auVar128);
                                  auVar128 = vpmulhw_avx(auVar128,auVar122);
                                  auVar122 = vpunpcklwd_avx(auVar129,auVar128);
                                  auVar122 = vpaddd_avx(auVar133._0_16_,auVar122);
                                  auVar133 = ZEXT1664(auVar122);
                                  auVar122 = vpunpckhwd_avx(auVar129,auVar128);
                                  auVar122 = vpaddd_avx(auVar138._0_16_,auVar122);
                                  auVar138 = ZEXT1664(auVar122);
                                  uVar62 = uVar62 + 1;
                                } while (uVar114 != uVar62);
                                local_490 = (void *)((long)local_490 + lVar55);
                              }
                              auVar128 = auVar138._0_16_;
                              auVar122 = auVar133._0_16_;
                              uVar77 = uVar77 + 1;
                            } while ((int)uVar77 < (int)uVar105);
                          }
                          *local_458 = auVar122;
                          *local_410 = auVar128;
                          local_458 = local_458 + 1;
                          local_410 = local_410 + 1;
                          uVar83 = uVar53 + 4;
                          pvVar57 = (void *)(ulong)uVar83;
                        } while ((int)(uVar53 + 7) < (int)uVar52);
                      }
                      uVar90 = uVar83 | 1;
                      if ((int)uVar90 < (int)uVar52) {
                        uVar53 = uVar65 + 3;
                        if (-1 < (int)uVar65) {
                          uVar53 = uVar65;
                        }
                        local_330 = (void *)((long)(((int)(uVar65 - (uVar53 & 0xfffffffc)) >> 1) +
                                                   ((int)uVar53 >> 2)) *
                                             (this->weight_data_tm).cstep *
                                             (this->weight_data_tm).elemsize +
                                            (long)(this->weight_data_tm).data);
                        local_3f8 = local_3b8.data;
                        local_370 = local_3b8.elemsize;
                        lVar56 = local_3b8.cstep * local_3b8.elemsize;
                        lVar68 = (long)iVar87;
                        uVar53 = uVar83;
                        do {
                          iVar84 = (int)uVar53 / local_328.w;
                          iVar66 = (int)uVar53 % local_328.w;
                          iVar100 = (int)uVar90 / local_328.w;
                          iVar73 = (int)uVar90 % local_328.w;
                          local_3c8 = CONCAT44(local_3c8._4_4_,iVar100);
                          local_3f0 = CONCAT44(local_3f0._4_4_,iVar84);
                          pvVar57 = local_330;
                          if ((int)uVar105 < 8) {
                            uVar77 = 0;
                            auVar122 = (undefined1  [16])0x0;
                            auVar128 = (undefined1  [16])0x0;
                            auVar158 = (undefined1  [16])0x0;
                            auVar129 = (undefined1  [16])0x0;
                          }
                          else {
                            auVar141 = ZEXT1664((undefined1  [16])0x0);
                            auVar145 = ZEXT1664((undefined1  [16])0x0);
                            auVar138 = ZEXT1664((undefined1  [16])0x0);
                            auVar133 = ZEXT1664((undefined1  [16])0x0);
                            iVar109 = 0;
                            do {
                              if (0 < (int)uVar108) {
                                lVar75 = (iVar109 / iVar54) * lVar56;
                                lVar85 = 0;
                                do {
                                  puVar98 = (ulong *)((long)local_3b8.data +
                                                     (long)*(int *)(opt_q._0_8_ + lVar85) +
                                                     lVar75 + (long)(iVar84 * iVar51) *
                                                              (long)local_3b8.w * local_3b8.elemsize
                                                              + (long)(iVar66 * iVar71));
                                  puVar69 = (ulong *)((long)local_3b8.data +
                                                     (long)*(int *)(opt_q._0_8_ + lVar85) +
                                                     lVar75 + (long)(iVar100 * iVar51) *
                                                              (long)local_3b8.w * local_3b8.elemsize
                                                              + (long)(iVar73 * iVar71));
                                  if (iVar54 == 8) {
                                    auVar150._8_8_ = 0;
                                    auVar150._0_8_ = *puVar98;
                                    auVar159._8_8_ = 0;
                                    auVar159._0_8_ = *puVar69;
                                  }
                                  else {
                                    auVar122 = vpinsrb_avx(ZEXT116((byte)*puVar98),
                                                           (uint)*(byte *)((long)puVar98 + lVar68),1
                                                          );
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar98 +
                                                                                   lVar68 * 2),2);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar98 +
                                                                                   lVar68 * 3),3);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar98 +
                                                                                   lVar68 * 4),4);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar98 +
                                                                                   lVar68 * 5),5);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar98 +
                                                                                   lVar68 * 6),6);
                                    auVar150 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar98 +
                                                                                   lVar68 * 7),7);
                                    auVar122 = vpinsrb_avx(ZEXT116((byte)*puVar69),
                                                           (uint)*(byte *)((long)puVar69 + lVar68),1
                                                          );
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar69 +
                                                                                   lVar68 * 2),2);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar69 +
                                                                                   lVar68 * 3),3);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar69 +
                                                                                   lVar68 * 4),4);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar69 +
                                                                                   lVar68 * 5),5);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar69 +
                                                                                   lVar68 * 6),6);
                                    auVar159 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar69 +
                                                                                   lVar68 * 7),7);
                                  }
                                  auVar129 = vpmovsxbw_avx(auVar150);
                                  auVar158 = vpmovsxbw_avx(auVar159);
                                  auVar122 = *(undefined1 (*) [16])((long)pvVar57 + lVar85 * 4);
                                  auVar128 = vpcmpgtb_avx((undefined1  [16])0x0,auVar122);
                                  auVar149 = vpunpcklbw_avx(auVar122,auVar128);
                                  auVar128 = vpunpckhbw_avx(auVar122,auVar128);
                                  auVar122 = vpmaddwd_avx(auVar149,auVar129);
                                  auVar122 = vpaddd_avx(auVar122,auVar141._0_16_);
                                  auVar141 = ZEXT1664(auVar122);
                                  auVar122 = vpmaddwd_avx(auVar129,auVar128);
                                  auVar122 = vpaddd_avx(auVar122,auVar145._0_16_);
                                  auVar145 = ZEXT1664(auVar122);
                                  auVar122 = vpmaddwd_avx(auVar149,auVar158);
                                  auVar122 = vpaddd_avx(auVar122,auVar138._0_16_);
                                  auVar138 = ZEXT1664(auVar122);
                                  auVar122 = vpmaddwd_avx(auVar158,auVar128);
                                  auVar122 = vpaddd_avx(auVar122,auVar133._0_16_);
                                  auVar133 = ZEXT1664(auVar122);
                                  lVar85 = lVar85 + 4;
                                } while (lVar76 != lVar85);
                                pvVar57 = (void *)((long)pvVar57 + lVar61);
                              }
                              auVar122 = auVar133._0_16_;
                              auVar128 = auVar138._0_16_;
                              auVar158 = auVar145._0_16_;
                              auVar129 = auVar141._0_16_;
                              iVar78 = iVar109 + 0xf;
                              iVar109 = iVar109 + 8;
                            } while (iVar78 < (int)uVar105);
                            uVar77 = (ulong)uVar105 & 0xfffffff8;
                          }
                          auVar129 = vphaddd_avx(auVar129,auVar129);
                          auVar129 = vphaddd_avx(auVar129,auVar129);
                          auVar158 = vphaddd_avx(auVar158,auVar158);
                          auVar158 = vphaddd_avx(auVar158,auVar158);
                          auVar128 = vphaddd_avx(auVar128,auVar128);
                          iVar89 = auVar129._0_4_;
                          auVar128 = vphaddd_avx(auVar128,auVar128);
                          iVar109 = auVar158._0_4_;
                          auVar122 = vphaddd_avx(auVar122,auVar122);
                          iVar47 = auVar128._0_4_;
                          auVar122 = vphaddd_avx(auVar122,auVar122);
                          iVar78 = auVar122._0_4_;
                          if ((int)((uint)uVar77 | 1) < (int)uVar105) {
                            lVar75 = (long)local_3b8.data +
                                     (long)(iVar84 * iVar51) *
                                     (long)local_3b8.w * local_3b8.elemsize +
                                     (long)(int)(iVar66 * uVar97);
                            local_348._0_8_ = lVar75;
                            do {
                              if (0 < (int)uVar108) {
                                lVar85 = lVar75 + uVar77 * lVar56;
                                lVar93 = uVar77 * lVar56 +
                                         (long)(iVar100 * iVar51) *
                                         (long)local_3b8.w * local_3b8.elemsize +
                                         (long)(int)(iVar73 * uVar97);
                                uVar62 = 0;
                                do {
                                  lVar110 = (long)*(int *)(opt_q._0_8_ + uVar62 * 4);
                                  iVar48 = (int)*(char *)(lVar85 + lVar110);
                                  iVar49 = (int)*(char *)((long)pvVar57 + uVar62 * 4);
                                  iVar64 = (int)*(char *)((long)pvVar57 + uVar62 * 4 + 1);
                                  iVar50 = (int)*(char *)(lVar68 + lVar85 + lVar110);
                                  iVar79 = (int)*(char *)((long)local_3b8.data + lVar110 + lVar93);
                                  iVar107 = (int)*(char *)((long)pvVar57 + uVar62 * 4 + 2);
                                  iVar89 = iVar107 * iVar50 + iVar49 * iVar48 + iVar89;
                                  iVar99 = (int)*(char *)((long)pvVar57 + uVar62 * 4 + 3);
                                  iVar109 = iVar50 * iVar99 + iVar48 * iVar64 + iVar109;
                                  iVar50 = (int)*(char *)((long)local_3b8.data +
                                                         lVar68 + lVar110 + lVar93);
                                  iVar47 = iVar107 * iVar50 + iVar49 * iVar79 + iVar47;
                                  iVar78 = iVar50 * iVar99 + iVar79 * iVar64 + iVar78;
                                  uVar62 = uVar62 + 1;
                                } while (uVar114 != uVar62);
                                pvVar57 = (void *)((long)pvVar57 + lVar76);
                              }
                              uVar77 = uVar77 + 2;
                            } while ((int)((uint)uVar77 | 1) < (int)uVar105);
                          }
                          if ((int)uVar77 < (int)uVar105) {
                            lVar75 = (long)local_3b8.data +
                                     (long)(iVar100 * iVar51) *
                                     (long)local_3b8.w * local_3b8.elemsize +
                                     (long)(int)(iVar73 * uVar97);
                            local_348._0_8_ = lVar75;
                            uVar77 = uVar77 & 0xffffffff;
                            do {
                              if (0 < (int)uVar108) {
                                uVar62 = 0;
                                do {
                                  lVar85 = (long)*(int *)(opt_q._0_8_ + uVar62 * 4);
                                  iVar100 = (int)*(char *)((long)local_3b8.data +
                                                          lVar85 + uVar77 * lVar56 +
                                                                   (long)(iVar84 * iVar51) *
                                                                   (long)local_3b8.w *
                                                                   local_3b8.elemsize +
                                                                   (long)(int)(iVar66 * uVar97));
                                  iVar73 = (int)*(char *)((long)pvVar57 + uVar62 * 2);
                                  iVar89 = iVar89 + iVar73 * iVar100;
                                  iVar50 = (int)*(char *)((long)pvVar57 + uVar62 * 2 + 1);
                                  iVar109 = iVar109 + iVar100 * iVar50;
                                  iVar100 = (int)*(char *)(uVar77 * lVar56 + lVar75 + lVar85);
                                  iVar47 = iVar47 + iVar73 * iVar100;
                                  iVar78 = iVar78 + iVar100 * iVar50;
                                  uVar62 = uVar62 + 1;
                                } while (uVar114 != uVar62);
                                pvVar57 = (void *)((long)pvVar57 + lVar55);
                              }
                              uVar77 = uVar77 + 1;
                            } while ((int)uVar77 < (int)uVar105);
                          }
                          *(int *)*local_458 = iVar89;
                          *(int *)((long)*local_458 + 4) = iVar47;
                          *(int *)*local_410 = iVar109;
                          *(int *)((long)*local_410 + 4) = iVar78;
                          local_458 = (undefined1 (*) [16])((long)*local_458 + 8);
                          local_410 = (undefined1 (*) [16])((long)*local_410 + 8);
                          uVar83 = uVar53 + 2;
                          uVar90 = uVar53 + 3;
                          uVar53 = uVar83;
                        } while ((int)uVar90 < (int)uVar52);
                      }
                      if ((int)uVar83 < (int)uVar52) {
                        uVar90 = uVar65 + 3;
                        if (-1 < (int)uVar65) {
                          uVar90 = uVar65;
                        }
                        pvVar57 = (void *)((long)(((int)(uVar65 - (uVar90 & 0xfffffffc)) >> 1) +
                                                 ((int)uVar90 >> 2)) * (this->weight_data_tm).cstep
                                           * (this->weight_data_tm).elemsize +
                                          (long)(this->weight_data_tm).data);
                        lVar56 = local_3b8.cstep * local_3b8.elemsize;
                        lVar68 = (long)iVar87;
                        do {
                          iVar87 = (int)uVar83 / local_328.w;
                          iVar100 = (int)uVar83 % local_328.w;
                          local_348._0_4_ = iVar87;
                          pvVar113 = pvVar57;
                          if ((int)uVar105 < 8) {
                            uVar77 = 0;
                            auVar128 = (undefined1  [16])0x0;
                            auVar122 = (undefined1  [16])0x0;
                          }
                          else {
                            auVar133 = ZEXT1664((undefined1  [16])0x0);
                            auVar138 = ZEXT1664((undefined1  [16])0x0);
                            iVar73 = 0;
                            do {
                              if (0 < (int)uVar108) {
                                lVar75 = 0;
                                do {
                                  puVar98 = (ulong *)((long)local_3b8.data +
                                                     (long)*(int *)(opt_q._0_8_ + lVar75) +
                                                     (iVar73 / iVar54) * lVar56 +
                                                     (long)local_3b8.w * local_3b8.elemsize *
                                                     (long)(iVar87 * iVar51) +
                                                     (long)(iVar100 * iVar71));
                                  if (iVar54 == 8) {
                                    auVar139._8_8_ = 0;
                                    auVar139._0_8_ = *puVar98;
                                  }
                                  else {
                                    auVar122 = vpinsrb_avx(ZEXT116((byte)*puVar98),
                                                           (uint)*(byte *)((long)puVar98 + lVar68),1
                                                          );
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar98 +
                                                                                   lVar68 * 2),2);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar98 +
                                                                                   lVar68 * 3),3);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar98 +
                                                                                   lVar68 * 4),4);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar98 +
                                                                                   lVar68 * 5),5);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar98 +
                                                                                   lVar68 * 6),6);
                                    auVar139 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar98 +
                                                                                   lVar68 * 7),7);
                                  }
                                  auVar129 = vpmovsxbw_avx(auVar139);
                                  auVar122 = *(undefined1 (*) [16])((long)pvVar113 + lVar75 * 4);
                                  auVar128 = vpcmpgtb_avx((undefined1  [16])0x0,auVar122);
                                  auVar158 = vpunpcklbw_avx(auVar122,auVar128);
                                  auVar128 = vpunpckhbw_avx(auVar122,auVar128);
                                  auVar122 = vpmaddwd_avx(auVar129,auVar158);
                                  auVar122 = vpaddd_avx(auVar122,auVar138._0_16_);
                                  auVar138 = ZEXT1664(auVar122);
                                  auVar122 = vpmaddwd_avx(auVar129,auVar128);
                                  auVar122 = vpaddd_avx(auVar122,auVar133._0_16_);
                                  auVar133 = ZEXT1664(auVar122);
                                  lVar75 = lVar75 + 4;
                                } while (lVar76 != lVar75);
                                pvVar113 = (void *)((long)pvVar113 + lVar61);
                              }
                              auVar122 = auVar133._0_16_;
                              auVar128 = auVar138._0_16_;
                              iVar66 = iVar73 + 0xf;
                              iVar73 = iVar73 + 8;
                            } while (iVar66 < (int)uVar105);
                            uVar77 = (ulong)uVar105 & 0xfffffff8;
                          }
                          auVar128 = vphaddd_avx(auVar128,auVar128);
                          auVar128 = vphaddd_avx(auVar128,auVar128);
                          auVar122 = vphaddd_avx(auVar122,auVar122);
                          iVar73 = auVar128._0_4_;
                          auVar122 = vphaddd_avx(auVar122,auVar122);
                          iVar66 = auVar122._0_4_;
                          if ((int)((uint)uVar77 | 1) < (int)uVar105) {
                            do {
                              if (0 < (int)uVar108) {
                                lVar75 = uVar77 * lVar56 +
                                         (long)local_3b8.w * local_3b8.elemsize *
                                         (long)(iVar87 * iVar51) + (long)(int)(iVar100 * uVar97);
                                uVar62 = 0;
                                do {
                                  lVar85 = (long)*(int *)(opt_q._0_8_ + uVar62 * 4);
                                  iVar84 = (int)*(char *)((long)local_3b8.data + lVar85 + lVar75);
                                  iVar109 = (int)*(char *)((long)local_3b8.data +
                                                          lVar68 + lVar85 + lVar75);
                                  iVar73 = *(char *)((long)pvVar113 + uVar62 * 4 + 2) * iVar109 +
                                           *(char *)((long)pvVar113 + uVar62 * 4) * iVar84 + iVar73;
                                  iVar66 = *(char *)((long)pvVar113 + uVar62 * 4 + 3) * iVar109 +
                                           *(char *)((long)pvVar113 + uVar62 * 4 + 1) * iVar84 +
                                           iVar66;
                                  uVar62 = uVar62 + 1;
                                } while (uVar114 != uVar62);
                                pvVar113 = (void *)((long)pvVar113 + lVar76);
                              }
                              uVar77 = uVar77 + 2;
                            } while ((int)((uint)uVar77 | 1) < (int)uVar105);
                          }
                          if ((int)uVar77 < (int)uVar105) {
                            uVar77 = uVar77 & 0xffffffff;
                            do {
                              if (0 < (int)uVar108) {
                                uVar62 = 0;
                                do {
                                  iVar84 = (int)*(char *)((long)local_3b8.data +
                                                         (long)*(int *)(opt_q._0_8_ + uVar62 * 4) +
                                                         uVar77 * lVar56 +
                                                         (long)(iVar87 * iVar51) *
                                                         local_3b8.elemsize * (long)local_3b8.w +
                                                         (long)(int)(iVar100 * uVar97));
                                  iVar73 = iVar73 + *(char *)((long)pvVar113 + uVar62 * 2) * iVar84;
                                  iVar66 = iVar66 + *(char *)((long)pvVar113 + uVar62 * 2 + 1) *
                                                    iVar84;
                                  uVar62 = uVar62 + 1;
                                } while (uVar114 != uVar62);
                                pvVar113 = (void *)((long)pvVar113 + lVar55);
                              }
                              uVar77 = uVar77 + 1;
                            } while ((int)uVar77 < (int)uVar105);
                          }
                          *(int *)*local_458 = iVar73;
                          *(int *)*local_410 = iVar66;
                          local_458 = (undefined1 (*) [16])((long)*local_458 + 4);
                          local_410 = (undefined1 (*) [16])((long)*local_410 + 4);
                          uVar83 = uVar83 + 1;
                        } while (uVar83 != uVar52);
                      }
                      uVar77 = local_d0 + 1;
                      local_e0 = (ulong)uVar82;
                    } while (local_d0 + 1 != (ulong)uVar82);
                  }
                  iVar71 = uVar106 * 4 + uVar82 * 2;
                  if (iVar71 < (int)uVar95) {
                    uVar106 = (int)local_350 * (int)local_2e0;
                    local_350 = (void *)CONCAT44(local_350._4_4_,uVar106);
                    local_3bc = iVar54 * uVar97;
                    lVar93 = (long)iVar72;
                    lVar56 = lVar93 * 3;
                    lVar68 = lVar93 * 5;
                    lVar75 = lVar93 * 6;
                    lVar85 = lVar93 * 7;
                    local_3c0 = uVar105 & 0xfffffff8;
                    uVar77 = (ulong)(uVar108 - 1);
                    lVar76 = uVar77 + 1;
                    lVar55 = uVar77 * 8 + 8;
                    local_348._0_8_ = lVar55;
                    lVar61 = uVar77 * 2 + 2;
                    local_3c8 = uVar114 * 2;
                    uVar77 = (long)iVar71;
                    do {
                      local_338 = uVar77;
                      local_410 = (undefined1 (*) [16])
                                  (local_328.cstep * local_338 * local_328.elemsize +
                                  (long)local_328.data);
                      uVar82 = (uint)local_338;
                      if ((int)uVar106 < 4) {
                        uVar65 = 0;
                      }
                      else {
                        uVar52 = uVar82 + 3;
                        if (-1 < (int)uVar82) {
                          uVar52 = uVar82;
                        }
                        uVar83 = 0;
                        do {
                          local_3e0 = (ulong)uVar83;
                          iVar66 = (int)uVar83 / (int)local_2e0;
                          iVar73 = (int)uVar83 % (int)local_2e0;
                          uVar77 = CONCAT44((int)(uVar83 | 1) >> 0x1f,uVar83) | 1;
                          uVar62 = CONCAT44((int)(uVar83 | 2) >> 0x1f,uVar83) | 2;
                          uVar80 = CONCAT44((int)(uVar83 | 3) >> 0x1f,uVar83) | 3;
                          iVar71 = (int)((long)uVar80 % (long)(int)local_2e0);
                          pvVar57 = (void *)((this->weight_data_tm).cstep *
                                             (long)(int)((uVar82 - (((uint)(local_338 >> 0x1f) & 1)
                                                                    + uVar82 & 0xfffffffe)) +
                                                         ((int)uVar52 >> 2) +
                                                        (int)(uVar82 - (uVar52 & 0xfffffffc)) / 2) *
                                             (this->weight_data_tm).elemsize +
                                            (long)(this->weight_data_tm).data);
                          auVar133 = ZEXT1664((undefined1  [16])0x0);
                          auVar122 = (undefined1  [16])0x0;
                          iVar109 = (int)((long)uVar80 / (long)(int)local_2e0);
                          iVar87 = (int)((long)uVar77 % (long)(int)local_2e0);
                          local_3f8 = (void *)CONCAT44(local_3f8._4_4_,iVar87);
                          iVar84 = (int)((long)uVar62 / (long)(int)local_2e0);
                          local_370 = CONCAT44(local_370._4_4_,iVar84);
                          local_330 = (void *)CONCAT44(local_330._4_4_,iVar73);
                          local_364 = (int)((long)uVar77 / (long)(int)local_2e0);
                          local_3e8 = (void *)CONCAT44(local_3e8._4_4_,iVar71);
                          iVar100 = (int)((long)uVar62 % (long)(int)local_2e0);
                          local_3f0 = CONCAT44(local_3f0._4_4_,iVar100);
                          local_250 = CONCAT44(local_250._4_4_,iVar66);
                          if ((int)uVar105 < 8) {
                            uVar77 = 0;
                            auVar129 = (undefined1  [16])0x0;
                            auVar158 = (undefined1  [16])0x0;
                            auVar128 = (undefined1  [16])0x0;
                          }
                          else {
                            lVar110 = (long)local_3b8.w * local_3b8.elemsize;
                            auVar138 = ZEXT1664((undefined1  [16])0x0);
                            auVar145 = ZEXT1664((undefined1  [16])0x0);
                            auVar141 = ZEXT1664((undefined1  [16])0x0);
                            iVar78 = 0;
                            do {
                              if (0 < (int)uVar108) {
                                lVar112 = (long)(iVar78 / iVar54) *
                                          local_3b8.cstep * local_3b8.elemsize;
                                uVar77 = 0;
                                do {
                                  lVar96 = (long)*(int *)(opt_q._0_8_ + uVar77 * 4);
                                  puVar98 = (ulong *)((long)local_3b8.data +
                                                     lVar96 + lVar112 + (iVar66 * iVar51) * lVar110
                                                                        + (long)(int)(iVar73 * 
                                                  local_3bc));
                                  puVar69 = (ulong *)((long)local_3b8.data +
                                                     lVar96 + lVar112 + (local_364 * iVar51) *
                                                                        lVar110 + (long)(int)(iVar87
                                                                                             * 
                                                  local_3bc));
                                  puVar2 = (ulong *)((long)local_3b8.data +
                                                    lVar96 + lVar112 + (iVar84 * iVar51) * lVar110 +
                                                                       (long)(int)(iVar100 *
                                                                                  local_3bc));
                                  puVar104 = (ulong *)((long)local_3b8.data +
                                                      lVar96 + lVar112 + (iVar109 * iVar51) *
                                                                         lVar110 + (long)(int)(
                                                  iVar71 * local_3bc));
                                  if (iVar54 == 8) {
                                    auVar142._8_8_ = 0;
                                    auVar142._0_8_ = *puVar98;
                                    auVar151._8_8_ = 0;
                                    auVar151._0_8_ = *puVar69;
                                    auVar160._8_8_ = 0;
                                    auVar160._0_8_ = *puVar2;
                                    auVar165._8_8_ = 0;
                                    auVar165._0_8_ = *puVar104;
                                  }
                                  else {
                                    auVar122 = vpinsrb_avx(ZEXT116((byte)*puVar98),
                                                           (uint)*(byte *)((long)puVar98 + lVar93),1
                                                          );
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar98 +
                                                                                   lVar93 * 2),2);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar98 +
                                                                                   lVar56),3);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar98 +
                                                                                   lVar93 * 4),4);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar98 +
                                                                                   lVar68),5);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar98 +
                                                                                   lVar75),6);
                                    auVar142 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar98 +
                                                                                   lVar85),7);
                                    auVar122 = vpinsrb_avx(ZEXT116((byte)*puVar69),
                                                           (uint)*(byte *)((long)puVar69 + lVar93),1
                                                          );
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar69 +
                                                                                   lVar93 * 2),2);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar69 +
                                                                                   lVar56),3);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar69 +
                                                                                   lVar93 * 4),4);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar69 +
                                                                                   lVar68),5);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar69 +
                                                                                   lVar75),6);
                                    auVar151 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar69 +
                                                                                   lVar85),7);
                                    auVar122 = vpinsrb_avx(ZEXT116((byte)*puVar2),
                                                           (uint)*(byte *)((long)puVar2 + lVar93),1)
                                    ;
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar2 +
                                                                                   lVar93 * 2),2);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar2 +
                                                                                   lVar56),3);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar2 +
                                                                                   lVar93 * 4),4);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar2 +
                                                                                   lVar68),5);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar2 +
                                                                                   lVar75),6);
                                    auVar160 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar2 +
                                                                                   lVar85),7);
                                    auVar122 = vpinsrb_avx(ZEXT116((byte)*puVar104),
                                                           (uint)*(byte *)((long)puVar104 + lVar93),
                                                           1);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar104 +
                                                                                   lVar93 * 2),2);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar104 +
                                                                                   lVar56),3);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar104 +
                                                                                   lVar93 * 4),4);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar104 +
                                                                                   lVar68),5);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar104 +
                                                                                   lVar75),6);
                                    auVar165 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar104 +
                                                                                   lVar85),7);
                                  }
                                  auVar122 = vpmovsxbw_avx(auVar142);
                                  auVar128 = vpmovsxbw_avx(auVar151);
                                  auVar129 = vpmovsxbw_avx(auVar160);
                                  auVar158 = vpmovsxbw_avx(auVar165);
                                  auVar5._8_8_ = 0;
                                  auVar5._0_8_ = *(ulong *)((long)pvVar57 + uVar77 * 8);
                                  auVar149 = vpmovsxbw_avx(auVar5);
                                  auVar122 = vpmaddwd_avx(auVar149,auVar122);
                                  auVar122 = vpaddd_avx(auVar122,auVar133._0_16_);
                                  auVar133 = ZEXT1664(auVar122);
                                  auVar122 = vpmaddwd_avx(auVar149,auVar128);
                                  auVar122 = vpaddd_avx(auVar122,auVar141._0_16_);
                                  auVar141 = ZEXT1664(auVar122);
                                  auVar122 = vpmaddwd_avx(auVar149,auVar129);
                                  auVar122 = vpaddd_avx(auVar122,auVar145._0_16_);
                                  auVar145 = ZEXT1664(auVar122);
                                  auVar122 = vpmaddwd_avx(auVar149,auVar158);
                                  auVar122 = vpaddd_avx(auVar122,auVar138._0_16_);
                                  auVar138 = ZEXT1664(auVar122);
                                  uVar77 = uVar77 + 1;
                                } while (uVar114 != uVar77);
                                pvVar57 = (void *)((long)pvVar57 + uVar114 * 8);
                              }
                              auVar129 = auVar141._0_16_;
                              auVar158 = auVar145._0_16_;
                              auVar122 = auVar133._0_16_;
                              auVar128 = auVar138._0_16_;
                              iVar89 = iVar78 + 0xf;
                              iVar78 = iVar78 + 8;
                            } while (iVar89 < (int)uVar105);
                            uVar77 = (ulong)local_3c0;
                          }
                          auVar128 = vphaddd_avx(auVar158,auVar128);
                          auVar122 = vphaddd_avx(auVar122,auVar129);
                          auVar122 = vphaddd_avx(auVar122,auVar128);
                          auVar133 = ZEXT1664(auVar122);
                          if ((int)((uint)uVar77 | 1) < (int)uVar105) {
                            lVar110 = (long)local_3b8.w * local_3b8.elemsize;
                            do {
                              if (0 < (int)uVar108) {
                                lVar67 = local_3b8.cstep * local_3b8.elemsize * uVar77;
                                lVar112 = lVar67 + (iVar66 * iVar51) * lVar110 +
                                                   (long)(int)(iVar73 * uVar97);
                                lVar96 = lVar67 + (local_364 * iVar51) * lVar110 +
                                                  (long)(int)(iVar87 * uVar97);
                                lVar103 = lVar67 + (iVar84 * iVar51) * lVar110 +
                                                   (long)(int)(iVar100 * uVar97);
                                lVar67 = lVar67 + (iVar109 * iVar51) * lVar110 +
                                                  (long)(int)(iVar71 * uVar97);
                                uVar62 = 0;
                                do {
                                  lVar60 = (long)*(int *)(opt_q._0_8_ + uVar62 * 4);
                                  auVar122 = vpinsrw_avx(ZEXT416((uint)(int)*(char *)((long)
                                                  local_3b8.data + lVar60 + lVar112)),
                                                  (int)*(char *)((long)local_3b8.data +
                                                                lVar93 + lVar60 + lVar112),1);
                                  auVar122 = vpinsrw_avx(auVar122,(int)*(char *)((long)local_3b8.
                                                                                       data +
                                                                                lVar60 + lVar96),2);
                                  auVar122 = vpinsrw_avx(auVar122,(int)*(char *)((long)local_3b8.
                                                                                       data +
                                                                                lVar93 + lVar60 + 
                                                  lVar96),3);
                                  auVar122 = vpinsrw_avx(auVar122,(int)*(char *)((long)local_3b8.
                                                                                       data +
                                                                                lVar60 + lVar103),4)
                                  ;
                                  auVar122 = vpinsrw_avx(auVar122,(int)*(char *)((long)local_3b8.
                                                                                       data +
                                                                                lVar93 + lVar60 + 
                                                  lVar103),5);
                                  auVar122 = vpinsrw_avx(auVar122,(int)*(char *)((long)local_3b8.
                                                                                       data +
                                                                                lVar60 + lVar67),6);
                                  auVar122 = vpinsrw_avx(auVar122,(int)*(char *)((long)local_3b8.
                                                                                       data +
                                                                                lVar93 + lVar60 + 
                                                  lVar67),7);
                                  auVar128 = vpmovsxbw_avx(ZEXT216(*(ushort *)
                                                                    ((long)pvVar57 + uVar62 * 2)));
                                  auVar128 = vpshufd_avx(auVar128,0);
                                  auVar122 = vpmaddwd_avx(auVar122,auVar128);
                                  auVar122 = vpaddd_avx(auVar122,auVar133._0_16_);
                                  auVar133 = ZEXT1664(auVar122);
                                  uVar62 = uVar62 + 1;
                                } while (uVar114 != uVar62);
                                pvVar57 = (void *)((long)pvVar57 + local_3c8);
                              }
                              uVar77 = uVar77 + 2;
                            } while ((int)((uint)uVar77 | 1) < (int)uVar105);
                          }
                          auVar122 = auVar133._0_16_;
                          if ((int)uVar77 < (int)uVar105) {
                            lVar110 = (long)local_3b8.w * local_3b8.elemsize;
                            uVar77 = uVar77 & 0xffffffff;
                            do {
                              if (0 < (int)uVar108) {
                                lVar112 = local_3b8.cstep * local_3b8.elemsize * uVar77;
                                uVar62 = 0;
                                do {
                                  lVar96 = (long)*(int *)(opt_q._0_8_ + uVar62 * 4);
                                  auVar122 = vpshuflw_avx(ZEXT416((uint)(int)*(char *)((long)pvVar57
                                                                                      + uVar62)),0);
                                  auVar129 = vpshufd_avx(auVar122,0);
                                  auVar122 = vpinsrw_avx(ZEXT416((int)*(char *)((long)local_3b8.data
                                                                               + lVar96 + lVar112 + 
                                                  (iVar66 * iVar51) * lVar110 +
                                                  (long)(int)(iVar73 * uVar97)) & 0xffff),
                                                  (int)*(char *)((long)local_3b8.data +
                                                                lVar96 + lVar112 + (local_364 *
                                                                                   iVar51) * lVar110
                                                                                   + (long)(int)(
                                                  iVar87 * uVar97)),1);
                                  auVar122 = vpinsrw_avx(auVar122,(int)*(char *)((long)local_3b8.
                                                                                       data +
                                                                                lVar96 + lVar112 + (
                                                  iVar84 * iVar51) * lVar110 +
                                                  (long)(int)(iVar100 * uVar97)),2);
                                  auVar122 = vpinsrw_avx(auVar122,(int)*(char *)((long)local_3b8.
                                                                                       data +
                                                                                lVar96 + lVar112 + (
                                                  iVar109 * iVar51) * lVar110 +
                                                  (long)(int)(iVar71 * uVar97)),3);
                                  auVar128 = vpmullw_avx(auVar122,auVar129);
                                  auVar122 = vpmulhw_avx(auVar122,auVar129);
                                  auVar122 = vpunpcklwd_avx(auVar128,auVar122);
                                  auVar122 = vpaddd_avx(auVar133._0_16_,auVar122);
                                  auVar133 = ZEXT1664(auVar122);
                                  uVar62 = uVar62 + 1;
                                } while (uVar114 != uVar62);
                                pvVar57 = (void *)((long)pvVar57 + lVar76);
                              }
                              auVar122 = auVar133._0_16_;
                              uVar77 = uVar77 + 1;
                            } while ((int)uVar77 < (int)uVar105);
                          }
                          *local_410 = auVar122;
                          local_410 = local_410 + 1;
                          uVar65 = uVar83 + 4;
                          iVar71 = uVar83 + 7;
                          uVar83 = uVar65;
                        } while (iVar71 < (int)uVar106);
                      }
                      uVar52 = uVar65 | 1;
                      if ((int)uVar52 < (int)uVar106) {
                        uVar83 = uVar82 + 3;
                        if (-1 < (int)uVar82) {
                          uVar83 = uVar82;
                        }
                        local_3f8 = (void *)((long)(int)((uVar82 - (((uint)(local_338 >> 0x1f) & 1)
                                                                    + uVar82 & 0xfffffffe)) +
                                                         ((int)uVar83 >> 2) +
                                                        (int)(uVar82 - (uVar83 & 0xfffffffc)) / 2) *
                                             (this->weight_data_tm).cstep *
                                             (this->weight_data_tm).elemsize +
                                            (long)(this->weight_data_tm).data);
                        local_3e8 = local_3b8.data;
                        local_3f0 = local_3b8.elemsize;
                        lVar110 = local_3b8.cstep * local_3b8.elemsize;
                        uVar83 = uVar65;
                        do {
                          iVar87 = (int)uVar83 / (int)local_2e0;
                          iVar100 = (int)uVar83 % (int)local_2e0;
                          uVar77 = (long)(int)uVar52 / (long)(int)local_2e0;
                          iVar71 = (int)uVar52 % (int)local_2e0;
                          local_3e0 = CONCAT44(local_3e0._4_4_,iVar87);
                          pvVar57 = local_3f8;
                          if ((int)uVar105 < 8) {
                            uVar80 = 0;
                            auVar128 = (undefined1  [16])0x0;
                            auVar122 = (undefined1  [16])0x0;
                            uVar62 = uVar77;
                          }
                          else {
                            auVar133 = ZEXT1664((undefined1  [16])0x0);
                            auVar138 = ZEXT1664((undefined1  [16])0x0);
                            iVar73 = 0;
                            do {
                              if (0 < (int)uVar108) {
                                lVar112 = (iVar73 / iVar54) * lVar110;
                                uVar62 = 0;
                                do {
                                  lVar96 = (long)*(int *)(opt_q._0_8_ + uVar62 * 4);
                                  puVar98 = (ulong *)((long)local_3b8.data +
                                                     lVar96 + lVar112 + (long)(iVar87 * iVar51) *
                                                                        (long)local_3b8.w *
                                                                        local_3b8.elemsize +
                                                                        (long)(int)(iVar100 *
                                                                                   local_3bc));
                                  puVar69 = (ulong *)((long)local_3b8.data +
                                                     lVar96 + lVar112 + (long)((int)uVar77 * iVar51)
                                                                        * (long)local_3b8.w *
                                                                          local_3b8.elemsize +
                                                                        (long)(int)(iVar71 * 
                                                  local_3bc));
                                  if (iVar54 == 8) {
                                    auVar134._8_8_ = 0;
                                    auVar134._0_8_ = *puVar98;
                                    auVar140._8_8_ = 0;
                                    auVar140._0_8_ = *puVar69;
                                  }
                                  else {
                                    auVar122 = vpinsrb_avx(ZEXT116((byte)*puVar98),
                                                           (uint)*(byte *)((long)puVar98 + lVar93),1
                                                          );
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar98 +
                                                                                   lVar93 * 2),2);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar98 +
                                                                                   lVar56),3);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar98 +
                                                                                   lVar93 * 4),4);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar98 +
                                                                                   lVar68),5);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar98 +
                                                                                   lVar75),6);
                                    auVar134 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar98 +
                                                                                   lVar85),7);
                                    auVar122 = vpinsrb_avx(ZEXT116((byte)*puVar69),
                                                           (uint)*(byte *)((long)puVar69 + lVar93),1
                                                          );
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar69 +
                                                                                   lVar93 * 2),2);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar69 +
                                                                                   lVar56),3);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar69 +
                                                                                   lVar93 * 4),4);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar69 +
                                                                                   lVar68),5);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar69 +
                                                                                   lVar75),6);
                                    auVar140 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar69 +
                                                                                   lVar85),7);
                                  }
                                  auVar122 = vpmovsxbw_avx(auVar134);
                                  auVar128 = vpmovsxbw_avx(auVar140);
                                  auVar6._8_8_ = 0;
                                  auVar6._0_8_ = *(ulong *)((long)pvVar57 + uVar62 * 8);
                                  auVar129 = vpmovsxbw_avx(auVar6);
                                  auVar122 = vpmaddwd_avx(auVar122,auVar129);
                                  auVar122 = vpaddd_avx(auVar122,auVar138._0_16_);
                                  auVar138 = ZEXT1664(auVar122);
                                  auVar122 = vpmaddwd_avx(auVar128,auVar129);
                                  auVar122 = vpaddd_avx(auVar122,auVar133._0_16_);
                                  auVar133 = ZEXT1664(auVar122);
                                  uVar62 = uVar62 + 1;
                                } while (uVar114 != uVar62);
                                pvVar57 = (void *)((long)pvVar57 + lVar55);
                              }
                              auVar122 = auVar133._0_16_;
                              auVar128 = auVar138._0_16_;
                              iVar66 = iVar73 + 0xf;
                              iVar73 = iVar73 + 8;
                            } while (iVar66 < (int)uVar105);
                            uVar80 = (ulong)local_3c0;
                            uVar62 = uVar77 & 0xffffffff;
                          }
                          uVar94 = uVar62 & 0xffffffff;
                          iVar84 = (int)uVar62;
                          auVar128 = vphaddd_avx(auVar128,auVar128);
                          auVar128 = vphaddd_avx(auVar128,auVar128);
                          auVar122 = vphaddd_avx(auVar122,auVar122);
                          iVar66 = auVar128._0_4_;
                          auVar122 = vphaddd_avx(auVar122,auVar122);
                          iVar73 = auVar122._0_4_;
                          if ((int)((uint)uVar80 | 1) < (int)uVar105) {
                            iVar109 = iVar84 * iVar51;
                            do {
                              if (0 < (int)uVar108) {
                                lVar112 = uVar80 * lVar110 +
                                          (long)(iVar87 * iVar51) *
                                          (long)local_3b8.w * local_3b8.elemsize +
                                          (long)(int)(iVar100 * uVar97);
                                lVar96 = uVar80 * lVar110 +
                                         (long)iVar109 * (long)local_3b8.w * local_3b8.elemsize +
                                         (long)(int)(iVar71 * uVar97);
                                uVar62 = 0;
                                do {
                                  lVar103 = (long)*(int *)(opt_q._0_8_ + uVar62 * 4);
                                  iVar84 = (int)*(char *)((long)pvVar57 + uVar62 * 2);
                                  iVar78 = (int)*(char *)((long)pvVar57 + uVar62 * 2 + 1);
                                  iVar66 = *(char *)((long)local_3b8.data +
                                                    lVar93 + lVar103 + lVar112) * iVar78 +
                                           *(char *)((long)local_3b8.data + lVar103 + lVar112) *
                                           iVar84 + iVar66;
                                  iVar73 = *(char *)((long)local_3b8.data +
                                                    lVar93 + lVar103 + lVar96) * iVar78 +
                                           *(char *)((long)local_3b8.data + lVar103 + lVar96) *
                                           iVar84 + iVar73;
                                  uVar62 = uVar62 + 1;
                                } while (uVar114 != uVar62);
                                pvVar57 = (void *)((long)pvVar57 + lVar61);
                                uVar94 = uVar77 & 0xffffffff;
                              }
                              iVar84 = (int)uVar94;
                              uVar80 = uVar80 + 2;
                            } while ((int)((uint)uVar80 | 1) < (int)uVar105);
                          }
                          if ((int)uVar80 < (int)uVar105) {
                            uVar80 = uVar80 & 0xffffffff;
                            do {
                              if (0 < (int)uVar108) {
                                uVar77 = 0;
                                do {
                                  lVar112 = (long)*(int *)(opt_q._0_8_ + uVar77 * 4);
                                  iVar66 = iVar66 + (int)*(char *)((long)local_3b8.data +
                                                                  lVar112 + uVar80 * lVar110 +
                                                                            (long)(iVar87 * iVar51)
                                                                            * (long)local_3b8.w *
                                                                              local_3b8.elemsize +
                                                                            (long)(int)(iVar100 *
                                                                                       uVar97)) *
                                                    (int)*(char *)((long)pvVar57 + uVar77);
                                  iVar73 = iVar73 + (int)*(char *)((long)local_3b8.data +
                                                                  lVar112 + uVar80 * lVar110 +
                                                                            (long)(iVar84 * iVar51)
                                                                            * (long)local_3b8.w *
                                                                              local_3b8.elemsize +
                                                                            (long)(int)(iVar71 * 
                                                  uVar97)) * (int)*(char *)((long)pvVar57 + uVar77);
                                  uVar77 = uVar77 + 1;
                                } while (uVar114 != uVar77);
                                pvVar57 = (void *)((long)pvVar57 + lVar76);
                              }
                              uVar80 = uVar80 + 1;
                            } while ((int)uVar80 < (int)uVar105);
                          }
                          *(int *)*local_410 = iVar66;
                          *(int *)((long)*local_410 + 4) = iVar73;
                          local_410 = (undefined1 (*) [16])((long)*local_410 + 8);
                          uVar65 = uVar83 + 2;
                          uVar52 = uVar83 + 3;
                          uVar83 = uVar65;
                        } while ((int)uVar52 < (int)uVar106);
                      }
                      if ((int)uVar65 < (int)uVar106) {
                        uVar52 = uVar82 + 3;
                        if (-1 < (int)uVar82) {
                          uVar52 = uVar82;
                        }
                        pvVar57 = (void *)((long)(int)((uVar82 - (((uint)(local_338 >> 0x1f) & 1) +
                                                                  uVar82 & 0xfffffffe)) +
                                                       ((int)uVar52 >> 2) +
                                                      (int)(uVar82 - (uVar52 & 0xfffffffc)) / 2) *
                                           (this->weight_data_tm).cstep *
                                           (this->weight_data_tm).elemsize +
                                          (long)(this->weight_data_tm).data);
                        lVar110 = local_3b8.cstep * local_3b8.elemsize;
                        do {
                          iVar87 = (int)uVar65 / (int)local_2e0;
                          iVar71 = (int)uVar65 % (int)local_2e0;
                          pvVar113 = pvVar57;
                          if ((int)uVar105 < 8) {
                            uVar77 = 0;
                            auVar122 = (undefined1  [16])0x0;
                          }
                          else {
                            auVar133 = ZEXT1664((undefined1  [16])0x0);
                            iVar100 = 0;
                            do {
                              if (0 < (int)uVar108) {
                                uVar77 = 0;
                                do {
                                  puVar98 = (ulong *)((long)local_3b8.data +
                                                     (long)*(int *)(opt_q._0_8_ + uVar77 * 4) +
                                                     (iVar100 / iVar54) * lVar110 +
                                                     (long)local_3b8.w * local_3b8.elemsize *
                                                     (long)(iVar87 * iVar51) +
                                                     (long)(int)(iVar71 * local_3bc));
                                  if (iVar54 == 8) {
                                    auVar127._8_8_ = 0;
                                    auVar127._0_8_ = *puVar98;
                                  }
                                  else {
                                    auVar122 = vpinsrb_avx(ZEXT116((byte)*puVar98),
                                                           (uint)*(byte *)((long)puVar98 + lVar93),1
                                                          );
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar98 +
                                                                                   lVar93 * 2),2);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar98 +
                                                                                   lVar56),3);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar98 +
                                                                                   lVar93 * 4),4);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar98 +
                                                                                   lVar68),5);
                                    auVar122 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar98 +
                                                                                   lVar75),6);
                                    auVar127 = vpinsrb_avx(auVar122,(uint)*(byte *)((long)puVar98 +
                                                                                   lVar85),7);
                                  }
                                  auVar122 = vpmovsxbw_avx(auVar127);
                                  auVar7._8_8_ = 0;
                                  auVar7._0_8_ = *(ulong *)((long)pvVar113 + uVar77 * 8);
                                  auVar128 = vpmovsxbw_avx(auVar7);
                                  auVar122 = vpmaddwd_avx(auVar122,auVar128);
                                  auVar122 = vpaddd_avx(auVar122,auVar133._0_16_);
                                  auVar133 = ZEXT1664(auVar122);
                                  uVar77 = uVar77 + 1;
                                } while (uVar114 != uVar77);
                                pvVar113 = (void *)((long)pvVar113 + lVar55);
                              }
                              auVar122 = auVar133._0_16_;
                              iVar73 = iVar100 + 0xf;
                              iVar100 = iVar100 + 8;
                            } while (iVar73 < (int)uVar105);
                            uVar77 = (ulong)local_3c0;
                          }
                          auVar122 = vphaddd_avx(auVar122,auVar122);
                          auVar122 = vphaddd_avx(auVar122,auVar122);
                          iVar100 = auVar122._0_4_;
                          if ((int)((uint)uVar77 | 1) < (int)uVar105) {
                            do {
                              if (0 < (int)uVar108) {
                                lVar112 = uVar77 * lVar110 +
                                          (long)local_3b8.w * local_3b8.elemsize *
                                          (long)(iVar87 * iVar51) + (long)(int)(iVar71 * uVar97);
                                uVar62 = 0;
                                do {
                                  lVar96 = (long)*(int *)(opt_q._0_8_ + uVar62 * 4);
                                  iVar100 = (int)*(char *)((long)pvVar113 + uVar62 * 2 + 1) *
                                            (int)*(char *)((long)local_3b8.data +
                                                          lVar93 + lVar96 + lVar112) +
                                            (int)*(char *)((long)pvVar113 + uVar62 * 2) *
                                            (int)*(char *)((long)local_3b8.data + lVar96 + lVar112)
                                            + iVar100;
                                  uVar62 = uVar62 + 1;
                                } while (uVar114 != uVar62);
                                pvVar113 = (void *)((long)pvVar113 + lVar61);
                              }
                              uVar77 = uVar77 + 2;
                            } while ((int)((uint)uVar77 | 1) < (int)uVar105);
                          }
                          if ((int)uVar77 < (int)uVar105) {
                            uVar77 = uVar77 & 0xffffffff;
                            do {
                              if (0 < (int)uVar108) {
                                uVar62 = 0;
                                do {
                                  iVar100 = iVar100 + (int)*(char *)((long)pvVar113 + uVar62) *
                                                      (int)*(char *)((long)local_3b8.data +
                                                                    (long)*(int *)(opt_q._0_8_ +
                                                                                  uVar62 * 4) +
                                                                    uVar77 * lVar110 +
                                                                    (long)(iVar87 * iVar51) *
                                                                    local_3b8.elemsize *
                                                                    (long)local_3b8.w +
                                                                    (long)(int)(iVar71 * uVar97));
                                  uVar62 = uVar62 + 1;
                                } while (uVar114 != uVar62);
                                pvVar113 = (void *)((long)pvVar113 + lVar76);
                              }
                              uVar77 = uVar77 + 1;
                            } while ((int)uVar77 < (int)uVar105);
                          }
                          *(int *)*local_410 = iVar100;
                          local_410 = (undefined1 (*) [16])((long)*local_410 + 4);
                          uVar65 = uVar65 + 1;
                        } while (uVar65 != uVar106);
                      }
                      uVar77 = local_338 + 1;
                    } while (local_338 + 1 != (long)(int)uVar95);
                  }
                  local_bc = iVar72;
                  local_68 = (ulong)uVar95;
                  if (opt_q._0_8_ != 0) {
                    operator_delete((void *)opt_q._0_8_,
                                    (long)opt_q.workspace_allocator - opt_q._0_8_);
                  }
                  local_498 = 0;
                  goto LAB_001dcba9;
                }
                convolution_packed_int8_xop
                          (&local_3b8,&local_328,&this->weight_data_tm,auVar128._0_4_,
                           local_3d8._4_4_,local_3d8._8_4_,local_3d8._12_4_,uVar97,iVar51,local_358)
                ;
              }
              else {
                convolution_packed_int8_avx2
                          (&local_3b8,&local_328,&this->weight_data_tm,auVar128._0_4_,
                           local_3d8._4_4_,local_3d8._8_4_,local_3d8._12_4_,uVar97,iVar51,local_358)
                ;
              }
              local_498 = 0;
            }
          }
LAB_001dcba9:
          pOVar1 = local_358;
          if (local_498 == 0) {
            if (local_358->use_packing_layout == true) {
              if (iVar8 < 0x65) {
                if ((local_328.elempack == 4) && ((local_328.c & 1U) == 0)) {
                  local_298[0] = 0;
                  opt_q.lightmode = false;
                  opt_q.use_shader_pack8 = false;
                  opt_q.use_subgroup_ops = false;
                  opt_q.use_reserved_0 = false;
                  opt_q.num_threads = 0;
                  opt_q.blob_allocator._0_4_ = 0;
                  opt_q.blob_allocator._4_4_ = 0;
                  opt_q.workspace_allocator = (Allocator *)0x0;
                  opt_q.openmp_blocktime = 0;
                  opt_q.use_bf16_storage = false;
                  opt_q.use_fp16_packed = false;
                  opt_q.use_fp16_storage = false;
                  opt_q.use_fp16_arithmetic = false;
                  opt_q.use_int8_packed = false;
                  opt_q.use_int8_storage = false;
                  opt_q.use_int8_arithmetic = false;
                  opt_q.use_packing_layout = false;
                  opt_q.vulkan_device_index = 0;
                  opt_q.use_reserved_1 = false;
                  opt_q.use_image_storage = false;
                  opt_q.use_tensor_storage = false;
                  opt_q.use_reserved_2 = false;
                  opt_q.flush_denormals = 0;
                  opt_q.use_local_pool_allocator = false;
                  opt_q.use_shader_local_memory = false;
                  opt_q.use_cooperative_matrix = false;
                  opt_q.use_winograd23_convolution = false;
                  opt_q.use_winograd43_convolution = false;
                  opt_q.use_winograd63_convolution = false;
                  opt_q.use_a53_a55_optimized_kernel = false;
                  opt_q.use_fp16_uniform = false;
                  convert_packing(&local_328,(Mat *)&opt_q,8,local_358);
                  piVar81 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
                  if (piVar81 != (int *)0x0) {
                    LOCK();
                    *piVar81 = *piVar81 + 1;
                    UNLOCK();
                  }
                  piVar81 = (int *)CONCAT44(local_328.refcount._4_4_,local_328.refcount._0_4_);
                  if (piVar81 != (int *)0x0) {
                    LOCK();
                    *piVar81 = *piVar81 + -1;
                    UNLOCK();
                    if (*piVar81 == 0) {
                      if (local_328.allocator == (Allocator *)0x0) {
                        if (local_328.data != (void *)0x0) {
                          free(local_328.data);
                        }
                      }
                      else {
                        (*(local_328.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  piVar81 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
                  local_328.data = (void *)opt_q._0_8_;
                  local_328.refcount._0_4_ = opt_q.blob_allocator._0_4_;
                  local_328.refcount._4_4_ = opt_q.blob_allocator._4_4_;
                  local_328.elemsize = (size_t)opt_q.workspace_allocator;
                  local_328.elempack = opt_q.openmp_blocktime;
                  local_328.allocator = (Allocator *)opt_q._32_8_;
                  local_328.dims = opt_q.vulkan_device_index;
                  local_328.w._0_1_ = opt_q.use_reserved_1;
                  local_328.w._1_1_ = opt_q.use_image_storage;
                  local_328.w._2_1_ = opt_q.use_tensor_storage;
                  local_328.w._3_1_ = opt_q.use_reserved_2;
                  local_328.h = opt_q.flush_denormals;
                  local_328.d._0_1_ = opt_q.use_local_pool_allocator;
                  local_328.d._1_1_ = opt_q.use_shader_local_memory;
                  local_328.d._2_1_ = opt_q.use_cooperative_matrix;
                  local_328.d._3_1_ = opt_q.use_winograd23_convolution;
                  local_328.c._0_1_ = opt_q.use_winograd43_convolution;
                  local_328.c._1_1_ = opt_q.use_winograd63_convolution;
                  local_328.c._2_1_ = opt_q.use_a53_a55_optimized_kernel;
                  local_328.c._3_1_ = opt_q.use_fp16_uniform;
                  local_328.cstep = local_298[0];
                  if (piVar81 != (int *)0x0) {
                    LOCK();
                    *piVar81 = *piVar81 + -1;
                    UNLOCK();
                    if (*piVar81 == 0) {
                      iVar51 = opt_q._44_4_;
                      iVar54 = opt_q._52_4_;
                      uVar97 = opt_q._56_4_;
                      if (opt_q._32_8_ == 0) goto joined_r0x001dd080;
                      (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
                    }
                  }
                  goto LAB_001dd181;
                }
              }
              else {
                if ((local_328.elempack == 4) && ((local_328.c & 0x80000001U) == 1)) {
                  local_298[0] = 0;
                  opt_q.lightmode = false;
                  opt_q.use_shader_pack8 = false;
                  opt_q.use_subgroup_ops = false;
                  opt_q.use_reserved_0 = false;
                  opt_q.num_threads = 0;
                  opt_q.blob_allocator._0_4_ = 0;
                  opt_q.blob_allocator._4_4_ = 0;
                  opt_q.workspace_allocator = (Allocator *)0x0;
                  opt_q.openmp_blocktime = 0;
                  opt_q.use_bf16_storage = false;
                  opt_q.use_fp16_packed = false;
                  opt_q.use_fp16_storage = false;
                  opt_q.use_fp16_arithmetic = false;
                  opt_q.use_int8_packed = false;
                  opt_q.use_int8_storage = false;
                  opt_q.use_int8_arithmetic = false;
                  opt_q.use_packing_layout = false;
                  opt_q.vulkan_device_index = 0;
                  opt_q.use_reserved_1 = false;
                  opt_q.use_image_storage = false;
                  opt_q.use_tensor_storage = false;
                  opt_q.use_reserved_2 = false;
                  opt_q.flush_denormals = 0;
                  opt_q.use_local_pool_allocator = false;
                  opt_q.use_shader_local_memory = false;
                  opt_q.use_cooperative_matrix = false;
                  opt_q.use_winograd23_convolution = false;
                  opt_q.use_winograd43_convolution = false;
                  opt_q.use_winograd63_convolution = false;
                  opt_q.use_a53_a55_optimized_kernel = false;
                  opt_q.use_fp16_uniform = false;
                  convert_packing(&local_328,(Mat *)&opt_q,1,local_358);
                  piVar81 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
                  if (piVar81 != (int *)0x0) {
                    LOCK();
                    *piVar81 = *piVar81 + 1;
                    UNLOCK();
                  }
                  piVar81 = (int *)CONCAT44(local_328.refcount._4_4_,local_328.refcount._0_4_);
                  if (piVar81 != (int *)0x0) {
                    LOCK();
                    *piVar81 = *piVar81 + -1;
                    UNLOCK();
                    if (*piVar81 == 0) {
                      if (local_328.allocator == (Allocator *)0x0) {
                        if (local_328.data != (void *)0x0) {
                          free(local_328.data);
                        }
                      }
                      else {
                        (*(local_328.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  piVar81 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
                  local_328.data = (void *)opt_q._0_8_;
                  local_328.refcount._0_4_ = opt_q.blob_allocator._0_4_;
                  local_328.refcount._4_4_ = opt_q.blob_allocator._4_4_;
                  local_328.elemsize = (size_t)opt_q.workspace_allocator;
                  local_328.elempack = opt_q.openmp_blocktime;
                  local_328.allocator = (Allocator *)opt_q._32_8_;
                  local_328.dims = opt_q.vulkan_device_index;
                  local_328.w._0_1_ = opt_q.use_reserved_1;
                  local_328.w._1_1_ = opt_q.use_image_storage;
                  local_328.w._2_1_ = opt_q.use_tensor_storage;
                  local_328.w._3_1_ = opt_q.use_reserved_2;
                  local_328.h = opt_q.flush_denormals;
                  local_328.d._0_1_ = opt_q.use_local_pool_allocator;
                  local_328.d._1_1_ = opt_q.use_shader_local_memory;
                  local_328.d._2_1_ = opt_q.use_cooperative_matrix;
                  local_328.d._3_1_ = opt_q.use_winograd23_convolution;
                  local_328.c._0_1_ = opt_q.use_winograd43_convolution;
                  local_328.c._1_1_ = opt_q.use_winograd63_convolution;
                  local_328.c._2_1_ = opt_q.use_a53_a55_optimized_kernel;
                  local_328.c._3_1_ = opt_q.use_fp16_uniform;
                  local_328.cstep = local_298[0];
                  if (piVar81 != (int *)0x0) {
                    LOCK();
                    *piVar81 = *piVar81 + -1;
                    UNLOCK();
                    if (*piVar81 == 0) {
                      if (opt_q._32_8_ == 0) {
                        if (opt_q._0_8_ != 0) {
                          free((void *)opt_q._0_8_);
                        }
                      }
                      else {
                        (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
                      }
                    }
                  }
                  local_298[0] = 0;
                  opt_q.lightmode = false;
                  opt_q.use_shader_pack8 = false;
                  opt_q.use_subgroup_ops = false;
                  opt_q.use_reserved_0 = false;
                  opt_q.num_threads = 0;
                  opt_q.blob_allocator._0_4_ = 0;
                  opt_q.blob_allocator._4_4_ = 0;
                  opt_q.workspace_allocator = (Allocator *)0x0;
                  opt_q.openmp_blocktime = 0;
                  opt_q.vulkan_device_index = 0;
                  opt_q.use_reserved_1 = false;
                  opt_q.use_image_storage = false;
                  opt_q.use_tensor_storage = false;
                  opt_q.use_reserved_2 = false;
                  opt_q.flush_denormals = 0;
                  opt_q.use_local_pool_allocator = false;
                  opt_q.use_shader_local_memory = false;
                  opt_q.use_cooperative_matrix = false;
                  opt_q.use_winograd23_convolution = false;
                  opt_q.use_winograd43_convolution = false;
                  opt_q.use_winograd63_convolution = false;
                  opt_q.use_a53_a55_optimized_kernel = false;
                  opt_q.use_fp16_uniform = false;
                }
                if ((local_328.elempack == 4) && ((local_328.c & 1U) == 0)) {
                  local_298[0] = 0;
                  opt_q.lightmode = false;
                  opt_q.use_shader_pack8 = false;
                  opt_q.use_subgroup_ops = false;
                  opt_q.use_reserved_0 = false;
                  opt_q.num_threads = 0;
                  opt_q.blob_allocator._0_4_ = 0;
                  opt_q.blob_allocator._4_4_ = 0;
                  opt_q.workspace_allocator = (Allocator *)0x0;
                  opt_q.openmp_blocktime = 0;
                  opt_q.use_bf16_storage = false;
                  opt_q.use_fp16_packed = false;
                  opt_q.use_fp16_storage = false;
                  opt_q.use_fp16_arithmetic = false;
                  opt_q.use_int8_packed = false;
                  opt_q.use_int8_storage = false;
                  opt_q.use_int8_arithmetic = false;
                  opt_q.use_packing_layout = false;
                  opt_q.vulkan_device_index = 0;
                  opt_q.use_reserved_1 = false;
                  opt_q.use_image_storage = false;
                  opt_q.use_tensor_storage = false;
                  opt_q.use_reserved_2 = false;
                  opt_q.flush_denormals = 0;
                  opt_q.use_local_pool_allocator = false;
                  opt_q.use_shader_local_memory = false;
                  opt_q.use_cooperative_matrix = false;
                  opt_q.use_winograd23_convolution = false;
                  opt_q.use_winograd43_convolution = false;
                  opt_q.use_winograd63_convolution = false;
                  opt_q.use_a53_a55_optimized_kernel = false;
                  opt_q.use_fp16_uniform = false;
                  convert_packing(&local_328,(Mat *)&opt_q,8,pOVar1);
                  piVar81 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
                  if (piVar81 != (int *)0x0) {
                    LOCK();
                    *piVar81 = *piVar81 + 1;
                    UNLOCK();
                  }
                  piVar81 = (int *)CONCAT44(local_328.refcount._4_4_,local_328.refcount._0_4_);
                  if (piVar81 != (int *)0x0) {
                    LOCK();
                    *piVar81 = *piVar81 + -1;
                    UNLOCK();
                    if (*piVar81 == 0) {
                      if (local_328.allocator == (Allocator *)0x0) {
                        if (local_328.data != (void *)0x0) {
                          free(local_328.data);
                        }
                      }
                      else {
                        (*(local_328.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  piVar81 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
                  local_328.data = (void *)opt_q._0_8_;
                  local_328.refcount._0_4_ = opt_q.blob_allocator._0_4_;
                  local_328.refcount._4_4_ = opt_q.blob_allocator._4_4_;
                  local_328.elemsize = (size_t)opt_q.workspace_allocator;
                  local_328.elempack = opt_q.openmp_blocktime;
                  local_328.allocator = (Allocator *)opt_q._32_8_;
                  local_328.dims = opt_q.vulkan_device_index;
                  local_328.w._0_1_ = opt_q.use_reserved_1;
                  local_328.w._1_1_ = opt_q.use_image_storage;
                  local_328.w._2_1_ = opt_q.use_tensor_storage;
                  local_328.w._3_1_ = opt_q.use_reserved_2;
                  local_328.h = opt_q.flush_denormals;
                  local_328.d._0_1_ = opt_q.use_local_pool_allocator;
                  local_328.d._1_1_ = opt_q.use_shader_local_memory;
                  local_328.d._2_1_ = opt_q.use_cooperative_matrix;
                  local_328.d._3_1_ = opt_q.use_winograd23_convolution;
                  local_328.c._0_1_ = opt_q.use_winograd43_convolution;
                  local_328.c._1_1_ = opt_q.use_winograd63_convolution;
                  local_328.c._2_1_ = opt_q.use_a53_a55_optimized_kernel;
                  local_328.c._3_1_ = opt_q.use_fp16_uniform;
                  local_328.cstep = local_298[0];
                  if (piVar81 != (int *)0x0) {
                    LOCK();
                    *piVar81 = *piVar81 + -1;
                    UNLOCK();
                    if (*piVar81 == 0) {
                      iVar51 = opt_q._44_4_;
                      iVar54 = opt_q._52_4_;
                      uVar97 = opt_q._56_4_;
                      if (opt_q._32_8_ == 0) {
joined_r0x001dd080:
                        local_328.c = uVar97;
                        local_328.d = iVar54;
                        local_328.w = iVar51;
                        opt_q._32_8_ = local_328.allocator;
                        if (local_328.data != (void *)0x0) {
                          opt_q._0_8_ = local_328.data;
                          opt_q.blob_allocator._0_4_ = local_328.refcount._0_4_;
                          opt_q.blob_allocator._4_4_ = local_328.refcount._4_4_;
                          opt_q.workspace_allocator = (Allocator *)local_328.elemsize;
                          opt_q.openmp_blocktime = local_328.elempack;
                          opt_q.vulkan_device_index = local_328.dims;
                          opt_q._44_4_ = local_328.w;
                          opt_q.flush_denormals = local_328.h;
                          opt_q._52_4_ = local_328.d;
                          opt_q._56_4_ = local_328.c;
                          local_298[0] = local_328.cstep;
                          free(local_328.data);
                        }
                      }
                      else {
                        (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
                      }
                    }
                  }
LAB_001dd181:
                  local_298[0] = 0;
                  opt_q.lightmode = false;
                  opt_q.use_shader_pack8 = false;
                  opt_q.use_subgroup_ops = false;
                  opt_q.use_reserved_0 = false;
                  opt_q.num_threads = 0;
                  opt_q.blob_allocator._0_4_ = 0;
                  opt_q.blob_allocator._4_4_ = 0;
                  opt_q.workspace_allocator = (Allocator *)0x0;
                  opt_q.openmp_blocktime = 0;
                  opt_q.vulkan_device_index = 0;
                  opt_q.use_reserved_1 = false;
                  opt_q.use_image_storage = false;
                  opt_q.use_tensor_storage = false;
                  opt_q.use_reserved_2 = false;
                  opt_q.flush_denormals = 0;
                  opt_q.use_local_pool_allocator = false;
                  opt_q.use_shader_local_memory = false;
                  opt_q.use_cooperative_matrix = false;
                  opt_q.use_winograd23_convolution = false;
                  opt_q.use_winograd43_convolution = false;
                  opt_q.use_winograd63_convolution = false;
                  opt_q.use_a53_a55_optimized_kernel = false;
                  opt_q.use_fp16_uniform = false;
                }
              }
            }
            if (iVar8 < 0x65) {
              dequantize_from_int32
                        (&local_328,local_c8,&this->scale_in_data,
                         &(this->super_Convolution).bias_data,pOVar1);
              pLVar10 = this->activation;
              local_498 = 0;
              if (pLVar10 != (Layer *)0x0) {
                (*pLVar10->_vptr_Layer[9])(pLVar10,local_c8,local_358);
              }
            }
            else {
              local_498 = 0;
              requantize_from_int32_to_int8
                        (&local_328,local_c8,&this->scale_in_data,
                         &(this->super_Convolution).top_blob_int8_scales,
                         &(this->super_Convolution).bias_data,
                         (this->super_Convolution).activation_type,
                         &(this->super_Convolution).activation_params,pOVar1);
            }
          }
        }
        piVar81 = (int *)CONCAT44(local_328.refcount._4_4_,local_328.refcount._0_4_);
        if (piVar81 != (int *)0x0) {
          LOCK();
          *piVar81 = *piVar81 + -1;
          UNLOCK();
          if (*piVar81 == 0) {
            if (local_328.allocator == (Allocator *)0x0) {
              if (local_328.data != (void *)0x0) {
                free(local_328.data);
              }
            }
            else {
              (*(local_328.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_328.cstep = 0;
        local_328.data = (void *)0x0;
        local_328.refcount._0_4_ = 0;
        local_328.refcount._4_4_ = 0;
        local_328.elemsize = 0;
        local_328.elempack = 0;
        local_328.dims = 0;
        local_328.w = 0;
        local_328.h = 0;
        local_328.d = 0;
        local_328.c = 0;
      }
    }
  }
  piVar81 = (int *)CONCAT44(local_3b8.refcount._4_4_,local_3b8.refcount._0_4_);
  if (piVar81 != (int *)0x0) {
    LOCK();
    *piVar81 = *piVar81 + -1;
    UNLOCK();
    if (*piVar81 == 0) {
      if (local_3b8.allocator == (Allocator *)0x0) {
        if (local_3b8.data != (void *)0x0) {
          free(local_3b8.data);
        }
      }
      else {
        (*(local_3b8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_3b8.cstep = 0;
  local_3b8.data = (void *)0x0;
  local_3b8.refcount._0_4_ = 0;
  local_3b8.refcount._4_4_ = 0;
  local_3b8.elemsize = 0;
  local_3b8.elempack = 0;
  local_3b8.dims = 0;
  local_3b8.w = 0;
  local_3b8.h = 0;
  local_3b8.d = 0;
  local_3b8.c = 0;
LAB_001dd332:
  piVar81 = (int *)CONCAT44(local_b8._12_4_,local_b8._8_4_);
  if (piVar81 != (int *)0x0) {
    LOCK();
    *piVar81 = *piVar81 + -1;
    UNLOCK();
    if (*piVar81 == 0) {
      if ((Allocator *)local_b8._32_8_ == (Allocator *)0x0) {
        if ((void *)local_b8._0_8_ != (void *)0x0) {
          free((void *)local_b8._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_b8._32_8_)[3])();
      }
    }
  }
  return local_498;
}

Assistant:

int Convolution_x86_fma::forward_int8_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int elembits = bottom_blob.elembits();

    Mat bottom_blob_int8 = bottom_blob;
    if (elembits != 8)
    {
        Option opt_q = opt;
        opt_q.blob_allocator = opt.workspace_allocator;
        quantize_to_int8(bottom_blob, bottom_blob_int8, bottom_blob_int8_scales, opt_q);
        if (bottom_blob_int8.empty())
            return -100;
    }

    //     NCNN_LOGE("Convolution_x86_fma input %d x %d  ksize=%d %d  stride=%d %d", w, h, kernel_w, kernel_h, stride_w, stride_h);

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_int8, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    int w = bottom_blob_bordered.w;
    int h = bottom_blob_bordered.h;
    int channels = bottom_blob_bordered.c;
    int elempack = bottom_blob_bordered.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    bool use_int8_requantize = int8_scale_term > 100;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        if (use_int8_requantize)
            out_elempack = num_output % 8 == 0 ? 8 : 1;
        else
        {
#if __AVX512F__
            out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
            out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
            out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
        }
    }
#endif // __SSE2__
    size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

    //     NCNN_LOGE("forward_int8_x86 %d %d %d    %d %d", w, h, bottom_blob_bordered.c, elempack, out_elempack);

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    const int num_input = channels * elempack;

    int out_elempack_int32 = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        if (use_int8_requantize)
        {
#if __AVX__
            out_elempack_int32 = num_output % 8 == 0 ? 8 : 1;
#else
            out_elempack_int32 = num_output % 4 == 0 ? 4 : 1;
#endif
        }
        else
        {
#if __AVX512F__
            out_elempack_int32 = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
            out_elempack_int32 = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
            out_elempack_int32 = num_output % 4 == 0 ? 4 : 1;
#endif
        }
    }
#endif // __SSE2__

    bool prefer_winograd = (opt.use_winograd23_convolution || opt.use_winograd43_convolution) && (num_input > 8 || num_output > 8);

#if __SSE2__
    if (opt.use_packing_layout)
    {
        if ((opt.use_winograd_convolution && prefer_winograd && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1) || (!opt.use_sgemm_convolution))
        {
            // TODO implement winograd and packed int8 avx pack8 output
            out_elempack_int32 = num_output % 4 == 0 ? 4 : 1;
        }
    }
#endif // __SSE2__

    Mat top_blob_int32;
    top_blob_int32.create(outw, outh, num_output / out_elempack_int32, (size_t)(4u * out_elempack_int32), out_elempack_int32, opt.workspace_allocator);
    if (top_blob_int32.empty())
        return -100;

    int _nT = nT ? nT : opt.num_threads;
    if (nT != 0 && opt.num_threads != nT)
    {
        // force num_threads the same as in create_pipeline
        // so we could use pre-packed A/B from the same tile config
        NCNN_LOGE("opt.num_threads %d changed, convolution gemm will use load-time value %d", opt.num_threads, nT);
    }

    int ret = 0;
    if (opt.use_winograd_convolution && prefer_winograd && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
    {
        if (opt.use_winograd43_convolution && !weight_winograd43_data.empty())
            ret = conv3x3s1_winograd43_int8(bottom_blob_bordered, top_blob_int32, weight_winograd43_data, _nT, opt);
        else
            ret = conv3x3s1_winograd23_int8(bottom_blob_bordered, top_blob_int32, weight_winograd23_data, _nT, opt);
    }
    else if (opt.use_sgemm_convolution)
    {
        ret = convolution_im2col_gemm_int8(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, _nT, opt);
    }
    else
    {
        convolution_packed_int8(bottom_blob_bordered, top_blob_int32, weight_data_tm, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
    }
    if (ret != 0)
        return ret;

#if __SSE2__
    if (opt.use_packing_layout)
    {
        // NCNN_LOGE("top_blob_int32  %d  %d", top_blob_int32.c, top_blob_int32.elempack);
        if (use_int8_requantize)
        {
            // TODO implement winograd and packed int8 pack1 output
            if (top_blob_int32.elempack == 4 && top_blob_int32.c % 2 == 1)
            {
                Mat tmp;
                convert_packing(top_blob_int32, tmp, 1, opt);
                top_blob_int32 = tmp;
            }
            if (top_blob_int32.elempack == 4 && top_blob_int32.c % 2 == 0)
            {
                Mat tmp;
                convert_packing(top_blob_int32, tmp, 8, opt);
                top_blob_int32 = tmp;
            }
        }
        else
        {
#if __AVX__
            // TODO implement winograd and packed int8 avx pack8 output
            if (top_blob_int32.elempack == 4 && top_blob_int32.c % 2 == 0)
            {
                Mat tmp;
                convert_packing(top_blob_int32, tmp, 8, opt);
                top_blob_int32 = tmp;
            }
#endif // __AVX__
        }
    }
#endif

    if (use_int8_requantize)
    {
        requantize_from_int32_to_int8(top_blob_int32, top_blob, scale_in_data, top_blob_int8_scales, bias_data, activation_type, activation_params, opt);
    }
    else
    {
        dequantize_from_int32(top_blob_int32, top_blob, scale_in_data, bias_data, opt);

        if (activation)
        {
            activation->forward_inplace(top_blob, opt);
        }
    }

    return 0;
}